

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersector1<8>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [12];
  undefined1 (*pauVar2) [12];
  undefined1 (*pauVar3) [12];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Primitive PVar21;
  uint uVar22;
  RTCFilterFunctionN p_Var23;
  uint uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [28];
  undefined1 auVar128 [28];
  undefined1 auVar129 [28];
  undefined1 auVar130 [28];
  undefined1 auVar131 [28];
  undefined1 auVar132 [24];
  uint uVar133;
  uint uVar134;
  uint uVar135;
  ulong uVar136;
  long lVar137;
  Geometry *pGVar138;
  undefined1 auVar139 [8];
  ulong uVar140;
  long lVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar165;
  float fVar167;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar173;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar174;
  float fVar175;
  float fVar191;
  float fVar192;
  undefined1 auVar176 [16];
  float fVar195;
  float fVar196;
  undefined1 auVar178 [32];
  undefined1 auVar177 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar193;
  float fVar197;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar194;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  float fVar198;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar199;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar215;
  float fVar217;
  float fVar221;
  float fVar223;
  float fVar224;
  undefined1 auVar209 [32];
  float fVar219;
  undefined1 auVar210 [32];
  undefined1 auVar222 [16];
  undefined1 auVar211 [32];
  float fVar216;
  float fVar218;
  float fVar220;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar235 [16];
  float fVar234;
  undefined1 auVar236 [16];
  float fVar245;
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar251;
  undefined1 auVar242 [32];
  float fVar252;
  undefined1 auVar243 [32];
  float fVar247;
  undefined1 auVar244 [64];
  float fVar253;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar258 [32];
  float fVar268;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar269;
  float fVar270;
  float fVar276;
  float fVar279;
  undefined1 auVar271 [16];
  float fVar282;
  undefined1 auVar272 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar273 [32];
  float fVar277;
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar283;
  float fVar284;
  undefined1 auVar274 [32];
  float fVar288;
  float fVar289;
  undefined1 auVar275 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [64];
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar308;
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  float fVar309;
  undefined1 auVar310 [16];
  float fVar316;
  float fVar317;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar311 [32];
  float fVar322;
  undefined1 auVar312 [32];
  float fVar318;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [64];
  undefined1 auVar328 [12];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar329;
  float fVar333;
  float fVar334;
  float fVar335;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [64];
  float fVar336;
  float fVar344;
  float fVar345;
  float fVar346;
  float in_register_0000151c;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [64];
  float fVar347;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  float fVar355;
  float fVar356;
  undefined1 auVar350 [32];
  undefined1 auVar352 [32];
  float fVar357;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar358;
  float fVar359;
  float fVar362;
  float fVar364;
  float fVar366;
  float in_register_0000159c;
  undefined1 auVar360 [32];
  float fVar363;
  float fVar365;
  float fVar367;
  undefined1 auVar361 [32];
  float fVar368;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  float fVar372;
  float fVar373;
  float fVar374;
  float in_register_000015dc;
  undefined1 auVar371 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_7bc;
  ulong local_7b8;
  long local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined4 uStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  Primitive *local_740;
  Precalculations *local_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined8 local_610;
  undefined4 local_608;
  float local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  uint local_5f4;
  uint local_5f0;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [2] [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  uint local_200;
  uint local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar351 [32];
  
  PVar21 = prim[1];
  uVar140 = (ulong)(byte)PVar21;
  fVar198 = *(float *)(prim + uVar140 * 0x19 + 0x12);
  auVar257 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar140 * 0x19 + 6));
  auVar176._0_4_ = fVar198 * auVar257._0_4_;
  auVar176._4_4_ = fVar198 * auVar257._4_4_;
  auVar176._8_4_ = fVar198 * auVar257._8_4_;
  auVar176._12_4_ = fVar198 * auVar257._12_4_;
  auVar271._0_4_ = fVar198 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar271._4_4_ = fVar198 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar271._8_4_ = fVar198 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar271._12_4_ = fVar198 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 4 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 4 + 10)));
  auVar148._16_16_ = auVar205;
  auVar148._0_16_ = auVar257;
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 5 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 5 + 10)));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar209._16_16_ = auVar205;
  auVar209._0_16_ = auVar257;
  auVar26 = vcvtdq2ps_avx(auVar209);
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 6 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 6 + 10)));
  auVar227._16_16_ = auVar205;
  auVar227._0_16_ = auVar257;
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xb + 6)));
  auVar27 = vcvtdq2ps_avx(auVar227);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xb + 10)));
  auVar228._16_16_ = auVar205;
  auVar228._0_16_ = auVar257;
  auVar28 = vcvtdq2ps_avx(auVar228);
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xc + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xc + 10)));
  auVar237._16_16_ = auVar205;
  auVar237._0_16_ = auVar257;
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xd + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xd + 10)));
  auVar29 = vcvtdq2ps_avx(auVar237);
  auVar238._16_16_ = auVar205;
  auVar238._0_16_ = auVar257;
  auVar30 = vcvtdq2ps_avx(auVar238);
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x12 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x12 + 10)));
  auVar239._16_16_ = auVar205;
  auVar239._0_16_ = auVar257;
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x13 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar239);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x13 + 10)));
  auVar311._16_16_ = auVar205;
  auVar311._0_16_ = auVar257;
  auVar32 = vcvtdq2ps_avx(auVar311);
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x14 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x14 + 10)));
  auVar323._16_16_ = auVar205;
  auVar323._0_16_ = auVar257;
  auVar33 = vcvtdq2ps_avx(auVar323);
  auVar257 = vshufps_avx(auVar271,auVar271,0);
  auVar205 = vshufps_avx(auVar271,auVar271,0x55);
  auVar222 = vshufps_avx(auVar271,auVar271,0xaa);
  fVar198 = auVar222._0_4_;
  fVar215 = auVar222._4_4_;
  fVar217 = auVar222._8_4_;
  fVar219 = auVar222._12_4_;
  fVar221 = auVar205._0_4_;
  fVar223 = auVar205._4_4_;
  fVar224 = auVar205._8_4_;
  fVar253 = auVar205._12_4_;
  fVar262 = auVar257._0_4_;
  fVar263 = auVar257._4_4_;
  fVar264 = auVar257._8_4_;
  fVar265 = auVar257._12_4_;
  auVar337._0_4_ = fVar262 * auVar148._0_4_ + fVar221 * auVar26._0_4_ + fVar198 * auVar27._0_4_;
  auVar337._4_4_ = fVar263 * auVar148._4_4_ + fVar223 * auVar26._4_4_ + fVar215 * auVar27._4_4_;
  auVar337._8_4_ = fVar264 * auVar148._8_4_ + fVar224 * auVar26._8_4_ + fVar217 * auVar27._8_4_;
  auVar337._12_4_ = fVar265 * auVar148._12_4_ + fVar253 * auVar26._12_4_ + fVar219 * auVar27._12_4_;
  auVar337._16_4_ = fVar262 * auVar148._16_4_ + fVar221 * auVar26._16_4_ + fVar198 * auVar27._16_4_;
  auVar337._20_4_ = fVar263 * auVar148._20_4_ + fVar223 * auVar26._20_4_ + fVar215 * auVar27._20_4_;
  auVar337._24_4_ = fVar264 * auVar148._24_4_ + fVar224 * auVar26._24_4_ + fVar217 * auVar27._24_4_;
  auVar337._28_4_ = fVar253 + in_register_000015dc + in_register_0000151c;
  auVar330._0_4_ = fVar262 * auVar28._0_4_ + fVar221 * auVar29._0_4_ + auVar30._0_4_ * fVar198;
  auVar330._4_4_ = fVar263 * auVar28._4_4_ + fVar223 * auVar29._4_4_ + auVar30._4_4_ * fVar215;
  auVar330._8_4_ = fVar264 * auVar28._8_4_ + fVar224 * auVar29._8_4_ + auVar30._8_4_ * fVar217;
  auVar330._12_4_ = fVar265 * auVar28._12_4_ + fVar253 * auVar29._12_4_ + auVar30._12_4_ * fVar219;
  auVar330._16_4_ = fVar262 * auVar28._16_4_ + fVar221 * auVar29._16_4_ + auVar30._16_4_ * fVar198;
  auVar330._20_4_ = fVar263 * auVar28._20_4_ + fVar223 * auVar29._20_4_ + auVar30._20_4_ * fVar215;
  auVar330._24_4_ = fVar264 * auVar28._24_4_ + fVar224 * auVar29._24_4_ + auVar30._24_4_ * fVar217;
  auVar330._28_4_ = fVar253 + in_register_000015dc + in_register_0000159c;
  auVar273._0_4_ = fVar262 * auVar31._0_4_ + fVar221 * auVar32._0_4_ + auVar33._0_4_ * fVar198;
  auVar273._4_4_ = fVar263 * auVar31._4_4_ + fVar223 * auVar32._4_4_ + auVar33._4_4_ * fVar215;
  auVar273._8_4_ = fVar264 * auVar31._8_4_ + fVar224 * auVar32._8_4_ + auVar33._8_4_ * fVar217;
  auVar273._12_4_ = fVar265 * auVar31._12_4_ + fVar253 * auVar32._12_4_ + auVar33._12_4_ * fVar219;
  auVar273._16_4_ = fVar262 * auVar31._16_4_ + fVar221 * auVar32._16_4_ + auVar33._16_4_ * fVar198;
  auVar273._20_4_ = fVar263 * auVar31._20_4_ + fVar223 * auVar32._20_4_ + auVar33._20_4_ * fVar215;
  auVar273._24_4_ = fVar264 * auVar31._24_4_ + fVar224 * auVar32._24_4_ + auVar33._24_4_ * fVar217;
  auVar273._28_4_ = fVar265 + fVar253 + fVar219;
  auVar257 = vshufps_avx(auVar176,auVar176,0);
  auVar205 = vshufps_avx(auVar176,auVar176,0x55);
  auVar222 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar198 = auVar222._0_4_;
  fVar215 = auVar222._4_4_;
  fVar217 = auVar222._8_4_;
  fVar219 = auVar222._12_4_;
  fVar262 = auVar205._0_4_;
  fVar263 = auVar205._4_4_;
  fVar264 = auVar205._8_4_;
  fVar265 = auVar205._12_4_;
  fVar221 = auVar257._0_4_;
  fVar223 = auVar257._4_4_;
  fVar224 = auVar257._8_4_;
  fVar253 = auVar257._12_4_;
  auVar178._0_4_ = fVar221 * auVar148._0_4_ + fVar262 * auVar26._0_4_ + fVar198 * auVar27._0_4_;
  auVar178._4_4_ = fVar223 * auVar148._4_4_ + fVar263 * auVar26._4_4_ + fVar215 * auVar27._4_4_;
  auVar178._8_4_ = fVar224 * auVar148._8_4_ + fVar264 * auVar26._8_4_ + fVar217 * auVar27._8_4_;
  auVar178._12_4_ = fVar253 * auVar148._12_4_ + fVar265 * auVar26._12_4_ + fVar219 * auVar27._12_4_;
  auVar178._16_4_ = fVar221 * auVar148._16_4_ + fVar262 * auVar26._16_4_ + fVar198 * auVar27._16_4_;
  auVar178._20_4_ = fVar223 * auVar148._20_4_ + fVar263 * auVar26._20_4_ + fVar215 * auVar27._20_4_;
  auVar178._24_4_ = fVar224 * auVar148._24_4_ + fVar264 * auVar26._24_4_ + fVar217 * auVar27._24_4_;
  auVar178._28_4_ = auVar148._28_4_ + auVar26._28_4_ + auVar27._28_4_;
  auVar229._0_4_ = fVar221 * auVar28._0_4_ + auVar30._0_4_ * fVar198 + fVar262 * auVar29._0_4_;
  auVar229._4_4_ = fVar223 * auVar28._4_4_ + auVar30._4_4_ * fVar215 + fVar263 * auVar29._4_4_;
  auVar229._8_4_ = fVar224 * auVar28._8_4_ + auVar30._8_4_ * fVar217 + fVar264 * auVar29._8_4_;
  auVar229._12_4_ = fVar253 * auVar28._12_4_ + auVar30._12_4_ * fVar219 + fVar265 * auVar29._12_4_;
  auVar229._16_4_ = fVar221 * auVar28._16_4_ + auVar30._16_4_ * fVar198 + fVar262 * auVar29._16_4_;
  auVar229._20_4_ = fVar223 * auVar28._20_4_ + auVar30._20_4_ * fVar215 + fVar263 * auVar29._20_4_;
  auVar229._24_4_ = fVar224 * auVar28._24_4_ + auVar30._24_4_ * fVar217 + fVar264 * auVar29._24_4_;
  auVar229._28_4_ = auVar148._28_4_ + auVar30._28_4_ + auVar27._28_4_;
  auVar298._8_4_ = 0x7fffffff;
  auVar298._0_8_ = 0x7fffffff7fffffff;
  auVar298._12_4_ = 0x7fffffff;
  auVar298._16_4_ = 0x7fffffff;
  auVar298._20_4_ = 0x7fffffff;
  auVar298._24_4_ = 0x7fffffff;
  auVar298._28_4_ = 0x7fffffff;
  auVar149._8_4_ = 0x219392ef;
  auVar149._0_8_ = 0x219392ef219392ef;
  auVar149._12_4_ = 0x219392ef;
  auVar149._16_4_ = 0x219392ef;
  auVar149._20_4_ = 0x219392ef;
  auVar149._24_4_ = 0x219392ef;
  auVar149._28_4_ = 0x219392ef;
  auVar148 = vandps_avx(auVar337,auVar298);
  auVar148 = vcmpps_avx(auVar148,auVar149,1);
  auVar26 = vblendvps_avx(auVar337,auVar149,auVar148);
  auVar148 = vandps_avx(auVar330,auVar298);
  auVar148 = vcmpps_avx(auVar148,auVar149,1);
  auVar27 = vblendvps_avx(auVar330,auVar149,auVar148);
  auVar148 = vandps_avx(auVar298,auVar273);
  auVar148 = vcmpps_avx(auVar148,auVar149,1);
  auVar148 = vblendvps_avx(auVar273,auVar149,auVar148);
  auVar28 = vrcpps_avx(auVar26);
  auVar240._0_4_ = fVar221 * auVar31._0_4_ + fVar262 * auVar32._0_4_ + auVar33._0_4_ * fVar198;
  auVar240._4_4_ = fVar223 * auVar31._4_4_ + fVar263 * auVar32._4_4_ + auVar33._4_4_ * fVar215;
  auVar240._8_4_ = fVar224 * auVar31._8_4_ + fVar264 * auVar32._8_4_ + auVar33._8_4_ * fVar217;
  auVar240._12_4_ = fVar253 * auVar31._12_4_ + fVar265 * auVar32._12_4_ + auVar33._12_4_ * fVar219;
  auVar240._16_4_ = fVar221 * auVar31._16_4_ + fVar262 * auVar32._16_4_ + auVar33._16_4_ * fVar198;
  auVar240._20_4_ = fVar223 * auVar31._20_4_ + fVar263 * auVar32._20_4_ + auVar33._20_4_ * fVar215;
  auVar240._24_4_ = fVar224 * auVar31._24_4_ + fVar264 * auVar32._24_4_ + auVar33._24_4_ * fVar217;
  auVar240._28_4_ = auVar31._28_4_ + auVar29._28_4_ + fVar219;
  fVar198 = auVar28._0_4_;
  fVar215 = auVar28._4_4_;
  auVar29._4_4_ = auVar26._4_4_ * fVar215;
  auVar29._0_4_ = auVar26._0_4_ * fVar198;
  fVar217 = auVar28._8_4_;
  auVar29._8_4_ = auVar26._8_4_ * fVar217;
  fVar219 = auVar28._12_4_;
  auVar29._12_4_ = auVar26._12_4_ * fVar219;
  fVar221 = auVar28._16_4_;
  auVar29._16_4_ = auVar26._16_4_ * fVar221;
  fVar223 = auVar28._20_4_;
  auVar29._20_4_ = auVar26._20_4_ * fVar223;
  fVar224 = auVar28._24_4_;
  auVar29._24_4_ = auVar26._24_4_ * fVar224;
  auVar29._28_4_ = auVar26._28_4_;
  auVar299._8_4_ = 0x3f800000;
  auVar299._0_8_ = 0x3f8000003f800000;
  auVar299._12_4_ = 0x3f800000;
  auVar299._16_4_ = 0x3f800000;
  auVar299._20_4_ = 0x3f800000;
  auVar299._24_4_ = 0x3f800000;
  auVar299._28_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar299,auVar29);
  auVar26 = vrcpps_avx(auVar27);
  fVar198 = fVar198 + fVar198 * auVar28._0_4_;
  fVar215 = fVar215 + fVar215 * auVar28._4_4_;
  fVar217 = fVar217 + fVar217 * auVar28._8_4_;
  fVar219 = fVar219 + fVar219 * auVar28._12_4_;
  fVar221 = fVar221 + fVar221 * auVar28._16_4_;
  fVar223 = fVar223 + fVar223 * auVar28._20_4_;
  fVar224 = fVar224 + fVar224 * auVar28._24_4_;
  fVar253 = auVar26._0_4_;
  fVar262 = auVar26._4_4_;
  auVar28._4_4_ = fVar262 * auVar27._4_4_;
  auVar28._0_4_ = fVar253 * auVar27._0_4_;
  fVar263 = auVar26._8_4_;
  auVar28._8_4_ = fVar263 * auVar27._8_4_;
  fVar264 = auVar26._12_4_;
  auVar28._12_4_ = fVar264 * auVar27._12_4_;
  fVar265 = auVar26._16_4_;
  auVar28._16_4_ = fVar265 * auVar27._16_4_;
  fVar266 = auVar26._20_4_;
  auVar28._20_4_ = fVar266 * auVar27._20_4_;
  fVar267 = auVar26._24_4_;
  auVar28._24_4_ = fVar267 * auVar27._24_4_;
  auVar28._28_4_ = auVar27._28_4_;
  auVar27 = vsubps_avx(auVar299,auVar28);
  auVar26 = vrcpps_avx(auVar148);
  fVar253 = fVar253 + fVar253 * auVar27._0_4_;
  fVar262 = fVar262 + fVar262 * auVar27._4_4_;
  fVar263 = fVar263 + fVar263 * auVar27._8_4_;
  fVar264 = fVar264 + fVar264 * auVar27._12_4_;
  fVar265 = fVar265 + fVar265 * auVar27._16_4_;
  fVar266 = fVar266 + fVar266 * auVar27._20_4_;
  fVar267 = fVar267 + fVar267 * auVar27._24_4_;
  fVar269 = auVar26._0_4_;
  fVar276 = auVar26._4_4_;
  auVar27._4_4_ = fVar276 * auVar148._4_4_;
  auVar27._0_4_ = fVar269 * auVar148._0_4_;
  fVar279 = auVar26._8_4_;
  auVar27._8_4_ = fVar279 * auVar148._8_4_;
  fVar282 = auVar26._12_4_;
  auVar27._12_4_ = fVar282 * auVar148._12_4_;
  fVar285 = auVar26._16_4_;
  auVar27._16_4_ = fVar285 * auVar148._16_4_;
  fVar286 = auVar26._20_4_;
  auVar27._20_4_ = fVar286 * auVar148._20_4_;
  fVar287 = auVar26._24_4_;
  auVar27._24_4_ = fVar287 * auVar148._24_4_;
  auVar27._28_4_ = auVar148._28_4_;
  auVar148 = vsubps_avx(auVar299,auVar27);
  fVar269 = fVar269 + fVar269 * auVar148._0_4_;
  fVar276 = fVar276 + fVar276 * auVar148._4_4_;
  fVar279 = fVar279 + fVar279 * auVar148._8_4_;
  fVar282 = fVar282 + fVar282 * auVar148._12_4_;
  fVar285 = fVar285 + fVar285 * auVar148._16_4_;
  fVar286 = fVar286 + fVar286 * auVar148._20_4_;
  fVar287 = fVar287 + fVar287 * auVar148._24_4_;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = *(ulong *)(prim + uVar140 * 7 + 6);
  auVar257 = vpmovsxwd_avx(auVar257);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar140 * 7 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar205);
  auVar150._16_16_ = auVar205;
  auVar150._0_16_ = auVar257;
  auVar148 = vcvtdq2ps_avx(auVar150);
  auVar148 = vsubps_avx(auVar148,auVar178);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar140 * 9 + 6);
  auVar257 = vpmovsxwd_avx(auVar222);
  auVar145._0_4_ = fVar198 * auVar148._0_4_;
  auVar145._4_4_ = fVar215 * auVar148._4_4_;
  auVar145._8_4_ = fVar217 * auVar148._8_4_;
  auVar145._12_4_ = fVar219 * auVar148._12_4_;
  auVar30._16_4_ = fVar221 * auVar148._16_4_;
  auVar30._0_16_ = auVar145;
  auVar30._20_4_ = fVar223 * auVar148._20_4_;
  auVar30._24_4_ = fVar224 * auVar148._24_4_;
  auVar30._28_4_ = auVar148._28_4_;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *(ulong *)(prim + uVar140 * 9 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar226);
  auVar290._16_16_ = auVar205;
  auVar290._0_16_ = auVar257;
  auVar148 = vcvtdq2ps_avx(auVar290);
  auVar148 = vsubps_avx(auVar148,auVar178);
  auVar177._0_4_ = fVar198 * auVar148._0_4_;
  auVar177._4_4_ = fVar215 * auVar148._4_4_;
  auVar177._8_4_ = fVar217 * auVar148._8_4_;
  auVar177._12_4_ = fVar219 * auVar148._12_4_;
  auVar31._16_4_ = fVar221 * auVar148._16_4_;
  auVar31._0_16_ = auVar177;
  auVar31._20_4_ = fVar223 * auVar148._20_4_;
  auVar31._24_4_ = fVar224 * auVar148._24_4_;
  auVar31._28_4_ = auVar148._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar140 * 0xe + 6);
  auVar257 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar140 * 0xe + 0xe);
  auVar205 = vpmovsxwd_avx(auVar15);
  auVar210._16_16_ = auVar205;
  auVar210._0_16_ = auVar257;
  auVar148 = vcvtdq2ps_avx(auVar210);
  auVar148 = vsubps_avx(auVar148,auVar229);
  auVar200._0_4_ = fVar253 * auVar148._0_4_;
  auVar200._4_4_ = fVar262 * auVar148._4_4_;
  auVar200._8_4_ = fVar263 * auVar148._8_4_;
  auVar200._12_4_ = fVar264 * auVar148._12_4_;
  auVar26._16_4_ = fVar265 * auVar148._16_4_;
  auVar26._0_16_ = auVar200;
  auVar26._20_4_ = fVar266 * auVar148._20_4_;
  auVar26._24_4_ = fVar267 * auVar148._24_4_;
  auVar26._28_4_ = auVar148._28_4_;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar21 * 0x10 + 6);
  auVar257 = vpmovsxwd_avx(auVar255);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar21 * 0x10 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar16);
  auVar291._16_16_ = auVar205;
  auVar291._0_16_ = auVar257;
  auVar148 = vcvtdq2ps_avx(auVar291);
  auVar148 = vsubps_avx(auVar148,auVar229);
  auVar225._0_4_ = fVar253 * auVar148._0_4_;
  auVar225._4_4_ = fVar262 * auVar148._4_4_;
  auVar225._8_4_ = fVar263 * auVar148._8_4_;
  auVar225._12_4_ = fVar264 * auVar148._12_4_;
  auVar32._16_4_ = fVar265 * auVar148._16_4_;
  auVar32._0_16_ = auVar225;
  auVar32._20_4_ = fVar266 * auVar148._20_4_;
  auVar32._24_4_ = fVar267 * auVar148._24_4_;
  auVar32._28_4_ = auVar148._28_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar140 * 0x15 + 6);
  auVar257 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar140 * 0x15 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar18);
  auVar258._16_16_ = auVar205;
  auVar258._0_16_ = auVar257;
  auVar148 = vcvtdq2ps_avx(auVar258);
  auVar148 = vsubps_avx(auVar148,auVar240);
  auVar254._0_4_ = fVar269 * auVar148._0_4_;
  auVar254._4_4_ = fVar276 * auVar148._4_4_;
  auVar254._8_4_ = fVar279 * auVar148._8_4_;
  auVar254._12_4_ = fVar282 * auVar148._12_4_;
  auVar33._16_4_ = fVar285 * auVar148._16_4_;
  auVar33._0_16_ = auVar254;
  auVar33._20_4_ = fVar286 * auVar148._20_4_;
  auVar33._24_4_ = fVar287 * auVar148._24_4_;
  auVar33._28_4_ = auVar148._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar140 * 0x17 + 6);
  auVar257 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar140 * 0x17 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar20);
  auVar292._16_16_ = auVar205;
  auVar292._0_16_ = auVar257;
  auVar148 = vcvtdq2ps_avx(auVar292);
  auVar148 = vsubps_avx(auVar148,auVar240);
  auVar235._0_4_ = fVar269 * auVar148._0_4_;
  auVar235._4_4_ = fVar276 * auVar148._4_4_;
  auVar235._8_4_ = fVar279 * auVar148._8_4_;
  auVar235._12_4_ = fVar282 * auVar148._12_4_;
  auVar25._16_4_ = fVar285 * auVar148._16_4_;
  auVar25._0_16_ = auVar235;
  auVar25._20_4_ = fVar286 * auVar148._20_4_;
  auVar25._24_4_ = fVar287 * auVar148._24_4_;
  auVar25._28_4_ = auVar148._28_4_;
  auVar257 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar205 = vpminsd_avx(auVar145,auVar177);
  auVar324._16_16_ = auVar257;
  auVar324._0_16_ = auVar205;
  auVar226 = auVar32._16_16_;
  auVar304 = ZEXT1664(auVar226);
  auVar222 = auVar26._16_16_;
  auVar315 = ZEXT1664(auVar222);
  auVar257 = vpminsd_avx(auVar222,auVar226);
  auVar205 = vpminsd_avx(auVar200,auVar225);
  auVar331._16_16_ = auVar257;
  auVar331._0_16_ = auVar205;
  auVar148 = vmaxps_avx(auVar324,auVar331);
  auVar257 = vpminsd_avx(auVar33._16_16_,auVar25._16_16_);
  auVar205 = vpminsd_avx(auVar254,auVar235);
  auVar350._16_16_ = auVar257;
  auVar350._0_16_ = auVar205;
  uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar360._4_4_ = uVar11;
  auVar360._0_4_ = uVar11;
  auVar360._8_4_ = uVar11;
  auVar360._12_4_ = uVar11;
  auVar360._16_4_ = uVar11;
  auVar360._20_4_ = uVar11;
  auVar360._24_4_ = uVar11;
  auVar360._28_4_ = uVar11;
  auVar26 = vmaxps_avx(auVar350,auVar360);
  auVar148 = vmaxps_avx(auVar148,auVar26);
  local_80._4_4_ = auVar148._4_4_ * 0.99999964;
  local_80._0_4_ = auVar148._0_4_ * 0.99999964;
  local_80._8_4_ = auVar148._8_4_ * 0.99999964;
  local_80._12_4_ = auVar148._12_4_ * 0.99999964;
  local_80._16_4_ = auVar148._16_4_ * 0.99999964;
  local_80._20_4_ = auVar148._20_4_ * 0.99999964;
  local_80._24_4_ = auVar148._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar257 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar205 = vpmaxsd_avx(auVar145,auVar177);
  auVar151._16_16_ = auVar257;
  auVar151._0_16_ = auVar205;
  auVar257 = vpmaxsd_avx(auVar222,auVar226);
  auVar205 = vpmaxsd_avx(auVar200,auVar225);
  auVar179._16_16_ = auVar257;
  auVar179._0_16_ = auVar205;
  auVar148 = vminps_avx(auVar151,auVar179);
  auVar257 = vpmaxsd_avx(auVar33._16_16_,auVar25._16_16_);
  auVar205 = vpmaxsd_avx(auVar254,auVar235);
  auVar180._16_16_ = auVar257;
  auVar180._0_16_ = auVar205;
  fVar198 = (ray->super_RayK<1>).tfar;
  auVar211._4_4_ = fVar198;
  auVar211._0_4_ = fVar198;
  auVar211._8_4_ = fVar198;
  auVar211._12_4_ = fVar198;
  auVar211._16_4_ = fVar198;
  auVar211._20_4_ = fVar198;
  auVar211._24_4_ = fVar198;
  auVar211._28_4_ = fVar198;
  auVar26 = vminps_avx(auVar180,auVar211);
  auVar148 = vminps_avx(auVar148,auVar26);
  auVar34._4_4_ = auVar148._4_4_ * 1.0000004;
  auVar34._0_4_ = auVar148._0_4_ * 1.0000004;
  auVar34._8_4_ = auVar148._8_4_ * 1.0000004;
  auVar34._12_4_ = auVar148._12_4_ * 1.0000004;
  auVar34._16_4_ = auVar148._16_4_ * 1.0000004;
  auVar34._20_4_ = auVar148._20_4_ * 1.0000004;
  auVar34._24_4_ = auVar148._24_4_ * 1.0000004;
  auVar34._28_4_ = auVar148._28_4_;
  auVar148 = vcmpps_avx(local_80,auVar34,2);
  auVar257 = vpshufd_avx(ZEXT116((byte)PVar21),0);
  auVar181._16_16_ = auVar257;
  auVar181._0_16_ = auVar257;
  auVar26 = vcvtdq2ps_avx(auVar181);
  auVar26 = vcmpps_avx(_DAT_01f7b060,auVar26,1);
  auVar148 = vandps_avx(auVar148,auVar26);
  uVar133 = vmovmskps_avx(auVar148);
  local_4c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_4c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_4c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_4c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_738 = pre;
  local_740 = prim;
  do {
    uVar140 = (ulong)uVar133;
    if (uVar140 == 0) {
      return;
    }
    local_680 = auVar315._0_32_;
    local_6e0 = auVar304._0_32_;
    lVar137 = 0;
    if (uVar140 != 0) {
      for (; (uVar133 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
      }
    }
    uVar140 = uVar140 - 1 & uVar140;
    uVar133 = *(uint *)(prim + 2);
    uVar135 = *(uint *)(prim + lVar137 * 4 + 6);
    local_7b8 = (ulong)uVar133;
    pGVar138 = (context->scene->geometries).items[uVar133].ptr;
    local_7a8 = (ulong)uVar135;
    uVar136 = (ulong)*(uint *)(*(long *)&pGVar138->field_0x58 +
                              pGVar138[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)uVar135);
    p_Var23 = pGVar138[1].intersectionFilterN;
    lVar137 = *(long *)&pGVar138[1].time_range.upper;
    pauVar1 = (undefined1 (*) [12])(lVar137 + (long)p_Var23 * uVar136);
    local_1f0 = *(undefined8 *)*pauVar1;
    uStack_1e8 = *(undefined8 *)(*pauVar1 + 8);
    local_780 = (float)local_1f0;
    fStack_77c = (float)((ulong)local_1f0 >> 0x20);
    fStack_778 = (float)uStack_1e8;
    fStack_774 = (float)((ulong)uStack_1e8 >> 0x20);
    pauVar2 = (undefined1 (*) [12])(lVar137 + (uVar136 + 1) * (long)p_Var23);
    local_1e0 = *(undefined8 *)*pauVar2;
    uStack_1d8 = *(undefined8 *)(*pauVar2 + 8);
    local_750 = (float)local_1e0;
    fStack_74c = (float)((ulong)local_1e0 >> 0x20);
    fStack_748 = (float)uStack_1d8;
    fStack_744 = (float)((ulong)uStack_1d8 >> 0x20);
    pauVar3 = (undefined1 (*) [12])(lVar137 + (uVar136 + 2) * (long)p_Var23);
    local_1d0 = *(undefined8 *)*pauVar3;
    uStack_1c8 = *(undefined8 *)(*pauVar3 + 8);
    local_760 = (float)local_1d0;
    fStack_75c = (float)((ulong)local_1d0 >> 0x20);
    fStack_758 = (float)uStack_1c8;
    fStack_754 = (float)((ulong)uStack_1c8 >> 0x20);
    lVar141 = 0;
    if (uVar140 != 0) {
      for (; (uVar140 >> lVar141 & 1) == 0; lVar141 = lVar141 + 1) {
      }
    }
    pauVar4 = (undefined1 (*) [12])(lVar137 + (uVar136 + 3) * (long)p_Var23);
    local_1c0 = *(undefined8 *)*pauVar4;
    uStack_1b8 = *(undefined8 *)(*pauVar4 + 8);
    local_770 = (float)local_1c0;
    fStack_76c = (float)((ulong)local_1c0 >> 0x20);
    fStack_768 = (float)uStack_1b8;
    fStack_764 = (float)((ulong)uStack_1b8 >> 0x20);
    if (((uVar140 != 0) && (uVar136 = uVar140 - 1 & uVar140, uVar136 != 0)) &&
       (lVar137 = 0, uVar136 != 0)) {
      for (; (uVar136 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
      }
    }
    uVar22 = (uint)pGVar138[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar13 = (ray->super_RayK<1>).org.field_0;
    auVar119._12_4_ = fStack_774;
    auVar119._0_12_ = *pauVar1;
    auVar222 = vsubps_avx(auVar119,(undefined1  [16])aVar13);
    auVar257 = vshufps_avx(auVar222,auVar222,0);
    auVar205 = vshufps_avx(auVar222,auVar222,0x55);
    auVar222 = vshufps_avx(auVar222,auVar222,0xaa);
    fVar198 = (pre->ray_space).vx.field_0.m128[0];
    fVar215 = (pre->ray_space).vx.field_0.m128[1];
    fVar217 = (pre->ray_space).vx.field_0.m128[2];
    fVar219 = (pre->ray_space).vx.field_0.m128[3];
    fVar221 = (pre->ray_space).vy.field_0.m128[0];
    fVar223 = (pre->ray_space).vy.field_0.m128[1];
    fVar224 = (pre->ray_space).vy.field_0.m128[2];
    fVar253 = (pre->ray_space).vy.field_0.m128[3];
    fVar262 = (pre->ray_space).vz.field_0.m128[0];
    fVar263 = (pre->ray_space).vz.field_0.m128[1];
    fVar264 = (pre->ray_space).vz.field_0.m128[2];
    fVar265 = (pre->ray_space).vz.field_0.m128[3];
    auVar146._0_4_ = auVar257._0_4_ * fVar198 + auVar222._0_4_ * fVar262 + auVar205._0_4_ * fVar221;
    auVar146._4_4_ = auVar257._4_4_ * fVar215 + auVar222._4_4_ * fVar263 + auVar205._4_4_ * fVar223;
    auVar146._8_4_ = auVar257._8_4_ * fVar217 + auVar222._8_4_ * fVar264 + auVar205._8_4_ * fVar224;
    auVar146._12_4_ =
         auVar257._12_4_ * fVar219 + auVar222._12_4_ * fVar265 + auVar205._12_4_ * fVar253;
    auVar257 = vblendps_avx(auVar146,auVar119,8);
    auVar123._12_4_ = fStack_744;
    auVar123._0_12_ = *pauVar2;
    auVar226 = vsubps_avx(auVar123,(undefined1  [16])aVar13);
    auVar205 = vshufps_avx(auVar226,auVar226,0);
    auVar222 = vshufps_avx(auVar226,auVar226,0x55);
    auVar226 = vshufps_avx(auVar226,auVar226,0xaa);
    auVar348._0_4_ = auVar205._0_4_ * fVar198 + auVar226._0_4_ * fVar262 + auVar222._0_4_ * fVar221;
    auVar348._4_4_ = auVar205._4_4_ * fVar215 + auVar226._4_4_ * fVar263 + auVar222._4_4_ * fVar223;
    auVar348._8_4_ = auVar205._8_4_ * fVar217 + auVar226._8_4_ * fVar264 + auVar222._8_4_ * fVar224;
    auVar348._12_4_ =
         auVar205._12_4_ * fVar219 + auVar226._12_4_ * fVar265 + auVar222._12_4_ * fVar253;
    auVar205 = vblendps_avx(auVar348,auVar123,8);
    auVar122._12_4_ = fStack_754;
    auVar122._0_12_ = *pauVar3;
    auVar14 = vsubps_avx(auVar122,(undefined1  [16])aVar13);
    auVar222 = vshufps_avx(auVar14,auVar14,0);
    auVar226 = vshufps_avx(auVar14,auVar14,0x55);
    auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
    auVar310._0_4_ = auVar222._0_4_ * fVar198 + auVar226._0_4_ * fVar221 + auVar14._0_4_ * fVar262;
    auVar310._4_4_ = auVar222._4_4_ * fVar215 + auVar226._4_4_ * fVar223 + auVar14._4_4_ * fVar263;
    auVar310._8_4_ = auVar222._8_4_ * fVar217 + auVar226._8_4_ * fVar224 + auVar14._8_4_ * fVar264;
    auVar310._12_4_ =
         auVar222._12_4_ * fVar219 + auVar226._12_4_ * fVar253 + auVar14._12_4_ * fVar265;
    auVar15 = vshufps_avx(auVar122,auVar122,0xff);
    auVar222 = vblendps_avx(auVar310,auVar122,8);
    auVar121._12_4_ = fStack_764;
    auVar121._0_12_ = *pauVar4;
    auVar255 = vsubps_avx(auVar121,(undefined1  [16])aVar13);
    auVar226 = vshufps_avx(auVar255,auVar255,0);
    auVar14 = vshufps_avx(auVar255,auVar255,0x55);
    auVar255 = vshufps_avx(auVar255,auVar255,0xaa);
    auVar201._0_4_ = auVar226._0_4_ * fVar198 + auVar255._0_4_ * fVar262 + auVar14._0_4_ * fVar221;
    auVar201._4_4_ = auVar226._4_4_ * fVar215 + auVar255._4_4_ * fVar263 + auVar14._4_4_ * fVar223;
    auVar201._8_4_ = auVar226._8_4_ * fVar217 + auVar255._8_4_ * fVar264 + auVar14._8_4_ * fVar224;
    auVar201._12_4_ =
         auVar226._12_4_ * fVar219 + auVar255._12_4_ * fVar265 + auVar14._12_4_ * fVar253;
    auVar226 = vblendps_avx(auVar201,auVar121,8);
    auVar272._8_4_ = 0x7fffffff;
    auVar272._0_8_ = 0x7fffffff7fffffff;
    auVar272._12_4_ = 0x7fffffff;
    auVar257 = vandps_avx(auVar257,auVar272);
    auVar205 = vandps_avx(auVar205,auVar272);
    auVar14 = vmaxps_avx(auVar257,auVar205);
    auVar257 = vandps_avx(auVar222,auVar272);
    auVar205 = vandps_avx(auVar226,auVar272);
    auVar257 = vmaxps_avx(auVar257,auVar205);
    auVar257 = vmaxps_avx(auVar14,auVar257);
    auVar205 = vmovshdup_avx(auVar257);
    auVar205 = vmaxss_avx(auVar205,auVar257);
    auVar257 = vshufpd_avx(auVar257,auVar257,1);
    auVar257 = vmaxss_avx(auVar257,auVar205);
    lVar137 = (long)(int)uVar22;
    lVar141 = lVar137 * 0x44;
    fVar309 = *(float *)(bezier_basis0 + lVar141 + 0x908);
    fVar316 = *(float *)(bezier_basis0 + lVar141 + 0x90c);
    fVar317 = *(float *)(bezier_basis0 + lVar141 + 0x910);
    fVar318 = *(float *)(bezier_basis0 + lVar141 + 0x914);
    fVar319 = *(float *)(bezier_basis0 + lVar141 + 0x918);
    fVar320 = *(float *)(bezier_basis0 + lVar141 + 0x91c);
    fVar321 = *(float *)(bezier_basis0 + lVar141 + 0x920);
    auVar205 = vshufps_avx(auVar310,auVar310,0);
    register0x00001310 = auVar205;
    _local_520 = auVar205;
    auVar222 = vshufps_avx(auVar310,auVar310,0x55);
    register0x00001390 = auVar222;
    _local_6c0 = auVar222;
    fVar198 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar141 + 0xd8c);
    fVar215 = *(float *)(bezier_basis0 + lVar141 + 0xd90);
    fVar217 = *(float *)(bezier_basis0 + lVar141 + 0xd94);
    fVar219 = *(float *)(bezier_basis0 + lVar141 + 0xd98);
    fVar221 = *(float *)(bezier_basis0 + lVar141 + 0xd9c);
    fVar223 = *(float *)(bezier_basis0 + lVar141 + 0xda0);
    fVar224 = *(float *)(bezier_basis0 + lVar141 + 0xda4);
    auVar127 = *(undefined1 (*) [28])(bezier_basis0 + lVar141 + 0xd8c);
    auVar226 = vshufps_avx(auVar201,auVar201,0);
    register0x00001590 = auVar226;
    _local_3a0 = auVar226;
    auVar14 = vshufps_avx(auVar201,auVar201,0x55);
    register0x00001290 = auVar14;
    _local_640 = auVar14;
    fVar358 = auVar226._0_4_;
    fVar362 = auVar226._4_4_;
    fVar364 = auVar226._8_4_;
    fVar366 = auVar226._12_4_;
    fVar199 = auVar14._0_4_;
    fVar216 = auVar14._4_4_;
    fVar218 = auVar14._8_4_;
    fVar220 = auVar14._12_4_;
    fVar234 = auVar205._0_4_;
    fVar245 = auVar205._4_4_;
    fVar246 = auVar205._8_4_;
    fVar247 = auVar205._12_4_;
    fVar270 = auVar222._0_4_;
    fVar277 = auVar222._4_4_;
    fVar280 = auVar222._8_4_;
    fVar283 = auVar222._12_4_;
    auVar205 = vshufps_avx(auVar121,auVar121,0xff);
    local_7a0._0_4_ = auVar15._0_4_;
    local_100 = (float)local_7a0._0_4_;
    local_7a0._4_4_ = auVar15._4_4_;
    fStack_fc = (float)local_7a0._4_4_;
    fStack_798 = auVar15._8_4_;
    fStack_f8 = fStack_798;
    fStack_794 = auVar15._12_4_;
    fStack_f4 = fStack_794;
    register0x00001410 = auVar205;
    _local_a0 = auVar205;
    fVar264 = auVar205._0_4_;
    fVar265 = auVar205._4_4_;
    fVar267 = auVar205._8_4_;
    fVar269 = auVar205._12_4_;
    auVar205 = vshufps_avx(auVar348,auVar348,0);
    register0x00001210 = auVar205;
    _local_580 = auVar205;
    local_440 = *(float *)(bezier_basis0 + lVar141 + 0x484);
    fStack_43c = *(float *)(bezier_basis0 + lVar141 + 0x488);
    fStack_438 = *(float *)(bezier_basis0 + lVar141 + 0x48c);
    fStack_434 = *(float *)(bezier_basis0 + lVar141 + 0x490);
    fStack_430 = *(float *)(bezier_basis0 + lVar141 + 0x494);
    fStack_42c = *(float *)(bezier_basis0 + lVar141 + 0x498);
    fStack_428 = *(float *)(bezier_basis0 + lVar141 + 0x49c);
    fVar142 = auVar205._0_4_;
    fVar194 = auVar205._4_4_;
    fVar195 = auVar205._8_4_;
    fVar289 = auVar205._12_4_;
    auVar205 = vshufps_avx(auVar348,auVar348,0x55);
    register0x000014d0 = auVar205;
    _local_6a0 = auVar205;
    fVar329 = auVar205._0_4_;
    fVar333 = auVar205._4_4_;
    fVar334 = auVar205._8_4_;
    fVar335 = auVar205._12_4_;
    auVar205 = vshufps_avx(auVar123,auVar123,0xff);
    register0x000015d0 = auVar205;
    _local_c0 = auVar205;
    fStack_424 = *(float *)(bezier_basis0 + lVar141 + 0x4a0);
    fVar287 = auVar205._0_4_;
    fVar278 = auVar205._4_4_;
    fVar281 = auVar205._8_4_;
    fVar284 = auVar205._12_4_;
    auVar205 = vshufps_avx(auVar146,auVar146,0);
    register0x00001250 = auVar205;
    _local_e0 = auVar205;
    pauVar5 = (undefined1 (*) [16])(bezier_basis0 + lVar141);
    fVar253 = *(float *)*pauVar5;
    fVar262 = *(float *)(bezier_basis0 + lVar141 + 4);
    fVar263 = *(float *)(bezier_basis0 + lVar141 + 8);
    auVar328 = *(undefined1 (*) [12])*pauVar5;
    fVar196 = *(float *)(bezier_basis0 + lVar141 + 0xc);
    fStack_2d0 = *(float *)(bezier_basis0 + lVar141 + 0x10);
    fStack_2cc = *(float *)(bezier_basis0 + lVar141 + 0x14);
    fStack_2c8 = *(float *)(bezier_basis0 + lVar141 + 0x18);
    fVar174 = auVar205._0_4_;
    fVar191 = auVar205._4_4_;
    fVar192 = auVar205._8_4_;
    fVar193 = auVar205._12_4_;
    auVar349._0_4_ = fVar174 * fVar253 + fVar142 * local_440 + fVar234 * fVar309 + fVar358 * fVar198
    ;
    auVar349._4_4_ =
         fVar191 * fVar262 + fVar194 * fStack_43c + fVar245 * fVar316 + fVar362 * fVar215;
    auVar349._8_4_ =
         fVar192 * fVar263 + fVar195 * fStack_438 + fVar246 * fVar317 + fVar364 * fVar217;
    auVar349._12_4_ =
         fVar193 * fVar196 + fVar289 * fStack_434 + fVar247 * fVar318 + fVar366 * fVar219;
    auVar351._16_4_ =
         fVar174 * fStack_2d0 + fVar142 * fStack_430 + fVar234 * fVar319 + fVar358 * fVar221;
    auVar351._0_16_ = auVar349;
    auVar351._20_4_ =
         fVar191 * fStack_2cc + fVar194 * fStack_42c + fVar245 * fVar320 + fVar362 * fVar223;
    auVar351._24_4_ =
         fVar192 * fStack_2c8 + fVar195 * fStack_428 + fVar246 * fVar321 + fVar364 * fVar224;
    auVar351._28_4_ =
         *(float *)(bezier_basis0 + lVar141 + 0x4a0) +
         *(float *)(bezier_basis0 + lVar141 + 0x924) + fVar247 + 0.0;
    auVar205 = vshufps_avx(auVar146,auVar146,0x55);
    auVar338._16_16_ = auVar205;
    auVar338._0_16_ = auVar205;
    fVar336 = auVar205._0_4_;
    fVar344 = auVar205._4_4_;
    fVar345 = auVar205._8_4_;
    fVar346 = auVar205._12_4_;
    local_3e0._0_4_ =
         fVar336 * fVar253 + fVar329 * local_440 + fVar270 * fVar309 + fVar199 * fVar198;
    local_3e0._4_4_ =
         fVar344 * fVar262 + fVar333 * fStack_43c + fVar277 * fVar316 + fVar216 * fVar215;
    local_3e0._8_4_ =
         fVar345 * fVar263 + fVar334 * fStack_438 + fVar280 * fVar317 + fVar218 * fVar217;
    local_3e0._12_4_ =
         fVar346 * fVar196 + fVar335 * fStack_434 + fVar283 * fVar318 + fVar220 * fVar219;
    local_3e0._16_4_ =
         fVar336 * fStack_2d0 + fVar329 * fStack_430 + fVar270 * fVar319 + fVar199 * fVar221;
    local_3e0._20_4_ =
         fVar344 * fStack_2cc + fVar333 * fStack_42c + fVar277 * fVar320 + fVar216 * fVar223;
    local_3e0._24_4_ =
         fVar345 * fStack_2c8 + fVar334 * fStack_428 + fVar280 * fVar321 + fVar218 * fVar224;
    local_3e0._28_4_ = fVar247 + 0.0 + 0.0 + 0.0;
    auVar120._12_4_ = fStack_774;
    auVar120._0_12_ = *pauVar1;
    auVar205 = vpermilps_avx(auVar120,0xff);
    register0x00001490 = auVar205;
    _local_120 = auVar205;
    _local_2e0 = *pauVar5;
    auVar15 = _local_2e0;
    uStack_2c4 = *(undefined4 *)(bezier_basis0 + lVar141 + 0x1c);
    fVar279 = auVar205._0_4_;
    fVar282 = auVar205._4_4_;
    fVar286 = auVar205._8_4_;
    fVar143 = fVar279 * fVar253 +
              fVar287 * local_440 + (float)local_7a0._0_4_ * fVar309 + fVar264 * fVar198;
    fVar165 = fVar282 * fVar262 +
              fVar278 * fStack_43c + (float)local_7a0._4_4_ * fVar316 + fVar265 * fVar215;
    fVar167 = fVar286 * fVar263 + fVar281 * fStack_438 + fStack_798 * fVar317 + fVar267 * fVar217;
    fStack_794 = auVar205._12_4_ * fVar196 +
                 fVar284 * fStack_434 + fStack_794 * fVar318 + fVar269 * fVar219;
    fStack_790 = fVar279 * fStack_2d0 +
                 fVar287 * fStack_430 + (float)local_7a0._0_4_ * fVar319 + fVar264 * fVar221;
    fStack_78c = fVar282 * fStack_2cc +
                 fVar278 * fStack_42c + (float)local_7a0._4_4_ * fVar320 + fVar265 * fVar223;
    fStack_788 = fVar286 * fStack_2c8 +
                 fVar281 * fStack_428 + fStack_798 * fVar321 + fVar267 * fVar224;
    local_7a0._4_4_ = fVar165;
    local_7a0._0_4_ = fVar143;
    fStack_798 = fVar167;
    uStack_784 = 0;
    fVar307 = *(float *)(bezier_basis1 + lVar141 + 0x908);
    fVar308 = *(float *)(bezier_basis1 + lVar141 + 0x90c);
    fVar251 = *(float *)(bezier_basis1 + lVar141 + 0x910);
    fVar197 = *(float *)(bezier_basis1 + lVar141 + 0x914);
    fVar322 = *(float *)(bezier_basis1 + lVar141 + 0x918);
    fVar144 = *(float *)(bezier_basis1 + lVar141 + 0x91c);
    fVar166 = *(float *)(bezier_basis1 + lVar141 + 0x920);
    fVar168 = *(float *)(bezier_basis1 + lVar141 + 0xd8c);
    fVar169 = *(float *)(bezier_basis1 + lVar141 + 0xd90);
    fVar170 = *(float *)(bezier_basis1 + lVar141 + 0xd94);
    fVar171 = *(float *)(bezier_basis1 + lVar141 + 0xd98);
    fVar172 = *(float *)(bezier_basis1 + lVar141 + 0xd9c);
    fVar173 = *(float *)(bezier_basis1 + lVar141 + 0xda0);
    fVar175 = *(float *)(bezier_basis1 + lVar141 + 0xda4);
    fStack_f0 = local_100;
    fStack_ec = fStack_fc;
    fStack_e8 = fStack_f8;
    fStack_e4 = fStack_f4;
    fVar252 = *(float *)(bezier_basis1 + lVar141 + 0x484);
    fVar288 = *(float *)(bezier_basis1 + lVar141 + 0x488);
    fVar248 = *(float *)(bezier_basis1 + lVar141 + 0x48c);
    fVar249 = *(float *)(bezier_basis1 + lVar141 + 0x490);
    fVar250 = *(float *)(bezier_basis1 + lVar141 + 0x494);
    fVar305 = *(float *)(bezier_basis1 + lVar141 + 0x498);
    fVar306 = *(float *)(bezier_basis1 + lVar141 + 0x49c);
    fVar268 = fVar269 + 0.0 + 0.0;
    auVar148 = *(undefined1 (*) [32])(bezier_basis1 + lVar141);
    auVar233 = ZEXT3264(auVar148);
    fVar198 = auVar148._0_4_;
    fVar219 = auVar148._4_4_;
    fVar224 = auVar148._8_4_;
    fVar263 = auVar148._12_4_;
    fVar266 = auVar148._16_4_;
    fVar276 = auVar148._20_4_;
    fVar285 = auVar148._24_4_;
    local_4e0._0_4_ = fVar174 * fVar198 + fVar142 * fVar252 + fVar307 * fVar234 + fVar358 * fVar168;
    local_4e0._4_4_ = fVar191 * fVar219 + fVar194 * fVar288 + fVar308 * fVar245 + fVar362 * fVar169;
    fStack_4d8 = fVar192 * fVar224 + fVar195 * fVar248 + fVar251 * fVar246 + fVar364 * fVar170;
    fStack_4d4 = fVar193 * fVar263 + fVar289 * fVar249 + fVar197 * fVar247 + fVar366 * fVar171;
    fStack_4d0 = fVar174 * fVar266 + fVar142 * fVar250 + fVar322 * fVar234 + fVar358 * fVar172;
    fStack_4cc = fVar191 * fVar276 + fVar194 * fVar305 + fVar144 * fVar245 + fVar362 * fVar173;
    fStack_4c8 = fVar192 * fVar285 + fVar195 * fVar306 + fVar166 * fVar246 + fVar364 * fVar175;
    fStack_4c4 = fVar284 + fVar289 + 0.0;
    local_400._0_4_ = fVar336 * fVar198 + fVar252 * fVar329 + fVar307 * fVar270 + fVar168 * fVar199;
    local_400._4_4_ = fVar344 * fVar219 + fVar288 * fVar333 + fVar308 * fVar277 + fVar169 * fVar216;
    fStack_3f8 = fVar345 * fVar224 + fVar248 * fVar334 + fVar251 * fVar280 + fVar170 * fVar218;
    fStack_3f4 = fVar346 * fVar263 + fVar249 * fVar335 + fVar197 * fVar283 + fVar171 * fVar220;
    fStack_3f0 = fVar336 * fVar266 + fVar250 * fVar329 + fVar322 * fVar270 + fVar172 * fVar199;
    fStack_3ec = fVar344 * fVar276 + fVar305 * fVar333 + fVar144 * fVar277 + fVar173 * fVar216;
    fStack_3e8 = fVar345 * fVar285 + fVar306 * fVar334 + fVar166 * fVar280 + fVar175 * fVar218;
    fStack_3e4 = fVar289 + 0.0 + 0.0;
    local_460._0_4_ =
         fVar279 * fVar198 + fVar287 * fVar252 + local_100 * fVar307 + fVar264 * fVar168;
    local_460._4_4_ =
         fVar282 * fVar219 + fVar278 * fVar288 + fStack_fc * fVar308 + fVar265 * fVar169;
    local_460._8_4_ =
         fVar286 * fVar224 + fVar281 * fVar248 + fStack_f8 * fVar251 + fVar267 * fVar170;
    local_460._12_4_ =
         auVar205._12_4_ * fVar263 + fVar284 * fVar249 + fStack_f4 * fVar197 + fVar269 * fVar171;
    local_460._16_4_ =
         fVar279 * fVar266 + fVar287 * fVar250 + local_100 * fVar322 + fVar264 * fVar172;
    local_460._20_4_ =
         fVar282 * fVar276 + fVar278 * fVar305 + fStack_fc * fVar144 + fVar265 * fVar173;
    local_460._24_4_ =
         fVar286 * fVar285 + fVar281 * fVar306 + fStack_f8 * fVar166 + fVar267 * fVar175;
    local_460._28_4_ = fVar268 + 0.0;
    local_320 = vsubps_avx(_local_4e0,auVar351);
    _local_420 = vsubps_avx(_local_400,local_3e0);
    fVar215 = local_320._0_4_;
    fVar221 = local_320._4_4_;
    auVar35._4_4_ = local_3e0._4_4_ * fVar221;
    auVar35._0_4_ = local_3e0._0_4_ * fVar215;
    fVar253 = local_320._8_4_;
    auVar35._8_4_ = local_3e0._8_4_ * fVar253;
    fVar264 = local_320._12_4_;
    auVar35._12_4_ = local_3e0._12_4_ * fVar264;
    fVar267 = local_320._16_4_;
    auVar35._16_4_ = local_3e0._16_4_ * fVar267;
    fVar279 = local_320._20_4_;
    auVar35._20_4_ = local_3e0._20_4_ * fVar279;
    fVar286 = local_320._24_4_;
    auVar35._24_4_ = local_3e0._24_4_ * fVar286;
    auVar35._28_4_ = 0;
    fVar217 = local_420._0_4_;
    fVar223 = local_420._4_4_;
    auVar36._4_4_ = auVar349._4_4_ * fVar223;
    auVar36._0_4_ = auVar349._0_4_ * fVar217;
    fVar262 = local_420._8_4_;
    auVar36._8_4_ = auVar349._8_4_ * fVar262;
    fVar265 = local_420._12_4_;
    auVar36._12_4_ = auVar349._12_4_ * fVar265;
    fVar269 = local_420._16_4_;
    auVar36._16_4_ = auVar351._16_4_ * fVar269;
    fVar282 = local_420._20_4_;
    auVar36._20_4_ = auVar351._20_4_ * fVar282;
    fVar287 = local_420._24_4_;
    auVar36._24_4_ = auVar351._24_4_ * fVar287;
    auVar36._28_4_ = fVar268;
    auVar27 = vsubps_avx(auVar35,auVar36);
    auVar26 = vmaxps_avx(_local_7a0,local_460);
    auVar37._4_4_ = auVar26._4_4_ * auVar26._4_4_ * (fVar221 * fVar221 + fVar223 * fVar223);
    auVar37._0_4_ = auVar26._0_4_ * auVar26._0_4_ * (fVar215 * fVar215 + fVar217 * fVar217);
    auVar37._8_4_ = auVar26._8_4_ * auVar26._8_4_ * (fVar253 * fVar253 + fVar262 * fVar262);
    auVar37._12_4_ = auVar26._12_4_ * auVar26._12_4_ * (fVar264 * fVar264 + fVar265 * fVar265);
    auVar37._16_4_ = auVar26._16_4_ * auVar26._16_4_ * (fVar267 * fVar267 + fVar269 * fVar269);
    auVar37._20_4_ = auVar26._20_4_ * auVar26._20_4_ * (fVar279 * fVar279 + fVar282 * fVar282);
    auVar37._24_4_ = auVar26._24_4_ * auVar26._24_4_ * (fVar286 * fVar286 + fVar287 * fVar287);
    auVar37._28_4_ = local_420._28_4_ + fVar268;
    auVar38._4_4_ = auVar27._4_4_ * auVar27._4_4_;
    auVar38._0_4_ = auVar27._0_4_ * auVar27._0_4_;
    auVar38._8_4_ = auVar27._8_4_ * auVar27._8_4_;
    auVar38._12_4_ = auVar27._12_4_ * auVar27._12_4_;
    auVar38._16_4_ = auVar27._16_4_ * auVar27._16_4_;
    auVar38._20_4_ = auVar27._20_4_ * auVar27._20_4_;
    auVar38._24_4_ = auVar27._24_4_ * auVar27._24_4_;
    auVar38._28_4_ = auVar27._28_4_;
    auVar26 = vcmpps_avx(auVar38,auVar37,2);
    auVar244 = ZEXT3264(auVar26);
    auVar255 = ZEXT416((uint)(auVar257._0_4_ * 4.7683716e-07));
    local_660._0_16_ = auVar255;
    auVar256._0_4_ = (float)(int)uVar22;
    auVar256._4_12_ = auVar349._4_12_;
    _local_3c0 = auVar256;
    auVar257 = vshufps_avx(auVar256,auVar256,0);
    auVar259._16_16_ = auVar257;
    auVar259._0_16_ = auVar257;
    auVar27 = vcmpps_avx(_DAT_01f7b060,auVar259,1);
    auVar257 = vpermilps_avx(auVar146,0xaa);
    auVar352._16_16_ = auVar257;
    auVar352._0_16_ = auVar257;
    auVar205 = vpermilps_avx(auVar348,0xaa);
    register0x00001590 = auVar205;
    _local_2c0 = auVar205;
    auVar222 = vpermilps_avx(auVar310,0xaa);
    register0x000015d0 = auVar222;
    _local_280 = auVar222;
    auVar226 = vpermilps_avx(auVar201,0xaa);
    register0x00001390 = auVar226;
    _local_2a0 = auVar226;
    auVar28 = auVar27 & auVar26;
    auVar14 = vpermilps_avx((undefined1  [16])aVar13,0xff);
    _local_700 = ZEXT1632(auVar14);
    fVar215 = fVar234;
    fVar217 = fVar245;
    fVar221 = fVar246;
    fVar223 = fVar247;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0x7f,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar28 >> 0xbf,0) == '\0') &&
        (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f]) {
      auVar304 = ZEXT3264(local_6e0);
      auVar315 = ZEXT3264(local_680);
      auVar371 = ZEXT3264(_local_6c0);
      auVar297 = ZEXT3264(_local_580);
      auVar332 = ZEXT3264(_local_6a0);
      local_7b0 = lVar137;
      fVar198 = fVar199;
      fVar219 = fVar216;
      fVar224 = fVar218;
      _local_700 = auVar14;
    }
    else {
      auVar28 = vandps_avx(auVar26,auVar27);
      fVar347 = auVar257._0_4_;
      fVar355 = auVar257._4_4_;
      fVar356 = auVar257._8_4_;
      fVar357 = auVar257._12_4_;
      fVar359 = auVar205._0_4_;
      fVar363 = auVar205._4_4_;
      fVar365 = auVar205._8_4_;
      fVar367 = auVar205._12_4_;
      fVar368 = auVar222._0_4_;
      fVar372 = auVar222._4_4_;
      fVar373 = auVar222._8_4_;
      fVar374 = auVar222._12_4_;
      fVar268 = auVar226._0_4_;
      fVar278 = auVar226._4_4_;
      fVar281 = auVar226._8_4_;
      fVar284 = auVar226._12_4_;
      fVar253 = auVar26._28_4_ + auVar27._28_4_ + fVar284;
      local_300._0_4_ =
           fVar347 * fVar198 + fVar359 * fVar252 + fVar368 * fVar307 + fVar268 * fVar168;
      local_300._4_4_ =
           fVar355 * fVar219 + fVar363 * fVar288 + fVar372 * fVar308 + fVar278 * fVar169;
      fStack_2f8 = fVar356 * fVar224 + fVar365 * fVar248 + fVar373 * fVar251 + fVar281 * fVar170;
      fStack_2f4 = fVar357 * fVar263 + fVar367 * fVar249 + fVar374 * fVar197 + fVar284 * fVar171;
      fStack_2f0 = fVar347 * fVar266 + fVar359 * fVar250 + fVar368 * fVar322 + fVar268 * fVar172;
      fStack_2ec = fVar355 * fVar276 + fVar363 * fVar305 + fVar372 * fVar144 + fVar278 * fVar173;
      fStack_2e8 = fVar356 * fVar285 + fVar365 * fVar306 + fVar373 * fVar166 + fVar281 * fVar175;
      fStack_2e4 = auVar148._28_4_ + fVar253;
      local_2e0._0_4_ = auVar328._0_4_;
      local_2e0._4_4_ = auVar328._4_4_;
      fStack_2d8 = auVar328._8_4_;
      local_5e0._0_4_ = auVar127._0_4_;
      local_5e0._4_4_ = auVar127._4_4_;
      fStack_5d8 = auVar127._8_4_;
      fStack_5d4 = auVar127._12_4_;
      fStack_5d0 = auVar127._16_4_;
      fStack_5cc = auVar127._20_4_;
      fStack_5c8 = auVar127._24_4_;
      local_500 = fVar347 * (float)local_2e0._0_4_ +
                  fVar359 * local_440 + fVar368 * fVar309 + fVar268 * (float)local_5e0._0_4_;
      fStack_4fc = fVar355 * (float)local_2e0._4_4_ +
                   fVar363 * fStack_43c + fVar372 * fVar316 + fVar278 * (float)local_5e0._4_4_;
      fStack_4f8 = fVar356 * fStack_2d8 +
                   fVar365 * fStack_438 + fVar373 * fVar317 + fVar281 * fStack_5d8;
      fStack_4f4 = fVar357 * fVar196 +
                   fVar367 * fStack_434 + fVar374 * fVar318 + fVar284 * fStack_5d4;
      fStack_4f0 = fVar347 * fStack_2d0 +
                   fVar359 * fStack_430 + fVar368 * fVar319 + fVar268 * fStack_5d0;
      fStack_4ec = fVar355 * fStack_2cc +
                   fVar363 * fStack_42c + fVar372 * fVar320 + fVar278 * fStack_5cc;
      fStack_4e8 = fVar356 * fStack_2c8 +
                   fVar365 * fStack_428 + fVar373 * fVar321 + fVar281 * fStack_5c8;
      fStack_4e4 = local_320._28_4_ + fStack_2e4 + auVar148._28_4_ + fVar253;
      fVar198 = *(float *)(bezier_basis0 + lVar141 + 0x1210);
      fVar219 = *(float *)(bezier_basis0 + lVar141 + 0x1214);
      fVar224 = *(float *)(bezier_basis0 + lVar141 + 0x1218);
      fVar253 = *(float *)(bezier_basis0 + lVar141 + 0x121c);
      fVar262 = *(float *)(bezier_basis0 + lVar141 + 0x1220);
      fVar263 = *(float *)(bezier_basis0 + lVar141 + 0x1224);
      fVar264 = *(float *)(bezier_basis0 + lVar141 + 0x1228);
      fVar265 = *(float *)(bezier_basis0 + lVar141 + 0x1694);
      fVar266 = *(float *)(bezier_basis0 + lVar141 + 0x1698);
      fVar267 = *(float *)(bezier_basis0 + lVar141 + 0x169c);
      fVar269 = *(float *)(bezier_basis0 + lVar141 + 0x16a0);
      fVar276 = *(float *)(bezier_basis0 + lVar141 + 0x16a4);
      fVar279 = *(float *)(bezier_basis0 + lVar141 + 0x16a8);
      fVar282 = *(float *)(bezier_basis0 + lVar141 + 0x16ac);
      fVar285 = *(float *)(bezier_basis0 + lVar141 + 0x1b18);
      fVar286 = *(float *)(bezier_basis0 + lVar141 + 0x1b1c);
      fVar287 = *(float *)(bezier_basis0 + lVar141 + 0x1b20);
      fVar309 = *(float *)(bezier_basis0 + lVar141 + 0x1b24);
      fVar316 = *(float *)(bezier_basis0 + lVar141 + 0x1b28);
      fVar317 = *(float *)(bezier_basis0 + lVar141 + 0x1b2c);
      fVar318 = *(float *)(bezier_basis0 + lVar141 + 0x1b30);
      fVar319 = *(float *)(bezier_basis0 + lVar141 + 0x1f9c);
      fVar320 = *(float *)(bezier_basis0 + lVar141 + 0x1fa0);
      fVar321 = *(float *)(bezier_basis0 + lVar141 + 0x1fa4);
      fVar196 = *(float *)(bezier_basis0 + lVar141 + 0x1fa8);
      fVar307 = *(float *)(bezier_basis0 + lVar141 + 0x1fac);
      fVar308 = *(float *)(bezier_basis0 + lVar141 + 0x1fb0);
      fVar251 = *(float *)(bezier_basis0 + lVar141 + 0x1fb4);
      _local_5c0 = auVar338;
      fVar197 = *(float *)(bezier_basis0 + lVar141 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar141 + 0x1fb8);
      fVar322 = *(float *)(bezier_basis0 + lVar141 + 0x16b0) + fVar197;
      fStack_5c4 = *(float *)(bezier_basis0 + lVar141 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar141 + 0x1fb8) +
                   local_3e0._28_4_ + *(float *)(bezier_basis1 + lVar141 + 0xda8);
      local_5e0._4_4_ =
           fVar191 * fVar219 + fVar194 * fVar266 + fVar245 * fVar286 + fVar362 * fVar320;
      local_5e0._0_4_ =
           fVar174 * fVar198 + fVar142 * fVar265 + fVar234 * fVar285 + fVar358 * fVar319;
      fStack_5d8 = fVar192 * fVar224 + fVar195 * fVar267 + fVar246 * fVar287 + fVar364 * fVar321;
      fStack_5d4 = fVar193 * fVar253 + fVar289 * fVar269 + fVar247 * fVar309 + fVar366 * fVar196;
      fStack_5d0 = fVar174 * fVar262 + fVar142 * fVar276 + fVar234 * fVar316 + fVar358 * fVar307;
      fStack_5cc = fVar191 * fVar263 + fVar194 * fVar279 + fVar245 * fVar317 + fVar362 * fVar308;
      fStack_5c8 = fVar192 * fVar264 + fVar195 * fVar282 + fVar246 * fVar318 + fVar364 * fVar251;
      auVar182._0_4_ = fVar198 * fVar336 + fVar270 * fVar285 + fVar199 * fVar319 + fVar265 * fVar329
      ;
      auVar182._4_4_ = fVar219 * fVar344 + fVar277 * fVar286 + fVar216 * fVar320 + fVar266 * fVar333
      ;
      auVar182._8_4_ = fVar224 * fVar345 + fVar280 * fVar287 + fVar218 * fVar321 + fVar267 * fVar334
      ;
      auVar182._12_4_ =
           fVar253 * fVar346 + fVar283 * fVar309 + fVar220 * fVar196 + fVar269 * fVar335;
      auVar182._16_4_ =
           fVar262 * fVar336 + fVar270 * fVar316 + fVar199 * fVar307 + fVar276 * fVar329;
      auVar182._20_4_ =
           fVar263 * fVar344 + fVar277 * fVar317 + fVar216 * fVar308 + fVar279 * fVar333;
      auVar182._24_4_ =
           fVar264 * fVar345 + fVar280 * fVar318 + fVar218 * fVar251 + fVar282 * fVar334;
      auVar182._28_4_ =
           fVar197 + local_3e0._28_4_ + fVar346 +
                     local_3e0._28_4_ + *(float *)(bezier_basis1 + lVar141 + 0xda8);
      auVar230._0_4_ = fVar359 * fVar265 + fVar368 * fVar285 + fVar268 * fVar319 + fVar347 * fVar198
      ;
      auVar230._4_4_ = fVar363 * fVar266 + fVar372 * fVar286 + fVar278 * fVar320 + fVar355 * fVar219
      ;
      auVar230._8_4_ = fVar365 * fVar267 + fVar373 * fVar287 + fVar281 * fVar321 + fVar356 * fVar224
      ;
      auVar230._12_4_ =
           fVar367 * fVar269 + fVar374 * fVar309 + fVar284 * fVar196 + fVar357 * fVar253;
      auVar230._16_4_ =
           fVar359 * fVar276 + fVar368 * fVar316 + fVar268 * fVar307 + fVar347 * fVar262;
      auVar230._20_4_ =
           fVar363 * fVar279 + fVar372 * fVar317 + fVar278 * fVar308 + fVar355 * fVar263;
      auVar230._24_4_ =
           fVar365 * fVar282 + fVar373 * fVar318 + fVar281 * fVar251 + fVar356 * fVar264;
      auVar230._28_4_ = fVar322 + *(float *)(bezier_basis0 + lVar141 + 0x122c);
      fVar198 = *(float *)(bezier_basis1 + lVar141 + 0x1b18);
      fVar219 = *(float *)(bezier_basis1 + lVar141 + 0x1b1c);
      fVar224 = *(float *)(bezier_basis1 + lVar141 + 0x1b20);
      fVar253 = *(float *)(bezier_basis1 + lVar141 + 0x1b24);
      fVar262 = *(float *)(bezier_basis1 + lVar141 + 0x1b28);
      fVar263 = *(float *)(bezier_basis1 + lVar141 + 0x1b2c);
      fVar264 = *(float *)(bezier_basis1 + lVar141 + 0x1b30);
      fVar265 = *(float *)(bezier_basis1 + lVar141 + 0x1f9c);
      fVar266 = *(float *)(bezier_basis1 + lVar141 + 0x1fa0);
      fVar267 = *(float *)(bezier_basis1 + lVar141 + 0x1fa4);
      fVar269 = *(float *)(bezier_basis1 + lVar141 + 0x1fa8);
      fVar276 = *(float *)(bezier_basis1 + lVar141 + 0x1fac);
      fVar279 = *(float *)(bezier_basis1 + lVar141 + 0x1fb0);
      fVar282 = *(float *)(bezier_basis1 + lVar141 + 0x1fb4);
      fVar285 = *(float *)(bezier_basis1 + lVar141 + 0x1694);
      fVar286 = *(float *)(bezier_basis1 + lVar141 + 0x1698);
      fVar287 = *(float *)(bezier_basis1 + lVar141 + 0x169c);
      fVar309 = *(float *)(bezier_basis1 + lVar141 + 0x16a0);
      fVar316 = *(float *)(bezier_basis1 + lVar141 + 0x16a4);
      fVar317 = *(float *)(bezier_basis1 + lVar141 + 0x16a8);
      fVar318 = *(float *)(bezier_basis1 + lVar141 + 0x16ac);
      fVar319 = *(float *)(bezier_basis1 + lVar141 + 0x1210);
      fVar320 = *(float *)(bezier_basis1 + lVar141 + 0x1214);
      fVar321 = *(float *)(bezier_basis1 + lVar141 + 0x1218);
      fVar196 = *(float *)(bezier_basis1 + lVar141 + 0x121c);
      fVar307 = *(float *)(bezier_basis1 + lVar141 + 0x1220);
      fVar308 = *(float *)(bezier_basis1 + lVar141 + 0x1224);
      fVar251 = *(float *)(bezier_basis1 + lVar141 + 0x1228);
      auVar300._0_4_ = fVar174 * fVar319 + fVar142 * fVar285 + fVar234 * fVar198 + fVar358 * fVar265
      ;
      auVar300._4_4_ = fVar191 * fVar320 + fVar194 * fVar286 + fVar245 * fVar219 + fVar362 * fVar266
      ;
      auVar300._8_4_ = fVar192 * fVar321 + fVar195 * fVar287 + fVar246 * fVar224 + fVar364 * fVar267
      ;
      auVar300._12_4_ =
           fVar193 * fVar196 + fVar289 * fVar309 + fVar247 * fVar253 + fVar366 * fVar269;
      auVar300._16_4_ =
           fVar174 * fVar307 + fVar142 * fVar316 + fVar234 * fVar262 + fVar358 * fVar276;
      auVar300._20_4_ =
           fVar191 * fVar308 + fVar194 * fVar317 + fVar245 * fVar263 + fVar362 * fVar279;
      auVar300._24_4_ =
           fVar192 * fVar251 + fVar195 * fVar318 + fVar246 * fVar264 + fVar364 * fVar282;
      auVar300._28_4_ = fVar220 + fVar220 + fVar322 + fStack_5c4;
      auVar312._0_4_ = fVar336 * fVar319 + fVar285 * fVar329 + fVar270 * fVar198 + fVar199 * fVar265
      ;
      auVar312._4_4_ = fVar344 * fVar320 + fVar286 * fVar333 + fVar277 * fVar219 + fVar216 * fVar266
      ;
      auVar312._8_4_ = fVar345 * fVar321 + fVar287 * fVar334 + fVar280 * fVar224 + fVar218 * fVar267
      ;
      auVar312._12_4_ =
           fVar346 * fVar196 + fVar309 * fVar335 + fVar283 * fVar253 + fVar220 * fVar269;
      auVar312._16_4_ =
           fVar336 * fVar307 + fVar316 * fVar329 + fVar270 * fVar262 + fVar199 * fVar276;
      auVar312._20_4_ =
           fVar344 * fVar308 + fVar317 * fVar333 + fVar277 * fVar263 + fVar216 * fVar279;
      auVar312._24_4_ =
           fVar345 * fVar251 + fVar318 * fVar334 + fVar280 * fVar264 + fVar218 * fVar282;
      auVar312._28_4_ = fVar220 + fVar220 + fVar220 + fVar322;
      _local_560 = auVar352;
      auVar241._0_4_ = fVar347 * fVar319 + fVar359 * fVar285 + fVar368 * fVar198 + fVar268 * fVar265
      ;
      auVar241._4_4_ = fVar355 * fVar320 + fVar363 * fVar286 + fVar372 * fVar219 + fVar278 * fVar266
      ;
      auVar241._8_4_ = fVar356 * fVar321 + fVar365 * fVar287 + fVar373 * fVar224 + fVar281 * fVar267
      ;
      auVar241._12_4_ =
           fVar357 * fVar196 + fVar367 * fVar309 + fVar374 * fVar253 + fVar284 * fVar269;
      auVar241._16_4_ =
           fVar347 * fVar307 + fVar359 * fVar316 + fVar368 * fVar262 + fVar268 * fVar276;
      auVar241._20_4_ =
           fVar355 * fVar308 + fVar363 * fVar317 + fVar372 * fVar263 + fVar278 * fVar279;
      auVar241._24_4_ =
           fVar356 * fVar251 + fVar365 * fVar318 + fVar373 * fVar264 + fVar281 * fVar282;
      auVar241._28_4_ =
           *(float *)(bezier_basis1 + lVar141 + 0x122c) +
           *(float *)(bezier_basis1 + lVar141 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar141 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar141 + 0x1fb8);
      auVar212._8_4_ = 0x7fffffff;
      auVar212._0_8_ = 0x7fffffff7fffffff;
      auVar212._12_4_ = 0x7fffffff;
      auVar212._16_4_ = 0x7fffffff;
      auVar212._20_4_ = 0x7fffffff;
      auVar212._24_4_ = 0x7fffffff;
      auVar212._28_4_ = 0x7fffffff;
      auVar148 = vandps_avx(_local_5e0,auVar212);
      auVar26 = vandps_avx(auVar182,auVar212);
      auVar26 = vmaxps_avx(auVar148,auVar26);
      auVar148 = vandps_avx(auVar230,auVar212);
      auVar148 = vmaxps_avx(auVar26,auVar148);
      auVar257 = vpermilps_avx(auVar255,0);
      auVar293._16_16_ = auVar257;
      auVar293._0_16_ = auVar257;
      auVar148 = vcmpps_avx(auVar148,auVar293,1);
      auVar27 = vblendvps_avx(_local_5e0,local_320,auVar148);
      auVar29 = vblendvps_avx(auVar182,_local_420,auVar148);
      auVar148 = vandps_avx(auVar300,auVar212);
      auVar26 = vandps_avx(auVar312,auVar212);
      auVar30 = vmaxps_avx(auVar148,auVar26);
      auVar148 = vandps_avx(auVar241,auVar212);
      auVar148 = vmaxps_avx(auVar30,auVar148);
      auVar30 = vcmpps_avx(auVar148,auVar293,1);
      auVar148 = vblendvps_avx(auVar300,local_320,auVar30);
      auVar30 = vblendvps_avx(auVar312,_local_420,auVar30);
      fVar144 = auVar27._0_4_;
      fVar166 = auVar27._4_4_;
      fVar168 = auVar27._8_4_;
      fVar169 = auVar27._12_4_;
      fVar170 = auVar27._16_4_;
      fVar171 = auVar27._20_4_;
      fVar172 = auVar27._24_4_;
      fVar173 = auVar148._0_4_;
      fVar175 = auVar148._4_4_;
      fVar252 = auVar148._8_4_;
      fVar288 = auVar148._12_4_;
      fVar248 = auVar148._16_4_;
      fVar249 = auVar148._20_4_;
      fVar250 = auVar148._24_4_;
      fVar198 = auVar29._0_4_;
      fVar262 = auVar29._4_4_;
      fVar266 = auVar29._8_4_;
      fVar279 = auVar29._12_4_;
      fVar287 = auVar29._16_4_;
      fVar318 = auVar29._20_4_;
      fVar196 = auVar29._24_4_;
      auVar152._0_4_ = fVar198 * fVar198 + fVar144 * fVar144;
      auVar152._4_4_ = fVar262 * fVar262 + fVar166 * fVar166;
      auVar152._8_4_ = fVar266 * fVar266 + fVar168 * fVar168;
      auVar152._12_4_ = fVar279 * fVar279 + fVar169 * fVar169;
      auVar152._16_4_ = fVar287 * fVar287 + fVar170 * fVar170;
      auVar152._20_4_ = fVar318 * fVar318 + fVar171 * fVar171;
      auVar152._24_4_ = fVar196 * fVar196 + fVar172 * fVar172;
      auVar152._28_4_ = auVar312._28_4_ + auVar27._28_4_;
      auVar27 = vrsqrtps_avx(auVar152);
      fVar219 = auVar27._0_4_;
      fVar224 = auVar27._4_4_;
      auVar39._4_4_ = fVar224 * 1.5;
      auVar39._0_4_ = fVar219 * 1.5;
      fVar253 = auVar27._8_4_;
      auVar39._8_4_ = fVar253 * 1.5;
      fVar263 = auVar27._12_4_;
      auVar39._12_4_ = fVar263 * 1.5;
      fVar264 = auVar27._16_4_;
      auVar39._16_4_ = fVar264 * 1.5;
      fVar265 = auVar27._20_4_;
      auVar39._20_4_ = fVar265 * 1.5;
      fVar267 = auVar27._24_4_;
      auVar39._24_4_ = fVar267 * 1.5;
      auVar39._28_4_ = auVar26._28_4_;
      auVar40._4_4_ = fVar224 * fVar224 * fVar224 * auVar152._4_4_ * 0.5;
      auVar40._0_4_ = fVar219 * fVar219 * fVar219 * auVar152._0_4_ * 0.5;
      auVar40._8_4_ = fVar253 * fVar253 * fVar253 * auVar152._8_4_ * 0.5;
      auVar40._12_4_ = fVar263 * fVar263 * fVar263 * auVar152._12_4_ * 0.5;
      auVar40._16_4_ = fVar264 * fVar264 * fVar264 * auVar152._16_4_ * 0.5;
      auVar40._20_4_ = fVar265 * fVar265 * fVar265 * auVar152._20_4_ * 0.5;
      auVar40._24_4_ = fVar267 * fVar267 * fVar267 * auVar152._24_4_ * 0.5;
      auVar40._28_4_ = auVar152._28_4_;
      auVar27 = vsubps_avx(auVar39,auVar40);
      fVar219 = auVar27._0_4_;
      fVar263 = auVar27._4_4_;
      fVar267 = auVar27._8_4_;
      fVar282 = auVar27._12_4_;
      fVar309 = auVar27._16_4_;
      fVar319 = auVar27._20_4_;
      fVar307 = auVar27._24_4_;
      fVar197 = auVar29._28_4_;
      fVar224 = auVar30._0_4_;
      fVar264 = auVar30._4_4_;
      fVar269 = auVar30._8_4_;
      fVar285 = auVar30._12_4_;
      fVar316 = auVar30._16_4_;
      fVar320 = auVar30._20_4_;
      fVar308 = auVar30._24_4_;
      auVar153._0_4_ = fVar224 * fVar224 + fVar173 * fVar173;
      auVar153._4_4_ = fVar264 * fVar264 + fVar175 * fVar175;
      auVar153._8_4_ = fVar269 * fVar269 + fVar252 * fVar252;
      auVar153._12_4_ = fVar285 * fVar285 + fVar288 * fVar288;
      auVar153._16_4_ = fVar316 * fVar316 + fVar248 * fVar248;
      auVar153._20_4_ = fVar320 * fVar320 + fVar249 * fVar249;
      auVar153._24_4_ = fVar308 * fVar308 + fVar250 * fVar250;
      auVar153._28_4_ = auVar148._28_4_ + auVar27._28_4_;
      auVar148 = vrsqrtps_avx(auVar153);
      fVar253 = auVar148._0_4_;
      fVar265 = auVar148._4_4_;
      auVar41._4_4_ = fVar265 * 1.5;
      auVar41._0_4_ = fVar253 * 1.5;
      fVar276 = auVar148._8_4_;
      auVar41._8_4_ = fVar276 * 1.5;
      fVar286 = auVar148._12_4_;
      auVar41._12_4_ = fVar286 * 1.5;
      fVar317 = auVar148._16_4_;
      auVar41._16_4_ = fVar317 * 1.5;
      fVar321 = auVar148._20_4_;
      auVar41._20_4_ = fVar321 * 1.5;
      fVar251 = auVar148._24_4_;
      auVar41._24_4_ = fVar251 * 1.5;
      auVar41._28_4_ = auVar26._28_4_;
      fVar322 = auVar148._28_4_;
      auVar42._4_4_ = fVar265 * fVar265 * fVar265 * auVar153._4_4_ * 0.5;
      auVar42._0_4_ = fVar253 * fVar253 * fVar253 * auVar153._0_4_ * 0.5;
      auVar42._8_4_ = fVar276 * fVar276 * fVar276 * auVar153._8_4_ * 0.5;
      auVar42._12_4_ = fVar286 * fVar286 * fVar286 * auVar153._12_4_ * 0.5;
      auVar42._16_4_ = fVar317 * fVar317 * fVar317 * auVar153._16_4_ * 0.5;
      auVar42._20_4_ = fVar321 * fVar321 * fVar321 * auVar153._20_4_ * 0.5;
      auVar42._24_4_ = fVar251 * fVar251 * fVar251 * auVar153._24_4_ * 0.5;
      auVar42._28_4_ = auVar153._28_4_;
      auVar148 = vsubps_avx(auVar41,auVar42);
      fVar253 = auVar148._0_4_;
      fVar265 = auVar148._4_4_;
      fVar276 = auVar148._8_4_;
      fVar286 = auVar148._12_4_;
      fVar317 = auVar148._16_4_;
      fVar321 = auVar148._20_4_;
      fVar251 = auVar148._24_4_;
      fVar198 = fVar143 * fVar198 * fVar219;
      fVar262 = fVar165 * fVar262 * fVar263;
      auVar43._4_4_ = fVar262;
      auVar43._0_4_ = fVar198;
      fVar266 = fVar167 * fVar266 * fVar267;
      auVar43._8_4_ = fVar266;
      fVar279 = fStack_794 * fVar279 * fVar282;
      auVar43._12_4_ = fVar279;
      fVar287 = fStack_790 * fVar287 * fVar309;
      auVar43._16_4_ = fVar287;
      fVar318 = fStack_78c * fVar318 * fVar319;
      auVar43._20_4_ = fVar318;
      fVar196 = fStack_788 * fVar196 * fVar307;
      auVar43._24_4_ = fVar196;
      auVar43._28_4_ = fVar197;
      local_5e0._4_4_ = auVar349._4_4_ + fVar262;
      local_5e0._0_4_ = auVar349._0_4_ + fVar198;
      fStack_5d8 = auVar349._8_4_ + fVar266;
      fStack_5d4 = auVar349._12_4_ + fVar279;
      fStack_5d0 = auVar351._16_4_ + fVar287;
      fStack_5cc = auVar351._20_4_ + fVar318;
      fStack_5c8 = auVar351._24_4_ + fVar196;
      fStack_5c4 = auVar351._28_4_ + fVar197;
      fVar198 = fVar143 * fVar219 * -fVar144;
      fVar262 = fVar165 * fVar263 * -fVar166;
      auVar44._4_4_ = fVar262;
      auVar44._0_4_ = fVar198;
      fVar266 = fVar167 * fVar267 * -fVar168;
      auVar44._8_4_ = fVar266;
      fVar279 = fStack_794 * fVar282 * -fVar169;
      auVar44._12_4_ = fVar279;
      fVar287 = fStack_790 * fVar309 * -fVar170;
      auVar44._16_4_ = fVar287;
      fVar318 = fStack_78c * fVar319 * -fVar171;
      auVar44._20_4_ = fVar318;
      fVar196 = fStack_788 * fVar307 * -fVar172;
      auVar44._24_4_ = fVar196;
      auVar44._28_4_ = 0x3f000000;
      auVar294._0_4_ = fVar198 + local_3e0._0_4_;
      auVar294._4_4_ = fVar262 + local_3e0._4_4_;
      auVar294._8_4_ = fVar266 + local_3e0._8_4_;
      auVar294._12_4_ = fVar279 + local_3e0._12_4_;
      auVar294._16_4_ = fVar287 + local_3e0._16_4_;
      auVar294._20_4_ = fVar318 + local_3e0._20_4_;
      auVar294._24_4_ = fVar196 + local_3e0._24_4_;
      auVar294._28_4_ = local_3e0._28_4_ + 0.5;
      fVar198 = fVar219 * 0.0 * fVar143;
      fVar219 = fVar263 * 0.0 * fVar165;
      auVar45._4_4_ = fVar219;
      auVar45._0_4_ = fVar198;
      fVar262 = fVar267 * 0.0 * fVar167;
      auVar45._8_4_ = fVar262;
      fVar263 = fVar282 * 0.0 * fStack_794;
      auVar45._12_4_ = fVar263;
      fVar266 = fVar309 * 0.0 * fStack_790;
      auVar45._16_4_ = fVar266;
      fVar267 = fVar319 * 0.0 * fStack_78c;
      auVar45._20_4_ = fVar267;
      fVar279 = fVar307 * 0.0 * fStack_788;
      auVar45._24_4_ = fVar279;
      auVar45._28_4_ = fVar357;
      auVar124._4_4_ = fStack_4fc;
      auVar124._0_4_ = local_500;
      auVar124._8_4_ = fStack_4f8;
      auVar124._12_4_ = fStack_4f4;
      auVar124._16_4_ = fStack_4f0;
      auVar124._20_4_ = fStack_4ec;
      auVar124._24_4_ = fStack_4e8;
      auVar124._28_4_ = fStack_4e4;
      auVar301._0_4_ = fVar198 + local_500;
      auVar301._4_4_ = fVar219 + fStack_4fc;
      auVar301._8_4_ = fVar262 + fStack_4f8;
      auVar301._12_4_ = fVar263 + fStack_4f4;
      auVar301._16_4_ = fVar266 + fStack_4f0;
      auVar301._20_4_ = fVar267 + fStack_4ec;
      auVar301._24_4_ = fVar279 + fStack_4e8;
      auVar301._28_4_ = fVar357 + fStack_4e4;
      fVar198 = local_460._0_4_ * fVar224 * fVar253;
      fVar219 = local_460._4_4_ * fVar264 * fVar265;
      auVar46._4_4_ = fVar219;
      auVar46._0_4_ = fVar198;
      fVar224 = local_460._8_4_ * fVar269 * fVar276;
      auVar46._8_4_ = fVar224;
      fVar262 = local_460._12_4_ * fVar285 * fVar286;
      auVar46._12_4_ = fVar262;
      fVar263 = local_460._16_4_ * fVar316 * fVar317;
      auVar46._16_4_ = fVar263;
      fVar264 = local_460._20_4_ * fVar320 * fVar321;
      auVar46._20_4_ = fVar264;
      fVar266 = local_460._24_4_ * fVar308 * fVar251;
      auVar46._24_4_ = fVar266;
      auVar46._28_4_ = auVar30._28_4_;
      auVar31 = vsubps_avx(auVar351,auVar43);
      auVar325._0_4_ = (float)local_4e0._0_4_ + fVar198;
      auVar325._4_4_ = (float)local_4e0._4_4_ + fVar219;
      auVar325._8_4_ = fStack_4d8 + fVar224;
      auVar325._12_4_ = fStack_4d4 + fVar262;
      auVar325._16_4_ = fStack_4d0 + fVar263;
      auVar325._20_4_ = fStack_4cc + fVar264;
      auVar325._24_4_ = fStack_4c8 + fVar266;
      auVar325._28_4_ = fStack_4c4 + auVar30._28_4_;
      fVar198 = local_460._0_4_ * -fVar173 * fVar253;
      fVar219 = local_460._4_4_ * -fVar175 * fVar265;
      auVar47._4_4_ = fVar219;
      auVar47._0_4_ = fVar198;
      fVar224 = local_460._8_4_ * -fVar252 * fVar276;
      auVar47._8_4_ = fVar224;
      fVar262 = local_460._12_4_ * -fVar288 * fVar286;
      auVar47._12_4_ = fVar262;
      fVar263 = local_460._16_4_ * -fVar248 * fVar317;
      auVar47._16_4_ = fVar263;
      fVar264 = local_460._20_4_ * -fVar249 * fVar321;
      auVar47._20_4_ = fVar264;
      fVar266 = local_460._24_4_ * -fVar250 * fVar251;
      auVar47._24_4_ = fVar266;
      auVar47._28_4_ = fVar197;
      auVar25 = vsubps_avx(local_3e0,auVar44);
      auVar361._0_4_ = (float)local_400._0_4_ + fVar198;
      auVar361._4_4_ = (float)local_400._4_4_ + fVar219;
      auVar361._8_4_ = fStack_3f8 + fVar224;
      auVar361._12_4_ = fStack_3f4 + fVar262;
      auVar361._16_4_ = fStack_3f0 + fVar263;
      auVar361._20_4_ = fStack_3ec + fVar264;
      auVar361._24_4_ = fStack_3e8 + fVar266;
      auVar361._28_4_ = fStack_3e4 + fVar197;
      fVar198 = fVar253 * 0.0 * local_460._0_4_;
      fVar219 = fVar265 * 0.0 * local_460._4_4_;
      auVar48._4_4_ = fVar219;
      auVar48._0_4_ = fVar198;
      fVar224 = fVar276 * 0.0 * local_460._8_4_;
      auVar48._8_4_ = fVar224;
      fVar253 = fVar286 * 0.0 * local_460._12_4_;
      auVar48._12_4_ = fVar253;
      fVar262 = fVar317 * 0.0 * local_460._16_4_;
      auVar48._16_4_ = fVar262;
      fVar263 = fVar321 * 0.0 * local_460._20_4_;
      auVar48._20_4_ = fVar263;
      fVar264 = fVar251 * 0.0 * local_460._24_4_;
      auVar48._24_4_ = fVar264;
      auVar48._28_4_ = fVar322;
      auVar32 = vsubps_avx(auVar124,auVar45);
      auVar369._0_4_ = (float)local_300._0_4_ + fVar198;
      auVar369._4_4_ = (float)local_300._4_4_ + fVar219;
      auVar369._8_4_ = fStack_2f8 + fVar224;
      auVar369._12_4_ = fStack_2f4 + fVar253;
      auVar369._16_4_ = fStack_2f0 + fVar262;
      auVar369._20_4_ = fStack_2ec + fVar263;
      auVar369._24_4_ = fStack_2e8 + fVar264;
      auVar369._28_4_ = fStack_2e4 + fVar322;
      auVar148 = vsubps_avx(_local_4e0,auVar46);
      auVar26 = vsubps_avx(_local_400,auVar47);
      auVar27 = vsubps_avx(_local_300,auVar48);
      auVar29 = vsubps_avx(auVar361,auVar25);
      auVar30 = vsubps_avx(auVar369,auVar32);
      auVar49._4_4_ = auVar32._4_4_ * auVar29._4_4_;
      auVar49._0_4_ = auVar32._0_4_ * auVar29._0_4_;
      auVar49._8_4_ = auVar32._8_4_ * auVar29._8_4_;
      auVar49._12_4_ = auVar32._12_4_ * auVar29._12_4_;
      auVar49._16_4_ = auVar32._16_4_ * auVar29._16_4_;
      auVar49._20_4_ = auVar32._20_4_ * auVar29._20_4_;
      auVar49._24_4_ = auVar32._24_4_ * auVar29._24_4_;
      auVar49._28_4_ = fVar322;
      auVar50._4_4_ = auVar25._4_4_ * auVar30._4_4_;
      auVar50._0_4_ = auVar25._0_4_ * auVar30._0_4_;
      auVar50._8_4_ = auVar25._8_4_ * auVar30._8_4_;
      auVar50._12_4_ = auVar25._12_4_ * auVar30._12_4_;
      auVar50._16_4_ = auVar25._16_4_ * auVar30._16_4_;
      auVar50._20_4_ = auVar25._20_4_ * auVar30._20_4_;
      auVar50._24_4_ = auVar25._24_4_ * auVar30._24_4_;
      auVar50._28_4_ = fStack_3e4;
      auVar33 = vsubps_avx(auVar50,auVar49);
      auVar51._4_4_ = auVar31._4_4_ * auVar30._4_4_;
      auVar51._0_4_ = auVar31._0_4_ * auVar30._0_4_;
      auVar51._8_4_ = auVar31._8_4_ * auVar30._8_4_;
      auVar51._12_4_ = auVar31._12_4_ * auVar30._12_4_;
      auVar51._16_4_ = auVar31._16_4_ * auVar30._16_4_;
      auVar51._20_4_ = auVar31._20_4_ * auVar30._20_4_;
      auVar51._24_4_ = auVar31._24_4_ * auVar30._24_4_;
      auVar51._28_4_ = auVar30._28_4_;
      auVar34 = vsubps_avx(auVar325,auVar31);
      auVar52._4_4_ = auVar32._4_4_ * auVar34._4_4_;
      auVar52._0_4_ = auVar32._0_4_ * auVar34._0_4_;
      auVar52._8_4_ = auVar32._8_4_ * auVar34._8_4_;
      auVar52._12_4_ = auVar32._12_4_ * auVar34._12_4_;
      auVar52._16_4_ = auVar32._16_4_ * auVar34._16_4_;
      auVar52._20_4_ = auVar32._20_4_ * auVar34._20_4_;
      auVar52._24_4_ = auVar32._24_4_ * auVar34._24_4_;
      auVar52._28_4_ = fStack_4c4;
      auVar149 = vsubps_avx(auVar52,auVar51);
      auVar53._4_4_ = auVar25._4_4_ * auVar34._4_4_;
      auVar53._0_4_ = auVar25._0_4_ * auVar34._0_4_;
      auVar53._8_4_ = auVar25._8_4_ * auVar34._8_4_;
      auVar53._12_4_ = auVar25._12_4_ * auVar34._12_4_;
      auVar53._16_4_ = auVar25._16_4_ * auVar34._16_4_;
      auVar53._20_4_ = auVar25._20_4_ * auVar34._20_4_;
      auVar53._24_4_ = auVar25._24_4_ * auVar34._24_4_;
      auVar53._28_4_ = auVar30._28_4_;
      auVar54._4_4_ = auVar31._4_4_ * auVar29._4_4_;
      auVar54._0_4_ = auVar31._0_4_ * auVar29._0_4_;
      auVar54._8_4_ = auVar31._8_4_ * auVar29._8_4_;
      auVar54._12_4_ = auVar31._12_4_ * auVar29._12_4_;
      auVar54._16_4_ = auVar31._16_4_ * auVar29._16_4_;
      auVar54._20_4_ = auVar31._20_4_ * auVar29._20_4_;
      auVar54._24_4_ = auVar31._24_4_ * auVar29._24_4_;
      auVar54._28_4_ = auVar29._28_4_;
      auVar29 = vsubps_avx(auVar54,auVar53);
      auVar154._0_4_ = auVar33._0_4_ * 0.0 + auVar29._0_4_ + auVar149._0_4_ * 0.0;
      auVar154._4_4_ = auVar33._4_4_ * 0.0 + auVar29._4_4_ + auVar149._4_4_ * 0.0;
      auVar154._8_4_ = auVar33._8_4_ * 0.0 + auVar29._8_4_ + auVar149._8_4_ * 0.0;
      auVar154._12_4_ = auVar33._12_4_ * 0.0 + auVar29._12_4_ + auVar149._12_4_ * 0.0;
      auVar154._16_4_ = auVar33._16_4_ * 0.0 + auVar29._16_4_ + auVar149._16_4_ * 0.0;
      auVar154._20_4_ = auVar33._20_4_ * 0.0 + auVar29._20_4_ + auVar149._20_4_ * 0.0;
      auVar154._24_4_ = auVar33._24_4_ * 0.0 + auVar29._24_4_ + auVar149._24_4_ * 0.0;
      auVar154._28_4_ = auVar29._28_4_ + auVar29._28_4_ + auVar149._28_4_;
      auVar33 = vcmpps_avx(auVar154,ZEXT832(0) << 0x20,2);
      auVar233 = ZEXT3264(auVar33);
      local_5a0 = vblendvps_avx(auVar148,_local_5e0,auVar33);
      _local_540 = vblendvps_avx(auVar26,auVar294,auVar33);
      auVar148 = vblendvps_avx(auVar27,auVar301,auVar33);
      auVar26 = vblendvps_avx(auVar31,auVar325,auVar33);
      auVar27 = vblendvps_avx(auVar25,auVar361,auVar33);
      auVar29 = vblendvps_avx(auVar32,auVar369,auVar33);
      auVar30 = vblendvps_avx(auVar325,auVar31,auVar33);
      auVar31 = vblendvps_avx(auVar361,auVar25,auVar33);
      auVar257 = vpackssdw_avx(auVar28._0_16_,auVar28._16_16_);
      auVar32 = vblendvps_avx(auVar369,auVar32,auVar33);
      auVar30 = vsubps_avx(auVar30,local_5a0);
      auVar31 = vsubps_avx(auVar31,_local_540);
      auVar32 = vsubps_avx(auVar32,auVar148);
      auVar34 = vsubps_avx(_local_540,auVar27);
      fVar198 = auVar31._0_4_;
      fVar171 = auVar148._0_4_;
      fVar263 = auVar31._4_4_;
      fVar172 = auVar148._4_4_;
      auVar55._4_4_ = fVar172 * fVar263;
      auVar55._0_4_ = fVar171 * fVar198;
      fVar269 = auVar31._8_4_;
      fVar173 = auVar148._8_4_;
      auVar55._8_4_ = fVar173 * fVar269;
      fVar286 = auVar31._12_4_;
      fVar175 = auVar148._12_4_;
      auVar55._12_4_ = fVar175 * fVar286;
      fVar318 = auVar31._16_4_;
      fVar252 = auVar148._16_4_;
      auVar55._16_4_ = fVar252 * fVar318;
      fVar307 = auVar31._20_4_;
      fVar288 = auVar148._20_4_;
      auVar55._20_4_ = fVar288 * fVar307;
      fVar144 = auVar31._24_4_;
      fVar248 = auVar148._24_4_;
      auVar55._24_4_ = fVar248 * fVar144;
      auVar55._28_4_ = auVar28._28_4_;
      fVar219 = local_540._0_4_;
      fVar220 = auVar32._0_4_;
      fVar264 = local_540._4_4_;
      fVar142 = auVar32._4_4_;
      auVar56._4_4_ = fVar142 * fVar264;
      auVar56._0_4_ = fVar220 * fVar219;
      fVar276 = local_540._8_4_;
      fVar194 = auVar32._8_4_;
      auVar56._8_4_ = fVar194 * fVar276;
      fVar287 = local_540._12_4_;
      fVar195 = auVar32._12_4_;
      auVar56._12_4_ = fVar195 * fVar287;
      fVar319 = local_540._16_4_;
      fVar289 = auVar32._16_4_;
      auVar56._16_4_ = fVar289 * fVar319;
      fVar308 = local_540._20_4_;
      fVar174 = auVar32._20_4_;
      auVar56._20_4_ = fVar174 * fVar308;
      fVar166 = local_540._24_4_;
      fVar191 = auVar32._24_4_;
      uVar11 = auVar25._28_4_;
      auVar56._24_4_ = fVar191 * fVar166;
      auVar56._28_4_ = uVar11;
      auVar28 = vsubps_avx(auVar56,auVar55);
      fVar224 = local_5a0._0_4_;
      fVar265 = local_5a0._4_4_;
      auVar57._4_4_ = fVar142 * fVar265;
      auVar57._0_4_ = fVar220 * fVar224;
      fVar279 = local_5a0._8_4_;
      auVar57._8_4_ = fVar194 * fVar279;
      fVar309 = local_5a0._12_4_;
      auVar57._12_4_ = fVar195 * fVar309;
      fVar320 = local_5a0._16_4_;
      auVar57._16_4_ = fVar289 * fVar320;
      fVar251 = local_5a0._20_4_;
      auVar57._20_4_ = fVar174 * fVar251;
      fVar168 = local_5a0._24_4_;
      auVar57._24_4_ = fVar191 * fVar168;
      auVar57._28_4_ = uVar11;
      fVar253 = auVar30._0_4_;
      fVar266 = auVar30._4_4_;
      auVar58._4_4_ = fVar172 * fVar266;
      auVar58._0_4_ = fVar171 * fVar253;
      fVar282 = auVar30._8_4_;
      auVar58._8_4_ = fVar173 * fVar282;
      fVar316 = auVar30._12_4_;
      auVar58._12_4_ = fVar175 * fVar316;
      fVar321 = auVar30._16_4_;
      auVar58._16_4_ = fVar252 * fVar321;
      fVar197 = auVar30._20_4_;
      auVar58._20_4_ = fVar288 * fVar197;
      fVar169 = auVar30._24_4_;
      auVar58._24_4_ = fVar248 * fVar169;
      auVar58._28_4_ = auVar361._28_4_;
      auVar25 = vsubps_avx(auVar58,auVar57);
      auVar59._4_4_ = fVar264 * fVar266;
      auVar59._0_4_ = fVar219 * fVar253;
      auVar59._8_4_ = fVar276 * fVar282;
      auVar59._12_4_ = fVar287 * fVar316;
      auVar59._16_4_ = fVar319 * fVar321;
      auVar59._20_4_ = fVar308 * fVar197;
      auVar59._24_4_ = fVar166 * fVar169;
      auVar59._28_4_ = uVar11;
      auVar60._4_4_ = fVar265 * fVar263;
      auVar60._0_4_ = fVar224 * fVar198;
      auVar60._8_4_ = fVar279 * fVar269;
      auVar60._12_4_ = fVar309 * fVar286;
      auVar60._16_4_ = fVar320 * fVar318;
      auVar60._20_4_ = fVar251 * fVar307;
      auVar60._24_4_ = fVar168 * fVar144;
      auVar60._28_4_ = auVar369._28_4_;
      auVar149 = vsubps_avx(auVar60,auVar59);
      auVar150 = vsubps_avx(auVar148,auVar29);
      fVar262 = auVar149._28_4_ + auVar25._28_4_;
      auVar242._0_4_ = auVar149._0_4_ + auVar25._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
      auVar242._4_4_ = auVar149._4_4_ + auVar25._4_4_ * 0.0 + auVar28._4_4_ * 0.0;
      auVar242._8_4_ = auVar149._8_4_ + auVar25._8_4_ * 0.0 + auVar28._8_4_ * 0.0;
      auVar242._12_4_ = auVar149._12_4_ + auVar25._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
      auVar242._16_4_ = auVar149._16_4_ + auVar25._16_4_ * 0.0 + auVar28._16_4_ * 0.0;
      auVar242._20_4_ = auVar149._20_4_ + auVar25._20_4_ * 0.0 + auVar28._20_4_ * 0.0;
      auVar242._24_4_ = auVar149._24_4_ + auVar25._24_4_ * 0.0 + auVar28._24_4_ * 0.0;
      auVar242._28_4_ = fVar262 + 0.0;
      auVar244 = ZEXT3264(auVar242);
      fVar249 = auVar34._0_4_;
      fVar250 = auVar34._4_4_;
      auVar61._4_4_ = fVar250 * auVar29._4_4_;
      auVar61._0_4_ = fVar249 * auVar29._0_4_;
      fVar305 = auVar34._8_4_;
      auVar61._8_4_ = fVar305 * auVar29._8_4_;
      fVar306 = auVar34._12_4_;
      auVar61._12_4_ = fVar306 * auVar29._12_4_;
      fVar199 = auVar34._16_4_;
      auVar61._16_4_ = fVar199 * auVar29._16_4_;
      fVar216 = auVar34._20_4_;
      auVar61._20_4_ = fVar216 * auVar29._20_4_;
      fVar218 = auVar34._24_4_;
      auVar61._24_4_ = fVar218 * auVar29._24_4_;
      auVar61._28_4_ = fVar262;
      fVar262 = auVar150._0_4_;
      fVar267 = auVar150._4_4_;
      auVar62._4_4_ = auVar27._4_4_ * fVar267;
      auVar62._0_4_ = auVar27._0_4_ * fVar262;
      fVar285 = auVar150._8_4_;
      auVar62._8_4_ = auVar27._8_4_ * fVar285;
      fVar317 = auVar150._12_4_;
      auVar62._12_4_ = auVar27._12_4_ * fVar317;
      fVar196 = auVar150._16_4_;
      auVar62._16_4_ = auVar27._16_4_ * fVar196;
      fVar322 = auVar150._20_4_;
      auVar62._20_4_ = auVar27._20_4_ * fVar322;
      fVar170 = auVar150._24_4_;
      auVar62._24_4_ = auVar27._24_4_ * fVar170;
      auVar62._28_4_ = auVar149._28_4_;
      auVar28 = vsubps_avx(auVar62,auVar61);
      auVar25 = vsubps_avx(local_5a0,auVar26);
      fVar192 = auVar25._0_4_;
      fVar193 = auVar25._4_4_;
      auVar63._4_4_ = fVar193 * auVar29._4_4_;
      auVar63._0_4_ = fVar192 * auVar29._0_4_;
      fVar268 = auVar25._8_4_;
      auVar63._8_4_ = fVar268 * auVar29._8_4_;
      fVar270 = auVar25._12_4_;
      auVar63._12_4_ = fVar270 * auVar29._12_4_;
      fVar277 = auVar25._16_4_;
      auVar63._16_4_ = fVar277 * auVar29._16_4_;
      fVar280 = auVar25._20_4_;
      auVar63._20_4_ = fVar280 * auVar29._20_4_;
      fVar283 = auVar25._24_4_;
      auVar63._24_4_ = fVar283 * auVar29._24_4_;
      auVar63._28_4_ = auVar29._28_4_;
      auVar64._4_4_ = auVar26._4_4_ * fVar267;
      auVar64._0_4_ = auVar26._0_4_ * fVar262;
      auVar64._8_4_ = auVar26._8_4_ * fVar285;
      auVar64._12_4_ = auVar26._12_4_ * fVar317;
      auVar64._16_4_ = auVar26._16_4_ * fVar196;
      auVar64._20_4_ = auVar26._20_4_ * fVar322;
      auVar64._24_4_ = auVar26._24_4_ * fVar170;
      auVar64._28_4_ = 0;
      auVar25 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = auVar27._4_4_ * fVar193;
      auVar65._0_4_ = auVar27._0_4_ * fVar192;
      auVar65._8_4_ = auVar27._8_4_ * fVar268;
      auVar65._12_4_ = auVar27._12_4_ * fVar270;
      auVar65._16_4_ = auVar27._16_4_ * fVar277;
      auVar65._20_4_ = auVar27._20_4_ * fVar280;
      auVar65._24_4_ = auVar27._24_4_ * fVar283;
      auVar65._28_4_ = auVar29._28_4_;
      auVar66._4_4_ = auVar26._4_4_ * fVar250;
      auVar66._0_4_ = auVar26._0_4_ * fVar249;
      auVar66._8_4_ = auVar26._8_4_ * fVar305;
      auVar66._12_4_ = auVar26._12_4_ * fVar306;
      auVar66._16_4_ = auVar26._16_4_ * fVar199;
      auVar66._20_4_ = auVar26._20_4_ * fVar216;
      auVar66._24_4_ = auVar26._24_4_ * fVar218;
      auVar66._28_4_ = auVar26._28_4_;
      auVar26 = vsubps_avx(auVar66,auVar65);
      auVar213._0_4_ = auVar28._0_4_ * 0.0 + auVar26._0_4_ + auVar25._0_4_ * 0.0;
      auVar213._4_4_ = auVar28._4_4_ * 0.0 + auVar26._4_4_ + auVar25._4_4_ * 0.0;
      auVar213._8_4_ = auVar28._8_4_ * 0.0 + auVar26._8_4_ + auVar25._8_4_ * 0.0;
      auVar213._12_4_ = auVar28._12_4_ * 0.0 + auVar26._12_4_ + auVar25._12_4_ * 0.0;
      auVar213._16_4_ = auVar28._16_4_ * 0.0 + auVar26._16_4_ + auVar25._16_4_ * 0.0;
      auVar213._20_4_ = auVar28._20_4_ * 0.0 + auVar26._20_4_ + auVar25._20_4_ * 0.0;
      auVar213._24_4_ = auVar28._24_4_ * 0.0 + auVar26._24_4_ + auVar25._24_4_ * 0.0;
      auVar213._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar25._28_4_;
      auVar26 = vmaxps_avx(auVar242,auVar213);
      auVar26 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,2);
      auVar205 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
      auVar257 = vpand_avx(auVar257,auVar205);
      auVar205 = vpmovsxwd_avx(auVar257);
      auVar222 = vpunpckhwd_avx(auVar257,auVar257);
      auVar155._16_16_ = auVar222;
      auVar155._0_16_ = auVar205;
      if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar155 >> 0x7f,0) == '\0') &&
            (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar222 >> 0x3f,0) == '\0') &&
          (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar222[0xf]
         ) {
LAB_00a403de:
        auVar184._8_8_ = local_4c0[1]._8_8_;
        auVar184._0_8_ = local_4c0[1]._0_8_;
        auVar184._16_8_ = local_4c0[1]._16_8_;
        auVar184._24_8_ = local_4c0[1]._24_8_;
        auVar304 = ZEXT3264(local_6e0);
        auVar315 = ZEXT3264(local_680);
      }
      else {
        local_3e0 = auVar242;
        auVar67._4_4_ = fVar267 * fVar263;
        auVar67._0_4_ = fVar262 * fVar198;
        auVar67._8_4_ = fVar285 * fVar269;
        auVar67._12_4_ = fVar317 * fVar286;
        auVar67._16_4_ = fVar196 * fVar318;
        auVar67._20_4_ = fVar322 * fVar307;
        auVar67._24_4_ = fVar170 * fVar144;
        auVar67._28_4_ = auVar222._12_4_;
        auVar339._0_4_ = fVar249 * fVar220;
        auVar339._4_4_ = fVar250 * fVar142;
        auVar339._8_4_ = fVar305 * fVar194;
        auVar339._12_4_ = fVar306 * fVar195;
        auVar339._16_4_ = fVar199 * fVar289;
        auVar339._20_4_ = fVar216 * fVar174;
        auVar339._24_4_ = fVar218 * fVar191;
        auVar339._28_4_ = 0;
        auVar27 = vsubps_avx(auVar339,auVar67);
        auVar68._4_4_ = fVar193 * fVar142;
        auVar68._0_4_ = fVar192 * fVar220;
        auVar68._8_4_ = fVar268 * fVar194;
        auVar68._12_4_ = fVar270 * fVar195;
        auVar68._16_4_ = fVar277 * fVar289;
        auVar68._20_4_ = fVar280 * fVar174;
        auVar68._24_4_ = fVar283 * fVar191;
        auVar68._28_4_ = auVar32._28_4_;
        auVar69._4_4_ = fVar267 * fVar266;
        auVar69._0_4_ = fVar262 * fVar253;
        auVar69._8_4_ = fVar285 * fVar282;
        auVar69._12_4_ = fVar317 * fVar316;
        auVar69._16_4_ = fVar196 * fVar321;
        auVar69._20_4_ = fVar322 * fVar197;
        auVar69._24_4_ = fVar170 * fVar169;
        auVar69._28_4_ = auVar150._28_4_;
        auVar28 = vsubps_avx(auVar69,auVar68);
        auVar70._4_4_ = fVar250 * fVar266;
        auVar70._0_4_ = fVar249 * fVar253;
        auVar70._8_4_ = fVar305 * fVar282;
        auVar70._12_4_ = fVar306 * fVar316;
        auVar70._16_4_ = fVar199 * fVar321;
        auVar70._20_4_ = fVar216 * fVar197;
        auVar70._24_4_ = fVar218 * fVar169;
        auVar70._28_4_ = auVar30._28_4_;
        auVar71._4_4_ = fVar193 * fVar263;
        auVar71._0_4_ = fVar192 * fVar198;
        auVar71._8_4_ = fVar268 * fVar269;
        auVar71._12_4_ = fVar270 * fVar286;
        auVar71._16_4_ = fVar277 * fVar318;
        auVar71._20_4_ = fVar280 * fVar307;
        auVar71._24_4_ = fVar283 * fVar144;
        auVar71._28_4_ = auVar31._28_4_;
        auVar29 = vsubps_avx(auVar71,auVar70);
        auVar295._0_4_ = auVar27._0_4_ * 0.0 + auVar29._0_4_ + auVar28._0_4_ * 0.0;
        auVar295._4_4_ = auVar27._4_4_ * 0.0 + auVar29._4_4_ + auVar28._4_4_ * 0.0;
        auVar295._8_4_ = auVar27._8_4_ * 0.0 + auVar29._8_4_ + auVar28._8_4_ * 0.0;
        auVar295._12_4_ = auVar27._12_4_ * 0.0 + auVar29._12_4_ + auVar28._12_4_ * 0.0;
        auVar295._16_4_ = auVar27._16_4_ * 0.0 + auVar29._16_4_ + auVar28._16_4_ * 0.0;
        auVar295._20_4_ = auVar27._20_4_ * 0.0 + auVar29._20_4_ + auVar28._20_4_ * 0.0;
        auVar295._24_4_ = auVar27._24_4_ * 0.0 + auVar29._24_4_ + auVar28._24_4_ * 0.0;
        auVar295._28_4_ = auVar31._28_4_ + auVar29._28_4_ + auVar30._28_4_;
        auVar26 = vrcpps_avx(auVar295);
        fVar253 = auVar26._0_4_;
        fVar262 = auVar26._4_4_;
        auVar72._4_4_ = auVar295._4_4_ * fVar262;
        auVar72._0_4_ = auVar295._0_4_ * fVar253;
        fVar263 = auVar26._8_4_;
        auVar72._8_4_ = auVar295._8_4_ * fVar263;
        fVar266 = auVar26._12_4_;
        auVar72._12_4_ = auVar295._12_4_ * fVar266;
        fVar267 = auVar26._16_4_;
        auVar72._16_4_ = auVar295._16_4_ * fVar267;
        fVar269 = auVar26._20_4_;
        auVar72._20_4_ = auVar295._20_4_ * fVar269;
        fVar282 = auVar26._24_4_;
        auVar72._24_4_ = auVar295._24_4_ * fVar282;
        auVar72._28_4_ = auVar150._28_4_;
        auVar340._8_4_ = 0x3f800000;
        auVar340._0_8_ = 0x3f8000003f800000;
        auVar340._12_4_ = 0x3f800000;
        auVar340._16_4_ = 0x3f800000;
        auVar340._20_4_ = 0x3f800000;
        auVar340._24_4_ = 0x3f800000;
        auVar340._28_4_ = 0x3f800000;
        auVar26 = vsubps_avx(auVar340,auVar72);
        fVar253 = auVar26._0_4_ * fVar253 + fVar253;
        fVar262 = auVar26._4_4_ * fVar262 + fVar262;
        fVar263 = auVar26._8_4_ * fVar263 + fVar263;
        fVar266 = auVar26._12_4_ * fVar266 + fVar266;
        fVar267 = auVar26._16_4_ * fVar267 + fVar267;
        fVar269 = auVar26._20_4_ * fVar269 + fVar269;
        fVar282 = auVar26._24_4_ * fVar282 + fVar282;
        auVar73._4_4_ =
             (auVar27._4_4_ * fVar265 + auVar28._4_4_ * fVar264 + auVar29._4_4_ * fVar172) * fVar262
        ;
        auVar73._0_4_ =
             (auVar27._0_4_ * fVar224 + auVar28._0_4_ * fVar219 + auVar29._0_4_ * fVar171) * fVar253
        ;
        auVar73._8_4_ =
             (auVar27._8_4_ * fVar279 + auVar28._8_4_ * fVar276 + auVar29._8_4_ * fVar173) * fVar263
        ;
        auVar73._12_4_ =
             (auVar27._12_4_ * fVar309 + auVar28._12_4_ * fVar287 + auVar29._12_4_ * fVar175) *
             fVar266;
        auVar73._16_4_ =
             (auVar27._16_4_ * fVar320 + auVar28._16_4_ * fVar319 + auVar29._16_4_ * fVar252) *
             fVar267;
        auVar73._20_4_ =
             (auVar27._20_4_ * fVar251 + auVar28._20_4_ * fVar308 + auVar29._20_4_ * fVar288) *
             fVar269;
        auVar73._24_4_ =
             (auVar27._24_4_ * fVar168 + auVar28._24_4_ * fVar166 + auVar29._24_4_ * fVar248) *
             fVar282;
        auVar73._28_4_ = auVar242._28_4_ + auVar148._28_4_;
        auVar244 = ZEXT3264(auVar73);
        auVar156._16_16_ = auVar14;
        auVar156._0_16_ = auVar14;
        auVar148 = vcmpps_avx(auVar156,auVar73,2);
        fVar198 = (ray->super_RayK<1>).tfar;
        auVar183._4_4_ = fVar198;
        auVar183._0_4_ = fVar198;
        auVar183._8_4_ = fVar198;
        auVar183._12_4_ = fVar198;
        auVar183._16_4_ = fVar198;
        auVar183._20_4_ = fVar198;
        auVar183._24_4_ = fVar198;
        auVar183._28_4_ = fVar198;
        auVar26 = vcmpps_avx(auVar73,auVar183,2);
        auVar148 = vandps_avx(auVar26,auVar148);
        auVar205 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
        auVar257 = vpand_avx(auVar257,auVar205);
        auVar205 = vpmovsxwd_avx(auVar257);
        auVar222 = vpshufd_avx(auVar257,0xee);
        auVar222 = vpmovsxwd_avx(auVar222);
        auVar157._16_16_ = auVar222;
        auVar157._0_16_ = auVar205;
        if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar157 >> 0x7f,0) == '\0') &&
              (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar222 >> 0x3f,0) == '\0') &&
            (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar222[0xf]) goto LAB_00a403de;
        auVar148 = vcmpps_avx(ZEXT832(0) << 0x20,auVar295,4);
        auVar205 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
        auVar257 = vpand_avx(auVar257,auVar205);
        auVar205 = vpmovsxwd_avx(auVar257);
        auVar257 = vpunpckhwd_avx(auVar257,auVar257);
        auVar260._16_16_ = auVar257;
        auVar260._0_16_ = auVar205;
        auVar184._8_8_ = local_4c0[1]._8_8_;
        auVar184._0_8_ = local_4c0[1]._0_8_;
        auVar184._16_8_ = local_4c0[1]._16_8_;
        auVar184._24_8_ = local_4c0[1]._24_8_;
        auVar304 = ZEXT3264(local_6e0);
        auVar315 = ZEXT3264(local_680);
        if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar260 >> 0x7f,0) != '\0') ||
              (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar257 >> 0x3f,0) != '\0') ||
            (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar257[0xf] < '\0') {
          auVar158._0_4_ = fVar253 * auVar242._0_4_;
          auVar158._4_4_ = fVar262 * auVar242._4_4_;
          auVar158._8_4_ = fVar263 * auVar242._8_4_;
          auVar158._12_4_ = fVar266 * auVar242._12_4_;
          auVar158._16_4_ = fVar267 * auVar242._16_4_;
          auVar158._20_4_ = fVar269 * auVar242._20_4_;
          auVar158._24_4_ = fVar282 * auVar242._24_4_;
          auVar158._28_4_ = 0;
          auVar74._4_4_ = auVar213._4_4_ * fVar262;
          auVar74._0_4_ = auVar213._0_4_ * fVar253;
          auVar74._8_4_ = auVar213._8_4_ * fVar263;
          auVar74._12_4_ = auVar213._12_4_ * fVar266;
          auVar74._16_4_ = auVar213._16_4_ * fVar267;
          auVar74._20_4_ = auVar213._20_4_ * fVar269;
          auVar74._24_4_ = auVar213._24_4_ * fVar282;
          auVar74._28_4_ = SUB84(local_4c0[1]._24_8_,4);
          auVar274._8_4_ = 0x3f800000;
          auVar274._0_8_ = 0x3f8000003f800000;
          auVar274._12_4_ = 0x3f800000;
          auVar274._16_4_ = 0x3f800000;
          auVar274._20_4_ = 0x3f800000;
          auVar274._24_4_ = 0x3f800000;
          auVar274._28_4_ = 0x3f800000;
          auVar148 = vsubps_avx(auVar274,auVar158);
          auVar148 = vblendvps_avx(auVar148,auVar158,auVar33);
          auVar304 = ZEXT3264(auVar148);
          auVar148 = vsubps_avx(auVar274,auVar74);
          _local_340 = vblendvps_avx(auVar148,auVar74,auVar33);
          auVar315 = ZEXT3264(auVar73);
          auVar184 = auVar260;
        }
      }
      auVar371 = ZEXT3264(_local_6c0);
      auVar343 = ZEXT3264(auVar338);
      auVar332 = ZEXT3264(_local_6a0);
      auVar190 = ZEXT3264(auVar352);
      auVar297 = ZEXT3264(_local_580);
      if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar184 >> 0x7f,0) == '\0') &&
            (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar184 >> 0xbf,0) == '\0') &&
          (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar184[0x1f]) {
LAB_00a3f18c:
        _local_700 = auVar14;
        fVar234 = (float)local_520._0_4_;
        fVar245 = (float)local_520._4_4_;
        fVar246 = fStack_518;
        fVar247 = fStack_514;
        fVar215 = fStack_510;
        fVar217 = fStack_50c;
        fVar221 = fStack_508;
        fVar223 = fStack_504;
        auVar14 = _local_700;
      }
      else {
        auVar148 = vsubps_avx(local_460,_local_7a0);
        fVar143 = fVar143 + auVar304._0_4_ * auVar148._0_4_;
        fVar165 = fVar165 + auVar304._4_4_ * auVar148._4_4_;
        fVar167 = fVar167 + auVar304._8_4_ * auVar148._8_4_;
        fVar219 = fStack_794 + auVar304._12_4_ * auVar148._12_4_;
        fVar224 = fStack_790 + auVar304._16_4_ * auVar148._16_4_;
        fVar253 = fStack_78c + auVar304._20_4_ * auVar148._20_4_;
        fVar262 = fStack_788 + auVar304._24_4_ * auVar148._24_4_;
        fVar263 = auVar148._28_4_ + 0.0;
        fVar198 = pre->depth_scale;
        auVar75._4_4_ = (fVar165 + fVar165) * fVar198;
        auVar75._0_4_ = (fVar143 + fVar143) * fVar198;
        auVar75._8_4_ = (fVar167 + fVar167) * fVar198;
        auVar75._12_4_ = (fVar219 + fVar219) * fVar198;
        auVar75._16_4_ = (fVar224 + fVar224) * fVar198;
        auVar75._20_4_ = (fVar253 + fVar253) * fVar198;
        auVar75._24_4_ = (fVar262 + fVar262) * fVar198;
        auVar75._28_4_ = fVar263 + fVar263;
        local_220 = auVar315._0_32_;
        auVar148 = vcmpps_avx(local_220,auVar75,6);
        auVar26 = auVar184 & auVar148;
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0x7f,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0xbf,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar26[0x1f] < '\0') {
          auVar233 = ZEXT3264(CONCAT428(0xbf800000,
                                        CONCAT424(0xbf800000,
                                                  CONCAT420(0xbf800000,
                                                            CONCAT416(0xbf800000,
                                                                      CONCAT412(0xbf800000,
                                                                                CONCAT48(0xbf800000,
                                                                                                                                                                                  
                                                  0xbf800000bf800000)))))));
          local_340._0_4_ = (float)local_340._0_4_ + (float)local_340._0_4_ + -1.0;
          local_340._4_4_ = (float)local_340._4_4_ + (float)local_340._4_4_ + -1.0;
          uStack_338._0_4_ = (float)uStack_338 + (float)uStack_338 + -1.0;
          uStack_338._4_4_ = uStack_338._4_4_ + uStack_338._4_4_ + -1.0;
          uStack_330._0_4_ = (float)uStack_330 + (float)uStack_330 + -1.0;
          uStack_330._4_4_ = uStack_330._4_4_ + uStack_330._4_4_ + -1.0;
          uStack_328._0_4_ = (float)uStack_328 + (float)uStack_328 + -1.0;
          uStack_328._4_4_ = uStack_328._4_4_ + uStack_328._4_4_ + -1.0;
          local_260 = auVar304._0_32_;
          auVar132 = _local_340;
          auVar26 = _local_340;
          local_240 = (float)local_340._0_4_;
          fStack_23c = (float)local_340._4_4_;
          fStack_238 = (float)uStack_338;
          fStack_234 = uStack_338._4_4_;
          fStack_230 = (float)uStack_330;
          fStack_22c = uStack_330._4_4_;
          fStack_228 = (float)uStack_328;
          fStack_224 = uStack_328._4_4_;
          local_200 = 0;
          local_1fc = uVar22;
          _local_340 = auVar26;
          if ((pGVar138->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar148 = vandps_avx(auVar148,auVar184);
            local_4c0[0] = auVar148;
            auVar202._0_4_ = 1.0 / auVar256._0_4_;
            auVar202._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar257 = vshufps_avx(auVar202,auVar202,0);
            local_180[0] = auVar257._0_4_ * (auVar304._0_4_ + 0.0);
            local_180[1] = auVar257._4_4_ * (auVar304._4_4_ + 1.0);
            local_180[2] = auVar257._8_4_ * (auVar304._8_4_ + 2.0);
            local_180[3] = auVar257._12_4_ * (auVar304._12_4_ + 3.0);
            fStack_170 = auVar257._0_4_ * (auVar304._16_4_ + 4.0);
            fStack_16c = auVar257._4_4_ * (auVar304._20_4_ + 5.0);
            fStack_168 = auVar257._8_4_ * (auVar304._24_4_ + 6.0);
            fStack_164 = auVar304._28_4_ + 7.0;
            uStack_330 = auVar132._16_8_;
            uStack_328 = auVar26._24_8_;
            local_160 = local_340;
            uStack_158 = uStack_338;
            uStack_150 = uStack_330;
            uStack_148 = uStack_328;
            local_140 = local_220;
            auVar185._8_4_ = 0x7f800000;
            auVar185._0_8_ = 0x7f8000007f800000;
            auVar185._12_4_ = 0x7f800000;
            auVar185._16_4_ = 0x7f800000;
            auVar185._20_4_ = 0x7f800000;
            auVar185._24_4_ = 0x7f800000;
            auVar185._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar185,local_220,auVar148);
            auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
            auVar27 = vminps_avx(auVar26,auVar27);
            auVar28 = vshufpd_avx(auVar27,auVar27,5);
            auVar27 = vminps_avx(auVar27,auVar28);
            auVar28 = vperm2f128_avx(auVar27,auVar27,1);
            auVar27 = vminps_avx(auVar27,auVar28);
            auVar26 = vcmpps_avx(auVar26,auVar27,0);
            auVar27 = auVar148 & auVar26;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar148 = vandps_avx(auVar26,auVar148);
            }
            uVar134 = vmovmskps_avx(auVar148);
            uVar24 = 0;
            if (uVar134 != 0) {
              for (; (uVar134 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
              }
            }
            auVar139 = (undefined1  [8])(ulong)uVar24;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar138->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_680 = local_220;
              local_5a0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_6e0 = auVar304._0_32_;
              local_7b0 = lVar137;
              _local_2e0 = auVar15;
              do {
                local_604 = local_180[(long)auVar139];
                local_600 = *(undefined4 *)((long)&local_160 + (long)auVar139 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_140 + (long)auVar139 * 4);
                local_730.context = context->user;
                fVar215 = 1.0 - local_604;
                fVar198 = local_604 * fVar215 + local_604 * fVar215;
                auVar257 = ZEXT416((uint)(local_604 * local_604 * 3.0));
                auVar257 = vshufps_avx(auVar257,auVar257,0);
                auVar205 = ZEXT416((uint)((fVar198 - local_604 * local_604) * 3.0));
                auVar205 = vshufps_avx(auVar205,auVar205,0);
                auVar222 = ZEXT416((uint)((fVar215 * fVar215 - fVar198) * 3.0));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar236._0_4_ = auVar222._0_4_ * local_750;
                auVar236._4_4_ = auVar222._4_4_ * fStack_74c;
                auVar236._8_4_ = auVar222._8_4_ * fStack_748;
                auVar236._12_4_ = auVar222._12_4_ * fStack_744;
                auVar244 = ZEXT1664(auVar236);
                auVar222 = ZEXT416((uint)(fVar215 * fVar215 * -3.0));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar208._0_4_ =
                     auVar222._0_4_ * local_780 +
                     auVar236._0_4_ + auVar257._0_4_ * local_770 + auVar205._0_4_ * local_760;
                auVar208._4_4_ =
                     auVar222._4_4_ * fStack_77c +
                     auVar236._4_4_ + auVar257._4_4_ * fStack_76c + auVar205._4_4_ * fStack_75c;
                auVar208._8_4_ =
                     auVar222._8_4_ * fStack_778 +
                     auVar236._8_4_ + auVar257._8_4_ * fStack_768 + auVar205._8_4_ * fStack_758;
                auVar208._12_4_ =
                     auVar222._12_4_ * fStack_774 +
                     auVar236._12_4_ + auVar257._12_4_ * fStack_764 + auVar205._12_4_ * fStack_754;
                local_610 = vmovlps_avx(auVar208);
                local_608 = vextractps_avx(auVar208,2);
                local_5fc = (int)local_7a8;
                local_5f8 = (int)local_7b8;
                local_5f4 = (local_730.context)->instID[0];
                local_5f0 = (local_730.context)->instPrimID[0];
                local_7bc = -1;
                local_730.valid = &local_7bc;
                local_730.geometryUserPtr = pGVar138->userPtr;
                local_730.ray = (RTCRayN *)ray;
                local_730.hit = (RTCHitN *)&local_610;
                local_730.N = 1;
                local_7a0 = auVar139;
                if (pGVar138->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a40632:
                  p_Var23 = context->args->filter;
                  if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar138->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar244 = ZEXT1664(auVar244._0_16_);
                    (*p_Var23)(&local_730);
                    auVar190 = ZEXT3264(_local_560);
                    auVar343 = ZEXT3264(_local_5c0);
                    auVar332 = ZEXT3264(_local_6a0);
                    auVar297 = ZEXT3264(_local_580);
                    auVar371 = ZEXT3264(_local_6c0);
                    auVar304 = ZEXT3264(local_6e0);
                    lVar137 = local_7b0;
                    pre = local_738;
                    auVar139 = local_7a0;
                    if (*local_730.valid == 0) goto LAB_00a40734;
                  }
                  (((Vec3f *)((long)local_730.ray + 0x30))->field_0).components[0] =
                       *(float *)local_730.hit;
                  (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_730.hit + 4);
                  (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_730.hit + 8);
                  *(float *)((long)local_730.ray + 0x3c) = *(float *)(local_730.hit + 0xc);
                  *(float *)((long)local_730.ray + 0x40) = *(float *)(local_730.hit + 0x10);
                  *(float *)((long)local_730.ray + 0x44) = *(float *)(local_730.hit + 0x14);
                  *(float *)((long)local_730.ray + 0x48) = *(float *)(local_730.hit + 0x18);
                  *(float *)((long)local_730.ray + 0x4c) = *(float *)(local_730.hit + 0x1c);
                  *(float *)((long)local_730.ray + 0x50) = *(float *)(local_730.hit + 0x20);
                }
                else {
                  auVar244 = ZEXT1664(auVar236);
                  (*pGVar138->intersectionFilterN)(&local_730);
                  auVar190 = ZEXT3264(_local_560);
                  auVar343 = ZEXT3264(_local_5c0);
                  auVar332 = ZEXT3264(_local_6a0);
                  auVar297 = ZEXT3264(_local_580);
                  auVar371 = ZEXT3264(_local_6c0);
                  auVar304 = ZEXT3264(local_6e0);
                  lVar137 = local_7b0;
                  pre = local_738;
                  auVar139 = local_7a0;
                  if (*local_730.valid != 0) goto LAB_00a40632;
LAB_00a40734:
                  (ray->super_RayK<1>).tfar = (float)local_5a0._0_4_;
                  lVar137 = local_7b0;
                  pre = local_738;
                  auVar139 = local_7a0;
                }
                auVar352 = auVar190._0_32_;
                auVar338 = auVar343._0_32_;
                *(undefined4 *)(local_4c0[0] + (long)auVar139 * 4) = 0;
                auVar27 = local_4c0[0];
                local_5a0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                auVar233 = ZEXT3264(local_5a0);
                fVar198 = (ray->super_RayK<1>).tfar;
                auVar164._4_4_ = fVar198;
                auVar164._0_4_ = fVar198;
                auVar164._8_4_ = fVar198;
                auVar164._12_4_ = fVar198;
                auVar164._16_4_ = fVar198;
                auVar164._20_4_ = fVar198;
                auVar164._24_4_ = fVar198;
                auVar164._28_4_ = fVar198;
                auVar315 = ZEXT3264(local_680);
                auVar26 = vcmpps_avx(local_680,auVar164,2);
                auVar148 = vandps_avx(auVar26,local_4c0[0]);
                local_4c0[0] = auVar148;
                auVar27 = auVar27 & auVar26;
                prim = local_740;
                auVar14 = _local_700;
                if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar27 >> 0x7f,0) == '\0') &&
                      (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar27 >> 0xbf,0) == '\0') &&
                    (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar27[0x1f]) goto LAB_00a3f18c;
                auVar189._8_4_ = 0x7f800000;
                auVar189._0_8_ = 0x7f8000007f800000;
                auVar189._12_4_ = 0x7f800000;
                auVar189._16_4_ = 0x7f800000;
                auVar189._20_4_ = 0x7f800000;
                auVar189._24_4_ = 0x7f800000;
                auVar189._28_4_ = 0x7f800000;
                auVar26 = vblendvps_avx(auVar189,local_680,auVar148);
                auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
                auVar27 = vminps_avx(auVar26,auVar27);
                auVar28 = vshufpd_avx(auVar27,auVar27,5);
                auVar27 = vminps_avx(auVar27,auVar28);
                auVar28 = vperm2f128_avx(auVar27,auVar27,1);
                auVar27 = vminps_avx(auVar27,auVar28);
                auVar26 = vcmpps_avx(auVar26,auVar27,0);
                auVar27 = auVar148 & auVar26;
                if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0x7f,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0xbf,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar27[0x1f] < '\0') {
                  auVar148 = vandps_avx(auVar26,auVar148);
                }
                uVar135 = vmovmskps_avx(auVar148);
                uVar133 = 0;
                if (uVar135 != 0) {
                  for (; (uVar135 >> uVar133 & 1) == 0; uVar133 = uVar133 + 1) {
                  }
                }
                auVar139 = (undefined1  [8])(ulong)uVar133;
              } while( true );
            }
            fVar198 = local_180[(long)auVar139];
            fVar215 = *(float *)((long)&local_160 + (long)auVar139 * 4);
            fVar219 = 1.0 - fVar198;
            fVar217 = fVar198 * fVar219 + fVar198 * fVar219;
            auVar257 = ZEXT416((uint)(fVar198 * fVar198 * 3.0));
            auVar257 = vshufps_avx(auVar257,auVar257,0);
            auVar205 = ZEXT416((uint)((fVar217 - fVar198 * fVar198) * 3.0));
            auVar205 = vshufps_avx(auVar205,auVar205,0);
            auVar222 = ZEXT416((uint)((fVar219 * fVar219 - fVar217) * 3.0));
            auVar222 = vshufps_avx(auVar222,auVar222,0);
            fVar217 = auVar222._0_4_ * local_750;
            fVar221 = auVar222._4_4_ * fStack_74c;
            fVar223 = auVar222._8_4_ * fStack_748;
            fVar224 = auVar222._12_4_ * fStack_744;
            auVar244 = ZEXT1664(CONCAT412(fVar224,CONCAT48(fVar223,CONCAT44(fVar221,fVar217))));
            auVar222 = ZEXT416((uint)(fVar219 * fVar219 * -3.0));
            auVar222 = vshufps_avx(auVar222,auVar222,0);
            auVar203._0_4_ =
                 auVar222._0_4_ * local_780 +
                 fVar217 + auVar257._0_4_ * local_770 + auVar205._0_4_ * local_760;
            auVar203._4_4_ =
                 auVar222._4_4_ * fStack_77c +
                 fVar221 + auVar257._4_4_ * fStack_76c + auVar205._4_4_ * fStack_75c;
            auVar203._8_4_ =
                 auVar222._8_4_ * fStack_778 +
                 fVar223 + auVar257._8_4_ * fStack_768 + auVar205._8_4_ * fStack_758;
            auVar203._12_4_ =
                 auVar222._12_4_ * fStack_774 +
                 fVar224 + auVar257._12_4_ * fStack_764 + auVar205._12_4_ * fStack_754;
            auVar233 = ZEXT464((uint)*(float *)(local_140 + (long)auVar139 * 4));
            (ray->super_RayK<1>).tfar = *(float *)(local_140 + (long)auVar139 * 4);
            uVar12 = vmovlps_avx(auVar203);
            *(undefined8 *)&(ray->Ng).field_0 = uVar12;
            fVar217 = (float)vextractps_avx(auVar203,2);
            (ray->Ng).field_0.field_0.z = fVar217;
            ray->u = fVar198;
            ray->v = fVar215;
            ray->primID = uVar135;
            ray->geomID = uVar133;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            prim = local_740;
          }
          goto LAB_00a3f18c;
        }
      }
      _local_700 = auVar14;
      local_7b0 = lVar137;
      fVar199 = (float)local_640._0_4_;
      fVar216 = (float)local_640._4_4_;
      fVar218 = fStack_638;
      fVar220 = fStack_634;
      fVar198 = fStack_630;
      fVar219 = fStack_62c;
      fVar224 = fStack_628;
    }
    auVar190 = ZEXT3264(local_480);
    if (8 < (int)uVar22) {
      _local_2e0 = vpshufd_avx(ZEXT416(uVar22),0);
      auVar257 = vshufps_avx(local_660._0_16_,local_660._0_16_,0);
      register0x00001210 = auVar257;
      _local_300 = auVar257;
      local_320._16_8_ = local_700;
      local_320._0_16_ = _local_700;
      local_320._24_8_ = uStack_6f8;
      auVar147._0_4_ = 1.0 / (float)local_3c0._0_4_;
      auVar147._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar257 = vshufps_avx(auVar147,auVar147,0);
      _fStack_3b0 = auVar257;
      _local_3c0 = auVar257;
      lVar137 = 8;
      local_6e0 = auVar304._0_32_;
      local_680 = auVar315._0_32_;
      _local_6a0 = auVar332._0_32_;
      _local_5c0 = auVar338;
      _local_560 = auVar352;
LAB_00a3f4dc:
      local_480 = auVar190._0_32_;
      if (lVar137 < local_7b0) {
        pauVar6 = (undefined1 (*) [28])(bezier_basis0 + lVar137 * 4 + lVar141);
        fVar253 = *(float *)*pauVar6;
        fVar262 = *(float *)(*pauVar6 + 4);
        fVar263 = *(float *)(*pauVar6 + 8);
        fVar264 = *(float *)(*pauVar6 + 0xc);
        fVar265 = *(float *)(*pauVar6 + 0x10);
        fVar266 = *(float *)(*pauVar6 + 0x14);
        fVar267 = *(float *)(*pauVar6 + 0x18);
        auVar129 = *pauVar6;
        pauVar6 = (undefined1 (*) [28])(lVar141 + 0x21fb768 + lVar137 * 4);
        fVar269 = *(float *)*pauVar6;
        fVar276 = *(float *)(*pauVar6 + 4);
        fVar279 = *(float *)(*pauVar6 + 8);
        fVar282 = *(float *)(*pauVar6 + 0xc);
        fVar285 = *(float *)(*pauVar6 + 0x10);
        fVar286 = *(float *)(*pauVar6 + 0x14);
        fVar287 = *(float *)(*pauVar6 + 0x18);
        auVar128 = *pauVar6;
        pauVar6 = (undefined1 (*) [28])(lVar141 + 0x21fbbec + lVar137 * 4);
        fVar309 = *(float *)*pauVar6;
        fVar316 = *(float *)(*pauVar6 + 4);
        fVar317 = *(float *)(*pauVar6 + 8);
        fVar318 = *(float *)(*pauVar6 + 0xc);
        fVar319 = *(float *)(*pauVar6 + 0x10);
        fVar320 = *(float *)(*pauVar6 + 0x14);
        fVar321 = *(float *)(*pauVar6 + 0x18);
        auVar127 = *pauVar6;
        pfVar7 = (float *)(lVar141 + 0x21fc070 + lVar137 * 4);
        fVar196 = *pfVar7;
        fVar307 = pfVar7[1];
        fVar308 = pfVar7[2];
        fVar251 = pfVar7[3];
        fVar197 = pfVar7[4];
        fVar322 = pfVar7[5];
        fVar144 = pfVar7[6];
        fVar166 = auVar233._28_4_;
        fVar248 = auVar371._0_4_;
        fVar249 = auVar371._4_4_;
        fVar250 = auVar371._8_4_;
        fVar305 = auVar371._12_4_;
        fVar306 = auVar371._16_4_;
        fVar142 = auVar371._20_4_;
        fVar143 = auVar371._24_4_;
        fStack_6e4 = fVar166 + fVar166 + fStack_384;
        fVar252 = fVar166 + fVar166 + pfVar7[7];
        local_660._0_4_ =
             (float)local_e0._0_4_ * fVar253 +
             fVar269 * auVar297._0_4_ + fVar234 * fVar309 + (float)local_3a0._0_4_ * fVar196;
        local_660._4_4_ =
             (float)local_e0._4_4_ * fVar262 +
             fVar276 * auVar297._4_4_ + fVar245 * fVar316 + (float)local_3a0._4_4_ * fVar307;
        local_660._8_4_ =
             fStack_d8 * fVar263 +
             fVar279 * auVar297._8_4_ + fVar246 * fVar317 + fStack_398 * fVar308;
        local_660._12_4_ =
             fStack_d4 * fVar264 +
             fVar282 * auVar297._12_4_ + fVar247 * fVar318 + fStack_394 * fVar251;
        local_660._16_4_ =
             fStack_d0 * fVar265 +
             fVar285 * auVar297._16_4_ + fVar215 * fVar319 + fStack_390 * fVar197;
        local_660._20_4_ =
             fStack_cc * fVar266 +
             fVar286 * auVar297._20_4_ + fVar217 * fVar320 + fStack_38c * fVar322;
        local_660._24_4_ =
             fStack_c8 * fVar267 +
             fVar287 * auVar297._24_4_ + fVar221 * fVar321 + fStack_388 * fVar144;
        local_660._28_4_ = fVar166 + pfVar7[7] + fStack_6e4;
        auVar214._0_4_ =
             fVar253 * (float)local_5c0._0_4_ +
             auVar332._0_4_ * fVar269 + fVar248 * fVar309 + fVar199 * fVar196;
        auVar214._4_4_ =
             fVar262 * (float)local_5c0._4_4_ +
             auVar332._4_4_ * fVar276 + fVar249 * fVar316 + fVar216 * fVar307;
        auVar214._8_4_ =
             fVar263 * fStack_5b8 + auVar332._8_4_ * fVar279 + fVar250 * fVar317 + fVar218 * fVar308
        ;
        auVar214._12_4_ =
             fVar264 * fStack_5b4 +
             auVar332._12_4_ * fVar282 + fVar305 * fVar318 + fVar220 * fVar251;
        auVar214._16_4_ =
             fVar265 * fStack_5b0 +
             auVar332._16_4_ * fVar285 + fVar306 * fVar319 + fVar198 * fVar197;
        auVar214._20_4_ =
             fVar266 * fStack_5ac +
             auVar332._20_4_ * fVar286 + fVar142 * fVar320 + fVar219 * fVar322;
        auVar214._24_4_ =
             fVar267 * fStack_5a8 +
             auVar332._24_4_ * fVar287 + fVar143 * fVar321 + fVar224 * fVar144;
        auVar214._28_4_ = fStack_6e4 + fVar166 + fVar166 + auVar244._28_4_;
        local_700._0_4_ =
             fVar253 * (float)local_120._0_4_ +
             (float)local_c0._0_4_ * fVar269 + fVar309 * local_100 + (float)local_a0._0_4_ * fVar196
        ;
        local_700._4_4_ =
             fVar262 * (float)local_120._4_4_ +
             (float)local_c0._4_4_ * fVar276 + fVar316 * fStack_fc + (float)local_a0._4_4_ * fVar307
        ;
        uStack_6f8._0_4_ =
             fVar263 * fStack_118 + fStack_b8 * fVar279 + fVar317 * fStack_f8 + fStack_98 * fVar308;
        uStack_6f8._4_4_ =
             fVar264 * fStack_114 + fStack_b4 * fVar282 + fVar318 * fStack_f4 + fStack_94 * fVar251;
        fStack_6f0 = fVar265 * fStack_110 +
                     fStack_b0 * fVar285 + fVar319 * fStack_f0 + fStack_90 * fVar197;
        fStack_6ec = fVar266 * fStack_10c +
                     fStack_ac * fVar286 + fVar320 * fStack_ec + fStack_8c * fVar322;
        fStack_6e8 = fVar267 * fStack_108 +
                     fStack_a8 * fVar287 + fVar321 * fStack_e8 + fStack_88 * fVar144;
        fStack_6e4 = fStack_6e4 + fVar252;
        pfVar7 = (float *)(bezier_basis1 + lVar137 * 4 + lVar141);
        fVar265 = *pfVar7;
        fVar266 = pfVar7[1];
        fVar267 = pfVar7[2];
        fVar269 = pfVar7[3];
        fVar276 = pfVar7[4];
        fVar279 = pfVar7[5];
        fVar282 = pfVar7[6];
        pauVar6 = (undefined1 (*) [28])(lVar141 + 0x21fdb88 + lVar137 * 4);
        fVar253 = *(float *)*pauVar6;
        fVar262 = *(float *)(*pauVar6 + 4);
        fVar263 = *(float *)(*pauVar6 + 8);
        fVar264 = *(float *)(*pauVar6 + 0xc);
        fVar285 = *(float *)(*pauVar6 + 0x10);
        fVar286 = *(float *)(*pauVar6 + 0x14);
        fVar287 = *(float *)(*pauVar6 + 0x18);
        auVar131 = *pauVar6;
        pauVar6 = (undefined1 (*) [28])(lVar141 + 0x21fe00c + lVar137 * 4);
        fVar309 = *(float *)*pauVar6;
        fVar316 = *(float *)(*pauVar6 + 4);
        fVar317 = *(float *)(*pauVar6 + 8);
        fVar318 = *(float *)(*pauVar6 + 0xc);
        fVar319 = *(float *)(*pauVar6 + 0x10);
        fVar320 = *(float *)(*pauVar6 + 0x14);
        fVar321 = *(float *)(*pauVar6 + 0x18);
        auVar130 = *pauVar6;
        pfVar8 = (float *)(lVar141 + 0x21fe490 + lVar137 * 4);
        fVar166 = *pfVar8;
        fVar168 = pfVar8[1];
        fVar169 = pfVar8[2];
        fVar170 = pfVar8[3];
        fVar171 = pfVar8[4];
        fVar172 = pfVar8[5];
        fVar173 = pfVar8[6];
        fVar175 = pfVar8[7];
        fVar288 = fVar175 + pfVar7[7];
        fVar252 = fVar175 + fVar175 + fVar252;
        local_5a0._0_4_ =
             (float)local_e0._0_4_ * fVar265 +
             fVar253 * auVar297._0_4_ + fVar234 * fVar309 + (float)local_3a0._0_4_ * fVar166;
        local_5a0._4_4_ =
             (float)local_e0._4_4_ * fVar266 +
             fVar262 * auVar297._4_4_ + fVar245 * fVar316 + (float)local_3a0._4_4_ * fVar168;
        local_5a0._8_4_ =
             fStack_d8 * fVar267 +
             fVar263 * auVar297._8_4_ + fVar246 * fVar317 + fStack_398 * fVar169;
        local_5a0._12_4_ =
             fStack_d4 * fVar269 +
             fVar264 * auVar297._12_4_ + fVar247 * fVar318 + fStack_394 * fVar170;
        local_5a0._16_4_ =
             fStack_d0 * fVar276 +
             fVar285 * auVar297._16_4_ + fVar215 * fVar319 + fStack_390 * fVar171;
        local_5a0._20_4_ =
             fStack_cc * fVar279 +
             fVar286 * auVar297._20_4_ + fVar217 * fVar320 + fStack_38c * fVar172;
        local_5a0._24_4_ =
             fStack_c8 * fVar282 +
             fVar287 * auVar297._24_4_ + fVar221 * fVar321 + fStack_388 * fVar173;
        local_5a0._28_4_ = fVar288 + fVar252;
        local_460._0_4_ =
             (float)local_5c0._0_4_ * fVar265 +
             auVar332._0_4_ * fVar253 + fVar248 * fVar309 + fVar199 * fVar166;
        local_460._4_4_ =
             (float)local_5c0._4_4_ * fVar266 +
             auVar332._4_4_ * fVar262 + fVar249 * fVar316 + fVar216 * fVar168;
        local_460._8_4_ =
             fStack_5b8 * fVar267 + auVar332._8_4_ * fVar263 + fVar250 * fVar317 + fVar218 * fVar169
        ;
        local_460._12_4_ =
             fStack_5b4 * fVar269 +
             auVar332._12_4_ * fVar264 + fVar305 * fVar318 + fVar220 * fVar170;
        local_460._16_4_ =
             fStack_5b0 * fVar276 +
             auVar332._16_4_ * fVar285 + fVar306 * fVar319 + fVar198 * fVar171;
        local_460._20_4_ =
             fStack_5ac * fVar279 +
             auVar332._20_4_ * fVar286 + fVar142 * fVar320 + fVar219 * fVar172;
        local_460._24_4_ =
             fStack_5a8 * fVar282 +
             auVar332._24_4_ * fVar287 + fVar143 * fVar321 + fVar224 * fVar173;
        local_460._28_4_ = fVar252 + fVar175 + fVar175 + fStack_384;
        auVar296._0_4_ =
             (float)local_c0._0_4_ * fVar253 + fVar309 * local_100 + (float)local_a0._0_4_ * fVar166
             + fVar265 * (float)local_120._0_4_;
        auVar296._4_4_ =
             (float)local_c0._4_4_ * fVar262 + fVar316 * fStack_fc + (float)local_a0._4_4_ * fVar168
             + fVar266 * (float)local_120._4_4_;
        auVar296._8_4_ =
             fStack_b8 * fVar263 + fVar317 * fStack_f8 + fStack_98 * fVar169 + fVar267 * fStack_118;
        auVar296._12_4_ =
             fStack_b4 * fVar264 + fVar318 * fStack_f4 + fStack_94 * fVar170 + fVar269 * fStack_114;
        auVar296._16_4_ =
             fStack_b0 * fVar285 + fVar319 * fStack_f0 + fStack_90 * fVar171 + fVar276 * fStack_110;
        auVar296._20_4_ =
             fStack_ac * fVar286 + fVar320 * fStack_ec + fStack_8c * fVar172 + fVar279 * fStack_10c;
        auVar296._24_4_ =
             fStack_a8 * fVar287 + fVar321 * fStack_e8 + fStack_88 * fVar173 + fVar282 * fStack_108;
        auVar296._28_4_ = fVar175 + fVar288 + fVar252;
        auVar371 = ZEXT3264(auVar371._0_32_);
        auVar26 = vsubps_avx(local_5a0,local_660);
        auVar27 = vsubps_avx(local_460,auVar214);
        fVar285 = auVar26._0_4_;
        fVar286 = auVar26._4_4_;
        auVar76._4_4_ = fVar286 * auVar214._4_4_;
        auVar76._0_4_ = fVar285 * auVar214._0_4_;
        fVar287 = auVar26._8_4_;
        auVar76._8_4_ = fVar287 * auVar214._8_4_;
        fVar309 = auVar26._12_4_;
        auVar76._12_4_ = fVar309 * auVar214._12_4_;
        fVar316 = auVar26._16_4_;
        auVar76._16_4_ = fVar316 * auVar214._16_4_;
        fVar317 = auVar26._20_4_;
        auVar76._20_4_ = fVar317 * auVar214._20_4_;
        fVar318 = auVar26._24_4_;
        auVar76._24_4_ = fVar318 * auVar214._24_4_;
        auVar76._28_4_ = fVar252;
        fVar198 = auVar27._0_4_;
        fVar219 = auVar27._4_4_;
        auVar77._4_4_ = local_660._4_4_ * fVar219;
        auVar77._0_4_ = local_660._0_4_ * fVar198;
        fVar224 = auVar27._8_4_;
        auVar77._8_4_ = local_660._8_4_ * fVar224;
        fVar253 = auVar27._12_4_;
        auVar77._12_4_ = local_660._12_4_ * fVar253;
        fVar262 = auVar27._16_4_;
        auVar77._16_4_ = local_660._16_4_ * fVar262;
        fVar263 = auVar27._20_4_;
        auVar77._20_4_ = local_660._20_4_ * fVar263;
        fVar264 = auVar27._24_4_;
        auVar77._24_4_ = local_660._24_4_ * fVar264;
        auVar77._28_4_ = local_460._28_4_;
        auVar28 = vsubps_avx(auVar76,auVar77);
        auVar148 = vmaxps_avx(_local_700,auVar296);
        auVar78._4_4_ = auVar148._4_4_ * auVar148._4_4_ * (fVar286 * fVar286 + fVar219 * fVar219);
        auVar78._0_4_ = auVar148._0_4_ * auVar148._0_4_ * (fVar285 * fVar285 + fVar198 * fVar198);
        auVar78._8_4_ = auVar148._8_4_ * auVar148._8_4_ * (fVar287 * fVar287 + fVar224 * fVar224);
        auVar78._12_4_ = auVar148._12_4_ * auVar148._12_4_ * (fVar309 * fVar309 + fVar253 * fVar253)
        ;
        auVar78._16_4_ = auVar148._16_4_ * auVar148._16_4_ * (fVar316 * fVar316 + fVar262 * fVar262)
        ;
        auVar78._20_4_ = auVar148._20_4_ * auVar148._20_4_ * (fVar317 * fVar317 + fVar263 * fVar263)
        ;
        auVar78._24_4_ = auVar148._24_4_ * auVar148._24_4_ * (fVar318 * fVar318 + fVar264 * fVar264)
        ;
        auVar78._28_4_ = local_5a0._28_4_ + local_460._28_4_;
        auVar79._4_4_ = auVar28._4_4_ * auVar28._4_4_;
        auVar79._0_4_ = auVar28._0_4_ * auVar28._0_4_;
        auVar79._8_4_ = auVar28._8_4_ * auVar28._8_4_;
        auVar79._12_4_ = auVar28._12_4_ * auVar28._12_4_;
        auVar79._16_4_ = auVar28._16_4_ * auVar28._16_4_;
        auVar79._20_4_ = auVar28._20_4_ * auVar28._20_4_;
        auVar79._24_4_ = auVar28._24_4_ * auVar28._24_4_;
        auVar79._28_4_ = auVar28._28_4_;
        auVar244 = ZEXT3264(auVar79);
        local_3e0 = vcmpps_avx(auVar79,auVar78,2);
        local_200 = (uint)lVar137;
        auVar205 = vpshufd_avx(ZEXT416(local_200),0);
        auVar257 = vpor_avx(auVar205,_DAT_01f4ad30);
        auVar205 = vpor_avx(auVar205,_DAT_01f7afa0);
        auVar257 = vpcmpgtd_avx(_local_2e0,auVar257);
        auVar205 = vpcmpgtd_avx(_local_2e0,auVar205);
        auVar231._16_16_ = auVar205;
        auVar231._0_16_ = auVar257;
        auVar233 = ZEXT3264(auVar231);
        auVar148 = auVar231 & local_3e0;
        fVar199 = (float)local_640._0_4_;
        fVar216 = (float)local_640._4_4_;
        fVar218 = fStack_638;
        fVar220 = fStack_634;
        fVar198 = fStack_630;
        fVar219 = fStack_62c;
        fVar224 = fStack_628;
        if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar148 >> 0x7f,0) != '\0') ||
              (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar148 >> 0xbf,0) != '\0') ||
            (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar148[0x1f] < '\0') {
          local_5e0._0_4_ = auVar131._0_4_;
          local_5e0._4_4_ = auVar131._4_4_;
          fStack_5d8 = auVar131._8_4_;
          fStack_5d4 = auVar131._12_4_;
          fStack_5d0 = auVar131._16_4_;
          fStack_5cc = auVar131._20_4_;
          fStack_5c8 = auVar131._24_4_;
          fVar309 = (float)local_2c0._0_4_ * (float)local_5e0._0_4_;
          fVar316 = (float)local_2c0._4_4_ * (float)local_5e0._4_4_;
          fVar317 = fStack_2b8 * fStack_5d8;
          fVar318 = fStack_2b4 * fStack_5d4;
          fVar319 = fStack_2b0 * fStack_5d0;
          fVar320 = fStack_2ac * fStack_5cc;
          fVar321 = fStack_2a8 * fStack_5c8;
          _local_5e0 = auVar296;
          local_420._0_4_ = auVar130._0_4_;
          local_420._4_4_ = auVar130._4_4_;
          fStack_418 = auVar130._8_4_;
          fStack_414 = auVar130._12_4_;
          fStack_410 = auVar130._16_4_;
          fStack_40c = auVar130._20_4_;
          fStack_408 = auVar130._24_4_;
          fVar253 = (float)local_280._0_4_ * (float)local_420._0_4_;
          fVar262 = (float)local_280._4_4_ * (float)local_420._4_4_;
          fVar263 = fStack_278 * fStack_418;
          fVar264 = fStack_274 * fStack_414;
          fVar285 = fStack_270 * fStack_410;
          fVar286 = fStack_26c * fStack_40c;
          fVar287 = fStack_268 * fStack_408;
          _local_420 = auVar231;
          local_440 = fVar265 * (float)local_560._0_4_ +
                      fVar309 + fVar253 + (float)local_2a0._0_4_ * fVar166;
          fStack_43c = fVar266 * (float)local_560._4_4_ +
                       fVar316 + fVar262 + (float)local_2a0._4_4_ * fVar168;
          fStack_438 = fVar267 * fStack_558 + fVar317 + fVar263 + fStack_298 * fVar169;
          fStack_434 = fVar269 * fStack_554 + fVar318 + fVar264 + fStack_294 * fVar170;
          fStack_430 = fVar276 * fStack_550 + fVar319 + fVar285 + fStack_290 * fVar171;
          fStack_42c = fVar279 * fStack_54c + fVar320 + fVar286 + fStack_28c * fVar172;
          fStack_428 = fVar282 * fStack_548 + fVar321 + fVar287 + fStack_288 * fVar173;
          fStack_424 = pfVar7[7] + fStack_544 + local_3e0._28_4_ + 0.0;
          local_4e0._0_4_ = auVar128._0_4_;
          local_4e0._4_4_ = auVar128._4_4_;
          fStack_4d8 = auVar128._8_4_;
          fStack_4d4 = auVar128._12_4_;
          fStack_4d0 = auVar128._16_4_;
          fStack_4cc = auVar128._20_4_;
          fStack_4c8 = auVar128._24_4_;
          local_400._0_4_ = auVar127._0_4_;
          local_400._4_4_ = auVar127._4_4_;
          fStack_3f8 = auVar127._8_4_;
          fStack_3f4 = auVar127._12_4_;
          fStack_3f0 = auVar127._16_4_;
          fStack_3ec = auVar127._20_4_;
          fStack_3e8 = auVar127._24_4_;
          fVar175 = (float)local_280._0_4_ * (float)local_400._0_4_;
          fVar252 = (float)local_280._4_4_ * (float)local_400._4_4_;
          fVar288 = fStack_278 * fStack_3f8;
          fVar194 = fStack_274 * fStack_3f4;
          fVar165 = fStack_270 * fStack_3f0;
          fVar195 = fStack_26c * fStack_3ec;
          fVar167 = fStack_268 * fStack_3e8;
          pfVar7 = (float *)(lVar141 + 0x21fcdfc + lVar137 * 4);
          fVar253 = *pfVar7;
          fVar262 = pfVar7[1];
          fVar263 = pfVar7[2];
          fVar264 = pfVar7[3];
          fVar265 = pfVar7[4];
          fVar266 = pfVar7[5];
          fVar267 = pfVar7[6];
          pfVar8 = (float *)(lVar141 + 0x21fd280 + lVar137 * 4);
          fVar269 = *pfVar8;
          fVar276 = pfVar8[1];
          fVar279 = pfVar8[2];
          fVar282 = pfVar8[3];
          fVar285 = pfVar8[4];
          fVar286 = pfVar8[5];
          fVar287 = pfVar8[6];
          pfVar9 = (float *)(lVar141 + 0x21fc978 + lVar137 * 4);
          fVar309 = *pfVar9;
          fVar316 = pfVar9[1];
          fVar317 = pfVar9[2];
          fVar318 = pfVar9[3];
          fVar319 = pfVar9[4];
          fVar320 = pfVar9[5];
          fVar321 = pfVar9[6];
          fVar173 = pfVar7[7] + pfVar8[7];
          fStack_4e4 = pfVar8[7] + fVar223 + 0.0;
          fVar289 = fVar223 + local_660._28_4_ + fVar223 + 0.0;
          pfVar7 = (float *)(lVar141 + 0x21fc4f4 + lVar137 * 4);
          fVar223 = *pfVar7;
          fVar166 = pfVar7[1];
          fVar168 = pfVar7[2];
          fVar169 = pfVar7[3];
          fVar170 = pfVar7[4];
          fVar171 = pfVar7[5];
          fVar172 = pfVar7[6];
          local_400._4_4_ =
               (float)local_e0._4_4_ * fVar166 +
               fVar316 * (float)local_580._4_4_ +
               fVar245 * fVar262 + (float)local_3a0._4_4_ * fVar276;
          local_400._0_4_ =
               (float)local_e0._0_4_ * fVar223 +
               fVar309 * (float)local_580._0_4_ +
               fVar234 * fVar253 + (float)local_3a0._0_4_ * fVar269;
          fStack_3f8 = fStack_d8 * fVar168 +
                       fVar317 * fStack_578 + fVar246 * fVar263 + fStack_398 * fVar279;
          fStack_3f4 = fStack_d4 * fVar169 +
                       fVar318 * fStack_574 + fVar247 * fVar264 + fStack_394 * fVar282;
          fStack_3f0 = fStack_d0 * fVar170 +
                       fVar319 * fStack_570 + fVar215 * fVar265 + fStack_390 * fVar285;
          fStack_3ec = fStack_cc * fVar171 +
                       fVar320 * fStack_56c + fVar217 * fVar266 + fStack_38c * fVar286;
          fStack_3e8 = fStack_c8 * fVar172 +
                       fVar321 * fStack_568 + fVar221 * fVar267 + fStack_388 * fVar287;
          fStack_3e4 = fVar173 + fStack_4e4;
          local_500 = (float)local_5c0._0_4_ * fVar223 +
                      fVar248 * fVar253 + (float)local_640._0_4_ * fVar269 +
                      fVar309 * (float)local_6a0._0_4_;
          fStack_4fc = (float)local_5c0._4_4_ * fVar166 +
                       fVar249 * fVar262 + (float)local_640._4_4_ * fVar276 +
                       fVar316 * (float)local_6a0._4_4_;
          fStack_4f8 = fStack_5b8 * fVar168 +
                       fVar250 * fVar263 + fStack_638 * fVar279 + fVar317 * fStack_698;
          fStack_4f4 = fStack_5b4 * fVar169 +
                       fVar305 * fVar264 + fStack_634 * fVar282 + fVar318 * fStack_694;
          fStack_4f0 = fStack_5b0 * fVar170 +
                       fVar306 * fVar265 + fStack_630 * fVar285 + fVar319 * fStack_690;
          fStack_4ec = fStack_5ac * fVar171 +
                       fVar142 * fVar266 + fStack_62c * fVar286 + fVar320 * fStack_68c;
          fStack_4e8 = fStack_5a8 * fVar172 +
                       fVar143 * fVar267 + fStack_628 * fVar287 + fVar321 * fStack_688;
          fStack_4e4 = fStack_4e4 + fVar289;
          auVar353._0_4_ =
               fVar309 * (float)local_2c0._0_4_ +
               (float)local_280._0_4_ * fVar253 + (float)local_2a0._0_4_ * fVar269 +
               fVar223 * (float)local_560._0_4_;
          auVar353._4_4_ =
               fVar316 * (float)local_2c0._4_4_ +
               (float)local_280._4_4_ * fVar262 + (float)local_2a0._4_4_ * fVar276 +
               fVar166 * (float)local_560._4_4_;
          auVar353._8_4_ =
               fVar317 * fStack_2b8 + fStack_278 * fVar263 + fStack_298 * fVar279 +
               fVar168 * fStack_558;
          auVar353._12_4_ =
               fVar318 * fStack_2b4 + fStack_274 * fVar264 + fStack_294 * fVar282 +
               fVar169 * fStack_554;
          auVar353._16_4_ =
               fVar319 * fStack_2b0 + fStack_270 * fVar265 + fStack_290 * fVar285 +
               fVar170 * fStack_550;
          auVar353._20_4_ =
               fVar320 * fStack_2ac + fStack_26c * fVar266 + fStack_28c * fVar286 +
               fVar171 * fStack_54c;
          auVar353._24_4_ =
               fVar321 * fStack_2a8 + fStack_268 * fVar267 + fStack_288 * fVar287 +
               fVar172 * fStack_548;
          auVar353._28_4_ = pfVar9[7] + fVar173 + fVar289;
          pfVar7 = (float *)(lVar141 + 0x21ff21c + lVar137 * 4);
          fVar215 = *pfVar7;
          fVar217 = pfVar7[1];
          fVar221 = pfVar7[2];
          fVar223 = pfVar7[3];
          fVar253 = pfVar7[4];
          fVar262 = pfVar7[5];
          fVar263 = pfVar7[6];
          pfVar8 = (float *)(lVar141 + 0x21ff6a0 + lVar137 * 4);
          fVar264 = *pfVar8;
          fVar265 = pfVar8[1];
          fVar266 = pfVar8[2];
          fVar267 = pfVar8[3];
          fVar269 = pfVar8[4];
          fVar276 = pfVar8[5];
          fVar279 = pfVar8[6];
          pfVar9 = (float *)(lVar141 + 0x21fed98 + lVar137 * 4);
          fVar282 = *pfVar9;
          fVar285 = pfVar9[1];
          fVar286 = pfVar9[2];
          fVar287 = pfVar9[3];
          fVar309 = pfVar9[4];
          fVar316 = pfVar9[5];
          fVar317 = pfVar9[6];
          pfVar10 = (float *)(lVar141 + 0x21fe914 + lVar137 * 4);
          fVar318 = *pfVar10;
          fVar319 = pfVar10[1];
          fVar320 = pfVar10[2];
          fVar321 = pfVar10[3];
          fVar166 = pfVar10[4];
          fVar168 = pfVar10[5];
          fVar169 = pfVar10[6];
          auVar313._0_4_ =
               (float)local_e0._0_4_ * fVar318 +
               fVar282 * (float)local_580._0_4_ +
               fVar215 * (float)local_520._0_4_ + (float)local_3a0._0_4_ * fVar264;
          auVar313._4_4_ =
               (float)local_e0._4_4_ * fVar319 +
               fVar285 * (float)local_580._4_4_ +
               fVar217 * (float)local_520._4_4_ + (float)local_3a0._4_4_ * fVar265;
          auVar313._8_4_ =
               fStack_d8 * fVar320 +
               fVar286 * fStack_578 + fVar221 * fStack_518 + fStack_398 * fVar266;
          auVar313._12_4_ =
               fStack_d4 * fVar321 +
               fVar287 * fStack_574 + fVar223 * fStack_514 + fStack_394 * fVar267;
          auVar313._16_4_ =
               fStack_d0 * fVar166 +
               fVar309 * fStack_570 + fVar253 * fStack_510 + fStack_390 * fVar269;
          auVar313._20_4_ =
               fStack_cc * fVar168 +
               fVar316 * fStack_56c + fVar262 * fStack_50c + fStack_38c * fVar276;
          auVar313._24_4_ =
               fStack_c8 * fVar169 +
               fVar317 * fStack_568 + fVar263 * fStack_508 + fStack_388 * fVar279;
          auVar313._28_4_ = fStack_624 + fStack_624 + fStack_384 + fStack_4e4;
          auVar341._0_4_ =
               fVar318 * (float)local_5c0._0_4_ +
               fVar282 * (float)local_6a0._0_4_ +
               fVar215 * (float)local_6c0._0_4_ + (float)local_640._0_4_ * fVar264;
          auVar341._4_4_ =
               fVar319 * (float)local_5c0._4_4_ +
               fVar285 * (float)local_6a0._4_4_ +
               fVar217 * (float)local_6c0._4_4_ + (float)local_640._4_4_ * fVar265;
          auVar341._8_4_ =
               fVar320 * fStack_5b8 +
               fVar286 * fStack_698 + fVar221 * fStack_6b8 + fStack_638 * fVar266;
          auVar341._12_4_ =
               fVar321 * fStack_5b4 +
               fVar287 * fStack_694 + fVar223 * fStack_6b4 + fStack_634 * fVar267;
          auVar341._16_4_ =
               fVar166 * fStack_5b0 +
               fVar309 * fStack_690 + fVar253 * fStack_6b0 + fStack_630 * fVar269;
          auVar341._20_4_ =
               fVar168 * fStack_5ac +
               fVar316 * fStack_68c + fVar262 * fStack_6ac + fStack_62c * fVar276;
          auVar341._24_4_ =
               fVar169 * fStack_5a8 +
               fVar317 * fStack_688 + fVar263 * fStack_6a8 + fStack_628 * fVar279;
          auVar341._28_4_ = fStack_624 + fStack_624 + fStack_5a4 + fStack_624;
          auVar261._8_4_ = 0x7fffffff;
          auVar261._0_8_ = 0x7fffffff7fffffff;
          auVar261._12_4_ = 0x7fffffff;
          auVar261._16_4_ = 0x7fffffff;
          auVar261._20_4_ = 0x7fffffff;
          auVar261._24_4_ = 0x7fffffff;
          auVar261._28_4_ = 0x7fffffff;
          auVar148 = vandps_avx(_local_400,auVar261);
          auVar125._4_4_ = fStack_4fc;
          auVar125._0_4_ = local_500;
          auVar125._8_4_ = fStack_4f8;
          auVar125._12_4_ = fStack_4f4;
          auVar125._16_4_ = fStack_4f0;
          auVar125._20_4_ = fStack_4ec;
          auVar125._24_4_ = fStack_4e8;
          auVar125._28_4_ = fStack_4e4;
          auVar28 = vandps_avx(auVar125,auVar261);
          auVar28 = vmaxps_avx(auVar148,auVar28);
          auVar148 = vandps_avx(auVar353,auVar261);
          auVar28 = vmaxps_avx(auVar28,auVar148);
          auVar28 = vcmpps_avx(auVar28,_local_300,1);
          auVar29 = vblendvps_avx(_local_400,auVar26,auVar28);
          auVar160._0_4_ =
               fVar318 * (float)local_560._0_4_ +
               fVar282 * (float)local_2c0._0_4_ +
               fVar264 * (float)local_2a0._0_4_ + (float)local_280._0_4_ * fVar215;
          auVar160._4_4_ =
               fVar319 * (float)local_560._4_4_ +
               fVar285 * (float)local_2c0._4_4_ +
               fVar265 * (float)local_2a0._4_4_ + (float)local_280._4_4_ * fVar217;
          auVar160._8_4_ =
               fVar320 * fStack_558 +
               fVar286 * fStack_2b8 + fVar266 * fStack_298 + fStack_278 * fVar221;
          auVar160._12_4_ =
               fVar321 * fStack_554 +
               fVar287 * fStack_2b4 + fVar267 * fStack_294 + fStack_274 * fVar223;
          auVar160._16_4_ =
               fVar166 * fStack_550 +
               fVar309 * fStack_2b0 + fVar269 * fStack_290 + fStack_270 * fVar253;
          auVar160._20_4_ =
               fVar168 * fStack_54c +
               fVar316 * fStack_2ac + fVar276 * fStack_28c + fStack_26c * fVar262;
          auVar160._24_4_ =
               fVar169 * fStack_548 +
               fVar317 * fStack_2a8 + fVar279 * fStack_288 + fStack_268 * fVar263;
          auVar160._28_4_ = auVar148._28_4_ + pfVar9[7] + pfVar8[7] + pfVar7[7];
          auVar30 = vblendvps_avx(auVar125,auVar27,auVar28);
          auVar148 = vandps_avx(auVar313,auVar261);
          auVar28 = vandps_avx(auVar341,auVar261);
          auVar31 = vmaxps_avx(auVar148,auVar28);
          auVar148 = vandps_avx(auVar160,auVar261);
          auVar148 = vmaxps_avx(auVar31,auVar148);
          local_540._0_4_ = auVar129._0_4_;
          local_540._4_4_ = auVar129._4_4_;
          fStack_538 = auVar129._8_4_;
          fStack_534 = auVar129._12_4_;
          fStack_530 = auVar129._16_4_;
          fStack_52c = auVar129._20_4_;
          fStack_528 = auVar129._24_4_;
          auVar28 = vcmpps_avx(auVar148,_local_300,1);
          auVar148 = vblendvps_avx(auVar313,auVar26,auVar28);
          auVar161._0_4_ =
               (float)local_560._0_4_ * (float)local_540._0_4_ +
               (float)local_2c0._0_4_ * (float)local_4e0._0_4_ +
               fVar175 + (float)local_2a0._0_4_ * fVar196;
          auVar161._4_4_ =
               (float)local_560._4_4_ * (float)local_540._4_4_ +
               (float)local_2c0._4_4_ * (float)local_4e0._4_4_ +
               fVar252 + (float)local_2a0._4_4_ * fVar307;
          auVar161._8_4_ =
               fStack_558 * fStack_538 + fStack_2b8 * fStack_4d8 + fVar288 + fStack_298 * fVar308;
          auVar161._12_4_ =
               fStack_554 * fStack_534 + fStack_2b4 * fStack_4d4 + fVar194 + fStack_294 * fVar251;
          auVar161._16_4_ =
               fStack_550 * fStack_530 + fStack_2b0 * fStack_4d0 + fVar165 + fStack_290 * fVar197;
          auVar161._20_4_ =
               fStack_54c * fStack_52c + fStack_2ac * fStack_4cc + fVar195 + fStack_28c * fVar322;
          auVar161._24_4_ =
               fStack_548 * fStack_528 + fStack_2a8 * fStack_4c8 + fVar167 + fStack_288 * fVar144;
          auVar161._28_4_ = auVar31._28_4_ + fStack_424 + local_3e0._28_4_ + 0.0;
          auVar28 = vblendvps_avx(auVar341,auVar27,auVar28);
          fVar170 = auVar29._0_4_;
          fVar171 = auVar29._4_4_;
          fVar172 = auVar29._8_4_;
          fVar173 = auVar29._12_4_;
          fVar175 = auVar29._16_4_;
          fVar252 = auVar29._20_4_;
          fVar288 = auVar29._24_4_;
          fVar248 = auVar29._28_4_;
          fVar282 = auVar148._0_4_;
          fVar286 = auVar148._4_4_;
          fVar309 = auVar148._8_4_;
          fVar317 = auVar148._12_4_;
          fVar319 = auVar148._16_4_;
          fVar321 = auVar148._20_4_;
          fVar307 = auVar148._24_4_;
          fVar215 = auVar30._0_4_;
          fVar221 = auVar30._4_4_;
          fVar253 = auVar30._8_4_;
          fVar263 = auVar30._12_4_;
          fVar265 = auVar30._16_4_;
          fVar267 = auVar30._20_4_;
          fVar276 = auVar30._24_4_;
          auVar326._0_4_ = fVar215 * fVar215 + fVar170 * fVar170;
          auVar326._4_4_ = fVar221 * fVar221 + fVar171 * fVar171;
          auVar326._8_4_ = fVar253 * fVar253 + fVar172 * fVar172;
          auVar326._12_4_ = fVar263 * fVar263 + fVar173 * fVar173;
          auVar326._16_4_ = fVar265 * fVar265 + fVar175 * fVar175;
          auVar326._20_4_ = fVar267 * fVar267 + fVar252 * fVar252;
          auVar326._24_4_ = fVar276 * fVar276 + fVar288 * fVar288;
          auVar326._28_4_ = auVar26._28_4_ + auVar27._28_4_;
          auVar26 = vrsqrtps_avx(auVar326);
          fVar217 = auVar26._0_4_;
          fVar223 = auVar26._4_4_;
          auVar80._4_4_ = fVar223 * 1.5;
          auVar80._0_4_ = fVar217 * 1.5;
          fVar262 = auVar26._8_4_;
          auVar80._8_4_ = fVar262 * 1.5;
          fVar264 = auVar26._12_4_;
          auVar80._12_4_ = fVar264 * 1.5;
          fVar266 = auVar26._16_4_;
          auVar80._16_4_ = fVar266 * 1.5;
          fVar269 = auVar26._20_4_;
          auVar80._20_4_ = fVar269 * 1.5;
          fVar279 = auVar26._24_4_;
          auVar80._24_4_ = fVar279 * 1.5;
          auVar80._28_4_ = auVar341._28_4_;
          auVar81._4_4_ = fVar223 * fVar223 * fVar223 * auVar326._4_4_ * 0.5;
          auVar81._0_4_ = fVar217 * fVar217 * fVar217 * auVar326._0_4_ * 0.5;
          auVar81._8_4_ = fVar262 * fVar262 * fVar262 * auVar326._8_4_ * 0.5;
          auVar81._12_4_ = fVar264 * fVar264 * fVar264 * auVar326._12_4_ * 0.5;
          auVar81._16_4_ = fVar266 * fVar266 * fVar266 * auVar326._16_4_ * 0.5;
          auVar81._20_4_ = fVar269 * fVar269 * fVar269 * auVar326._20_4_ * 0.5;
          auVar81._24_4_ = fVar279 * fVar279 * fVar279 * auVar326._24_4_ * 0.5;
          auVar81._28_4_ = auVar326._28_4_;
          auVar27 = vsubps_avx(auVar80,auVar81);
          fVar251 = auVar27._0_4_;
          fVar197 = auVar27._4_4_;
          fVar322 = auVar27._8_4_;
          fVar144 = auVar27._12_4_;
          fVar166 = auVar27._16_4_;
          fVar168 = auVar27._20_4_;
          fVar169 = auVar27._24_4_;
          fVar217 = auVar28._0_4_;
          fVar223 = auVar28._4_4_;
          fVar262 = auVar28._8_4_;
          fVar264 = auVar28._12_4_;
          fVar266 = auVar28._16_4_;
          fVar269 = auVar28._20_4_;
          fVar279 = auVar28._24_4_;
          auVar302._0_4_ = fVar217 * fVar217 + fVar282 * fVar282;
          auVar302._4_4_ = fVar223 * fVar223 + fVar286 * fVar286;
          auVar302._8_4_ = fVar262 * fVar262 + fVar309 * fVar309;
          auVar302._12_4_ = fVar264 * fVar264 + fVar317 * fVar317;
          auVar302._16_4_ = fVar266 * fVar266 + fVar319 * fVar319;
          auVar302._20_4_ = fVar269 * fVar269 + fVar321 * fVar321;
          auVar302._24_4_ = fVar279 * fVar279 + fVar307 * fVar307;
          auVar302._28_4_ = auVar26._28_4_ + auVar148._28_4_;
          auVar148 = vrsqrtps_avx(auVar302);
          fVar285 = auVar148._0_4_;
          fVar287 = auVar148._4_4_;
          auVar82._4_4_ = fVar287 * 1.5;
          auVar82._0_4_ = fVar285 * 1.5;
          fVar316 = auVar148._8_4_;
          auVar82._8_4_ = fVar316 * 1.5;
          fVar318 = auVar148._12_4_;
          auVar82._12_4_ = fVar318 * 1.5;
          fVar320 = auVar148._16_4_;
          auVar82._16_4_ = fVar320 * 1.5;
          fVar196 = auVar148._20_4_;
          auVar82._20_4_ = fVar196 * 1.5;
          fVar308 = auVar148._24_4_;
          auVar82._24_4_ = fVar308 * 1.5;
          auVar82._28_4_ = auVar341._28_4_;
          auVar83._4_4_ = fVar287 * fVar287 * fVar287 * auVar302._4_4_ * 0.5;
          auVar83._0_4_ = fVar285 * fVar285 * fVar285 * auVar302._0_4_ * 0.5;
          auVar83._8_4_ = fVar316 * fVar316 * fVar316 * auVar302._8_4_ * 0.5;
          auVar83._12_4_ = fVar318 * fVar318 * fVar318 * auVar302._12_4_ * 0.5;
          auVar83._16_4_ = fVar320 * fVar320 * fVar320 * auVar302._16_4_ * 0.5;
          auVar83._20_4_ = fVar196 * fVar196 * fVar196 * auVar302._20_4_ * 0.5;
          auVar83._24_4_ = fVar308 * fVar308 * fVar308 * auVar302._24_4_ * 0.5;
          auVar83._28_4_ = auVar302._28_4_;
          auVar26 = vsubps_avx(auVar82,auVar83);
          fVar285 = auVar26._0_4_;
          fVar287 = auVar26._4_4_;
          fVar316 = auVar26._8_4_;
          fVar318 = auVar26._12_4_;
          fVar320 = auVar26._16_4_;
          fVar196 = auVar26._20_4_;
          fVar308 = auVar26._24_4_;
          fVar215 = (float)local_700._0_4_ * fVar251 * fVar215;
          fVar221 = (float)local_700._4_4_ * fVar197 * fVar221;
          auVar84._4_4_ = fVar221;
          auVar84._0_4_ = fVar215;
          fVar253 = (float)uStack_6f8 * fVar322 * fVar253;
          auVar84._8_4_ = fVar253;
          fVar263 = uStack_6f8._4_4_ * fVar144 * fVar263;
          auVar84._12_4_ = fVar263;
          fVar265 = fStack_6f0 * fVar166 * fVar265;
          auVar84._16_4_ = fVar265;
          fVar267 = fStack_6ec * fVar168 * fVar267;
          auVar84._20_4_ = fVar267;
          fVar276 = fStack_6e8 * fVar169 * fVar276;
          auVar84._24_4_ = fVar276;
          auVar84._28_4_ = auVar148._28_4_;
          local_540._4_4_ = fVar221 + local_660._4_4_;
          local_540._0_4_ = fVar215 + local_660._0_4_;
          fStack_538 = fVar253 + local_660._8_4_;
          fStack_534 = fVar263 + local_660._12_4_;
          fStack_530 = fVar265 + local_660._16_4_;
          fStack_52c = fVar267 + local_660._20_4_;
          fStack_528 = fVar276 + local_660._24_4_;
          fStack_524 = auVar148._28_4_ + local_660._28_4_;
          fVar215 = (float)local_700._0_4_ * fVar251 * -fVar170;
          fVar221 = (float)local_700._4_4_ * fVar197 * -fVar171;
          auVar85._4_4_ = fVar221;
          auVar85._0_4_ = fVar215;
          fVar253 = (float)uStack_6f8 * fVar322 * -fVar172;
          auVar85._8_4_ = fVar253;
          fVar263 = uStack_6f8._4_4_ * fVar144 * -fVar173;
          auVar85._12_4_ = fVar263;
          fVar265 = fStack_6f0 * fVar166 * -fVar175;
          auVar85._16_4_ = fVar265;
          fVar267 = fStack_6ec * fVar168 * -fVar252;
          auVar85._20_4_ = fVar267;
          fVar276 = fStack_6e8 * fVar169 * -fVar288;
          auVar85._24_4_ = fVar276;
          auVar85._28_4_ = -fVar248;
          local_4e0._4_4_ = auVar214._4_4_ + fVar221;
          local_4e0._0_4_ = auVar214._0_4_ + fVar215;
          fStack_4d8 = auVar214._8_4_ + fVar253;
          fStack_4d4 = auVar214._12_4_ + fVar263;
          fStack_4d0 = auVar214._16_4_ + fVar265;
          fStack_4cc = auVar214._20_4_ + fVar267;
          fStack_4c8 = auVar214._24_4_ + fVar276;
          fStack_4c4 = auVar214._28_4_ + -fVar248;
          fVar215 = fVar251 * 0.0 * (float)local_700._0_4_;
          fVar221 = fVar197 * 0.0 * (float)local_700._4_4_;
          auVar86._4_4_ = fVar221;
          auVar86._0_4_ = fVar215;
          fVar253 = fVar322 * 0.0 * (float)uStack_6f8;
          auVar86._8_4_ = fVar253;
          fVar263 = fVar144 * 0.0 * uStack_6f8._4_4_;
          auVar86._12_4_ = fVar263;
          fVar265 = fVar166 * 0.0 * fStack_6f0;
          auVar86._16_4_ = fVar265;
          fVar267 = fVar168 * 0.0 * fStack_6ec;
          auVar86._20_4_ = fVar267;
          fVar276 = fVar169 * 0.0 * fStack_6e8;
          auVar86._24_4_ = fVar276;
          auVar86._28_4_ = fVar248;
          auVar31 = vsubps_avx(local_660,auVar84);
          auVar370._0_4_ = fVar215 + auVar161._0_4_;
          auVar370._4_4_ = fVar221 + auVar161._4_4_;
          auVar370._8_4_ = fVar253 + auVar161._8_4_;
          auVar370._12_4_ = fVar263 + auVar161._12_4_;
          auVar370._16_4_ = fVar265 + auVar161._16_4_;
          auVar370._20_4_ = fVar267 + auVar161._20_4_;
          auVar370._24_4_ = fVar276 + auVar161._24_4_;
          auVar370._28_4_ = fVar248 + auVar161._28_4_;
          fVar215 = auVar296._0_4_ * fVar285 * fVar217;
          fVar217 = auVar296._4_4_ * fVar287 * fVar223;
          auVar87._4_4_ = fVar217;
          auVar87._0_4_ = fVar215;
          fVar221 = auVar296._8_4_ * fVar316 * fVar262;
          auVar87._8_4_ = fVar221;
          fVar223 = auVar296._12_4_ * fVar318 * fVar264;
          auVar87._12_4_ = fVar223;
          fVar253 = auVar296._16_4_ * fVar320 * fVar266;
          auVar87._16_4_ = fVar253;
          fVar262 = auVar296._20_4_ * fVar196 * fVar269;
          auVar87._20_4_ = fVar262;
          fVar263 = auVar296._24_4_ * fVar308 * fVar279;
          auVar87._24_4_ = fVar263;
          auVar87._28_4_ = fStack_6e4;
          auVar34 = vsubps_avx(auVar214,auVar85);
          auVar354._0_4_ = (float)local_5a0._0_4_ + fVar215;
          auVar354._4_4_ = local_5a0._4_4_ + fVar217;
          auVar354._8_4_ = local_5a0._8_4_ + fVar221;
          auVar354._12_4_ = local_5a0._12_4_ + fVar223;
          auVar354._16_4_ = local_5a0._16_4_ + fVar253;
          auVar354._20_4_ = local_5a0._20_4_ + fVar262;
          auVar354._24_4_ = local_5a0._24_4_ + fVar263;
          auVar354._28_4_ = local_5a0._28_4_ + fStack_6e4;
          fVar215 = fVar285 * -fVar282 * auVar296._0_4_;
          fVar217 = fVar287 * -fVar286 * auVar296._4_4_;
          auVar88._4_4_ = fVar217;
          auVar88._0_4_ = fVar215;
          fVar221 = fVar316 * -fVar309 * auVar296._8_4_;
          auVar88._8_4_ = fVar221;
          fVar223 = fVar318 * -fVar317 * auVar296._12_4_;
          auVar88._12_4_ = fVar223;
          fVar253 = fVar320 * -fVar319 * auVar296._16_4_;
          auVar88._16_4_ = fVar253;
          fVar262 = fVar196 * -fVar321 * auVar296._20_4_;
          auVar88._20_4_ = fVar262;
          fVar263 = fVar308 * -fVar307 * auVar296._24_4_;
          auVar88._24_4_ = fVar263;
          auVar88._28_4_ = local_660._28_4_;
          auVar149 = vsubps_avx(auVar161,auVar86);
          auVar243._0_4_ = local_460._0_4_ + fVar215;
          auVar243._4_4_ = local_460._4_4_ + fVar217;
          auVar243._8_4_ = local_460._8_4_ + fVar221;
          auVar243._12_4_ = local_460._12_4_ + fVar223;
          auVar243._16_4_ = local_460._16_4_ + fVar253;
          auVar243._20_4_ = local_460._20_4_ + fVar262;
          auVar243._24_4_ = local_460._24_4_ + fVar263;
          auVar243._28_4_ = local_460._28_4_ + local_660._28_4_;
          fVar215 = fVar285 * 0.0 * auVar296._0_4_;
          fVar217 = fVar287 * 0.0 * auVar296._4_4_;
          auVar89._4_4_ = fVar217;
          auVar89._0_4_ = fVar215;
          fVar221 = fVar316 * 0.0 * auVar296._8_4_;
          auVar89._8_4_ = fVar221;
          fVar223 = fVar318 * 0.0 * auVar296._12_4_;
          auVar89._12_4_ = fVar223;
          fVar253 = fVar320 * 0.0 * auVar296._16_4_;
          auVar89._16_4_ = fVar253;
          fVar262 = fVar196 * 0.0 * auVar296._20_4_;
          auVar89._20_4_ = fVar262;
          fVar263 = fVar308 * 0.0 * auVar296._24_4_;
          auVar89._24_4_ = fVar263;
          auVar89._28_4_ = auVar161._28_4_;
          auVar148 = vsubps_avx(local_5a0,auVar87);
          auVar126._4_4_ = fStack_43c;
          auVar126._0_4_ = local_440;
          auVar126._8_4_ = fStack_438;
          auVar126._12_4_ = fStack_434;
          auVar126._16_4_ = fStack_430;
          auVar126._20_4_ = fStack_42c;
          auVar126._24_4_ = fStack_428;
          auVar126._28_4_ = fStack_424;
          auVar314._0_4_ = local_440 + fVar215;
          auVar314._4_4_ = fStack_43c + fVar217;
          auVar314._8_4_ = fStack_438 + fVar221;
          auVar314._12_4_ = fStack_434 + fVar223;
          auVar314._16_4_ = fStack_430 + fVar253;
          auVar314._20_4_ = fStack_42c + fVar262;
          auVar314._24_4_ = fStack_428 + fVar263;
          auVar314._28_4_ = fStack_424 + auVar161._28_4_;
          auVar27 = vsubps_avx(local_460,auVar88);
          auVar28 = vsubps_avx(auVar126,auVar89);
          auVar29 = vsubps_avx(auVar243,auVar34);
          auVar30 = vsubps_avx(auVar314,auVar149);
          auVar90._4_4_ = auVar149._4_4_ * auVar29._4_4_;
          auVar90._0_4_ = auVar149._0_4_ * auVar29._0_4_;
          auVar90._8_4_ = auVar149._8_4_ * auVar29._8_4_;
          auVar90._12_4_ = auVar149._12_4_ * auVar29._12_4_;
          auVar90._16_4_ = auVar149._16_4_ * auVar29._16_4_;
          auVar90._20_4_ = auVar149._20_4_ * auVar29._20_4_;
          auVar90._24_4_ = auVar149._24_4_ * auVar29._24_4_;
          auVar90._28_4_ = auVar341._28_4_;
          auVar91._4_4_ = auVar34._4_4_ * auVar30._4_4_;
          auVar91._0_4_ = auVar34._0_4_ * auVar30._0_4_;
          auVar91._8_4_ = auVar34._8_4_ * auVar30._8_4_;
          auVar91._12_4_ = auVar34._12_4_ * auVar30._12_4_;
          auVar91._16_4_ = auVar34._16_4_ * auVar30._16_4_;
          auVar91._20_4_ = auVar34._20_4_ * auVar30._20_4_;
          auVar91._24_4_ = auVar34._24_4_ * auVar30._24_4_;
          auVar91._28_4_ = fStack_424;
          auVar32 = vsubps_avx(auVar91,auVar90);
          auVar92._4_4_ = auVar31._4_4_ * auVar30._4_4_;
          auVar92._0_4_ = auVar31._0_4_ * auVar30._0_4_;
          auVar92._8_4_ = auVar31._8_4_ * auVar30._8_4_;
          auVar92._12_4_ = auVar31._12_4_ * auVar30._12_4_;
          auVar92._16_4_ = auVar31._16_4_ * auVar30._16_4_;
          auVar92._20_4_ = auVar31._20_4_ * auVar30._20_4_;
          auVar92._24_4_ = auVar31._24_4_ * auVar30._24_4_;
          auVar92._28_4_ = auVar30._28_4_;
          auVar30 = vsubps_avx(auVar354,auVar31);
          auVar93._4_4_ = auVar149._4_4_ * auVar30._4_4_;
          auVar93._0_4_ = auVar149._0_4_ * auVar30._0_4_;
          auVar93._8_4_ = auVar149._8_4_ * auVar30._8_4_;
          auVar93._12_4_ = auVar149._12_4_ * auVar30._12_4_;
          auVar93._16_4_ = auVar149._16_4_ * auVar30._16_4_;
          auVar93._20_4_ = auVar149._20_4_ * auVar30._20_4_;
          auVar93._24_4_ = auVar149._24_4_ * auVar30._24_4_;
          auVar93._28_4_ = auVar26._28_4_;
          auVar33 = vsubps_avx(auVar93,auVar92);
          auVar94._4_4_ = auVar34._4_4_ * auVar30._4_4_;
          auVar94._0_4_ = auVar34._0_4_ * auVar30._0_4_;
          auVar94._8_4_ = auVar34._8_4_ * auVar30._8_4_;
          auVar94._12_4_ = auVar34._12_4_ * auVar30._12_4_;
          auVar94._16_4_ = auVar34._16_4_ * auVar30._16_4_;
          auVar94._20_4_ = auVar34._20_4_ * auVar30._20_4_;
          auVar94._24_4_ = auVar34._24_4_ * auVar30._24_4_;
          auVar94._28_4_ = auVar26._28_4_;
          auVar95._4_4_ = auVar31._4_4_ * auVar29._4_4_;
          auVar95._0_4_ = auVar31._0_4_ * auVar29._0_4_;
          auVar95._8_4_ = auVar31._8_4_ * auVar29._8_4_;
          auVar95._12_4_ = auVar31._12_4_ * auVar29._12_4_;
          auVar95._16_4_ = auVar31._16_4_ * auVar29._16_4_;
          auVar95._20_4_ = auVar31._20_4_ * auVar29._20_4_;
          auVar95._24_4_ = auVar31._24_4_ * auVar29._24_4_;
          auVar95._28_4_ = auVar29._28_4_;
          auVar26 = vsubps_avx(auVar95,auVar94);
          auVar186._0_4_ = auVar32._0_4_ * 0.0 + auVar26._0_4_ + auVar33._0_4_ * 0.0;
          auVar186._4_4_ = auVar32._4_4_ * 0.0 + auVar26._4_4_ + auVar33._4_4_ * 0.0;
          auVar186._8_4_ = auVar32._8_4_ * 0.0 + auVar26._8_4_ + auVar33._8_4_ * 0.0;
          auVar186._12_4_ = auVar32._12_4_ * 0.0 + auVar26._12_4_ + auVar33._12_4_ * 0.0;
          auVar186._16_4_ = auVar32._16_4_ * 0.0 + auVar26._16_4_ + auVar33._16_4_ * 0.0;
          auVar186._20_4_ = auVar32._20_4_ * 0.0 + auVar26._20_4_ + auVar33._20_4_ * 0.0;
          auVar186._24_4_ = auVar32._24_4_ * 0.0 + auVar26._24_4_ + auVar33._24_4_ * 0.0;
          auVar186._28_4_ = auVar32._28_4_ + auVar26._28_4_ + auVar33._28_4_;
          auVar25 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
          auVar148 = vblendvps_avx(auVar148,_local_540,auVar25);
          auVar26 = vblendvps_avx(auVar27,_local_4e0,auVar25);
          auVar27 = vblendvps_avx(auVar28,auVar370,auVar25);
          auVar28 = vblendvps_avx(auVar31,auVar354,auVar25);
          auVar29 = vblendvps_avx(auVar34,auVar243,auVar25);
          auVar30 = vblendvps_avx(auVar149,auVar314,auVar25);
          auVar31 = vblendvps_avx(auVar354,auVar31,auVar25);
          auVar32 = vblendvps_avx(auVar243,auVar34,auVar25);
          auVar33 = vblendvps_avx(auVar314,auVar149,auVar25);
          _local_7a0 = vandps_avx(local_3e0,auVar231);
          auVar31 = vsubps_avx(auVar31,auVar148);
          auVar150 = vsubps_avx(auVar32,auVar26);
          auVar33 = vsubps_avx(auVar33,auVar27);
          auVar151 = vsubps_avx(auVar26,auVar29);
          fVar215 = auVar150._0_4_;
          fVar246 = auVar27._0_4_;
          fVar264 = auVar150._4_4_;
          fVar247 = auVar27._4_4_;
          auVar96._4_4_ = fVar247 * fVar264;
          auVar96._0_4_ = fVar246 * fVar215;
          fVar282 = auVar150._8_4_;
          fVar142 = auVar27._8_4_;
          auVar96._8_4_ = fVar142 * fVar282;
          fVar318 = auVar150._12_4_;
          fVar143 = auVar27._12_4_;
          auVar96._12_4_ = fVar143 * fVar318;
          fVar251 = auVar150._16_4_;
          fVar194 = auVar27._16_4_;
          auVar96._16_4_ = fVar194 * fVar251;
          fVar170 = auVar150._20_4_;
          fVar165 = auVar27._20_4_;
          auVar96._20_4_ = fVar165 * fVar170;
          fVar248 = auVar150._24_4_;
          fVar195 = auVar27._24_4_;
          auVar96._24_4_ = fVar195 * fVar248;
          auVar96._28_4_ = auVar32._28_4_;
          fVar217 = auVar26._0_4_;
          fVar167 = auVar33._0_4_;
          fVar265 = auVar26._4_4_;
          fVar289 = auVar33._4_4_;
          auVar97._4_4_ = fVar289 * fVar265;
          auVar97._0_4_ = fVar167 * fVar217;
          fVar285 = auVar26._8_4_;
          fVar174 = auVar33._8_4_;
          auVar97._8_4_ = fVar174 * fVar285;
          fVar319 = auVar26._12_4_;
          fVar191 = auVar33._12_4_;
          auVar97._12_4_ = fVar191 * fVar319;
          fVar197 = auVar26._16_4_;
          fVar192 = auVar33._16_4_;
          auVar97._16_4_ = fVar192 * fVar197;
          fVar171 = auVar26._20_4_;
          fVar193 = auVar33._20_4_;
          auVar97._20_4_ = fVar193 * fVar171;
          fVar249 = auVar26._24_4_;
          fVar268 = auVar33._24_4_;
          uVar11 = auVar34._28_4_;
          auVar97._24_4_ = fVar268 * fVar249;
          auVar97._28_4_ = uVar11;
          auVar32 = vsubps_avx(auVar97,auVar96);
          fVar221 = auVar148._0_4_;
          fVar266 = auVar148._4_4_;
          auVar98._4_4_ = fVar289 * fVar266;
          auVar98._0_4_ = fVar167 * fVar221;
          fVar286 = auVar148._8_4_;
          auVar98._8_4_ = fVar174 * fVar286;
          fVar320 = auVar148._12_4_;
          auVar98._12_4_ = fVar191 * fVar320;
          fVar322 = auVar148._16_4_;
          auVar98._16_4_ = fVar192 * fVar322;
          fVar172 = auVar148._20_4_;
          auVar98._20_4_ = fVar193 * fVar172;
          fVar250 = auVar148._24_4_;
          auVar98._24_4_ = fVar268 * fVar250;
          auVar98._28_4_ = uVar11;
          fVar223 = auVar31._0_4_;
          fVar267 = auVar31._4_4_;
          auVar99._4_4_ = fVar247 * fVar267;
          auVar99._0_4_ = fVar246 * fVar223;
          fVar287 = auVar31._8_4_;
          auVar99._8_4_ = fVar142 * fVar287;
          fVar321 = auVar31._12_4_;
          auVar99._12_4_ = fVar143 * fVar321;
          fVar144 = auVar31._16_4_;
          auVar99._16_4_ = fVar194 * fVar144;
          fVar173 = auVar31._20_4_;
          auVar99._20_4_ = fVar165 * fVar173;
          fVar305 = auVar31._24_4_;
          auVar99._24_4_ = fVar195 * fVar305;
          auVar99._28_4_ = auVar354._28_4_;
          auVar34 = vsubps_avx(auVar99,auVar98);
          auVar100._4_4_ = fVar265 * fVar267;
          auVar100._0_4_ = fVar217 * fVar223;
          auVar100._8_4_ = fVar285 * fVar287;
          auVar100._12_4_ = fVar319 * fVar321;
          auVar100._16_4_ = fVar197 * fVar144;
          auVar100._20_4_ = fVar171 * fVar173;
          auVar100._24_4_ = fVar249 * fVar305;
          auVar100._28_4_ = uVar11;
          auVar101._4_4_ = fVar266 * fVar264;
          auVar101._0_4_ = fVar221 * fVar215;
          auVar101._8_4_ = fVar286 * fVar282;
          auVar101._12_4_ = fVar320 * fVar318;
          auVar101._16_4_ = fVar322 * fVar251;
          auVar101._20_4_ = fVar172 * fVar170;
          auVar101._24_4_ = fVar250 * fVar248;
          auVar101._28_4_ = auVar149._28_4_;
          auVar149 = vsubps_avx(auVar101,auVar100);
          auVar178 = vsubps_avx(auVar27,auVar30);
          fVar262 = auVar149._28_4_ + auVar34._28_4_;
          auVar327._0_4_ = auVar149._0_4_ + auVar34._0_4_ * 0.0 + auVar32._0_4_ * 0.0;
          auVar327._4_4_ = auVar149._4_4_ + auVar34._4_4_ * 0.0 + auVar32._4_4_ * 0.0;
          auVar327._8_4_ = auVar149._8_4_ + auVar34._8_4_ * 0.0 + auVar32._8_4_ * 0.0;
          auVar327._12_4_ = auVar149._12_4_ + auVar34._12_4_ * 0.0 + auVar32._12_4_ * 0.0;
          auVar327._16_4_ = auVar149._16_4_ + auVar34._16_4_ * 0.0 + auVar32._16_4_ * 0.0;
          auVar327._20_4_ = auVar149._20_4_ + auVar34._20_4_ * 0.0 + auVar32._20_4_ * 0.0;
          auVar327._24_4_ = auVar149._24_4_ + auVar34._24_4_ * 0.0 + auVar32._24_4_ * 0.0;
          auVar327._28_4_ = fVar262 + auVar32._28_4_;
          fVar253 = auVar151._0_4_;
          fVar269 = auVar151._4_4_;
          auVar102._4_4_ = auVar30._4_4_ * fVar269;
          auVar102._0_4_ = auVar30._0_4_ * fVar253;
          fVar309 = auVar151._8_4_;
          auVar102._8_4_ = auVar30._8_4_ * fVar309;
          fVar196 = auVar151._12_4_;
          auVar102._12_4_ = auVar30._12_4_ * fVar196;
          fVar166 = auVar151._16_4_;
          auVar102._16_4_ = auVar30._16_4_ * fVar166;
          fVar175 = auVar151._20_4_;
          auVar102._20_4_ = auVar30._20_4_ * fVar175;
          fVar306 = auVar151._24_4_;
          auVar102._24_4_ = auVar30._24_4_ * fVar306;
          auVar102._28_4_ = fVar262;
          fVar262 = auVar178._0_4_;
          fVar276 = auVar178._4_4_;
          auVar103._4_4_ = auVar29._4_4_ * fVar276;
          auVar103._0_4_ = auVar29._0_4_ * fVar262;
          fVar316 = auVar178._8_4_;
          auVar103._8_4_ = auVar29._8_4_ * fVar316;
          fVar307 = auVar178._12_4_;
          auVar103._12_4_ = auVar29._12_4_ * fVar307;
          fVar168 = auVar178._16_4_;
          auVar103._16_4_ = auVar29._16_4_ * fVar168;
          fVar252 = auVar178._20_4_;
          auVar103._20_4_ = auVar29._20_4_ * fVar252;
          fVar234 = auVar178._24_4_;
          auVar103._24_4_ = auVar29._24_4_ * fVar234;
          auVar103._28_4_ = auVar149._28_4_;
          auVar27 = vsubps_avx(auVar103,auVar102);
          auVar148 = vsubps_avx(auVar148,auVar28);
          fVar263 = auVar148._0_4_;
          fVar279 = auVar148._4_4_;
          auVar104._4_4_ = auVar30._4_4_ * fVar279;
          auVar104._0_4_ = auVar30._0_4_ * fVar263;
          fVar317 = auVar148._8_4_;
          auVar104._8_4_ = auVar30._8_4_ * fVar317;
          fVar308 = auVar148._12_4_;
          auVar104._12_4_ = auVar30._12_4_ * fVar308;
          fVar169 = auVar148._16_4_;
          auVar104._16_4_ = auVar30._16_4_ * fVar169;
          fVar288 = auVar148._20_4_;
          auVar104._20_4_ = auVar30._20_4_ * fVar288;
          fVar245 = auVar148._24_4_;
          auVar104._24_4_ = auVar30._24_4_ * fVar245;
          auVar104._28_4_ = auVar30._28_4_;
          auVar105._4_4_ = fVar276 * auVar28._4_4_;
          auVar105._0_4_ = fVar262 * auVar28._0_4_;
          auVar105._8_4_ = fVar316 * auVar28._8_4_;
          auVar105._12_4_ = fVar307 * auVar28._12_4_;
          auVar105._16_4_ = fVar168 * auVar28._16_4_;
          auVar105._20_4_ = fVar252 * auVar28._20_4_;
          auVar105._24_4_ = fVar234 * auVar28._24_4_;
          auVar105._28_4_ = auVar32._28_4_;
          auVar148 = vsubps_avx(auVar104,auVar105);
          auVar106._4_4_ = auVar29._4_4_ * fVar279;
          auVar106._0_4_ = auVar29._0_4_ * fVar263;
          auVar106._8_4_ = auVar29._8_4_ * fVar317;
          auVar106._12_4_ = auVar29._12_4_ * fVar308;
          auVar106._16_4_ = auVar29._16_4_ * fVar169;
          auVar106._20_4_ = auVar29._20_4_ * fVar288;
          auVar106._24_4_ = auVar29._24_4_ * fVar245;
          auVar106._28_4_ = auVar29._28_4_;
          auVar107._4_4_ = fVar269 * auVar28._4_4_;
          auVar107._0_4_ = fVar253 * auVar28._0_4_;
          auVar107._8_4_ = fVar309 * auVar28._8_4_;
          auVar107._12_4_ = fVar196 * auVar28._12_4_;
          auVar107._16_4_ = fVar166 * auVar28._16_4_;
          auVar107._20_4_ = fVar175 * auVar28._20_4_;
          auVar107._24_4_ = fVar306 * auVar28._24_4_;
          auVar107._28_4_ = auVar28._28_4_;
          auVar28 = vsubps_avx(auVar107,auVar106);
          auVar162._0_4_ = auVar27._0_4_ * 0.0 + auVar28._0_4_ + auVar148._0_4_ * 0.0;
          auVar162._4_4_ = auVar27._4_4_ * 0.0 + auVar28._4_4_ + auVar148._4_4_ * 0.0;
          auVar162._8_4_ = auVar27._8_4_ * 0.0 + auVar28._8_4_ + auVar148._8_4_ * 0.0;
          auVar162._12_4_ = auVar27._12_4_ * 0.0 + auVar28._12_4_ + auVar148._12_4_ * 0.0;
          auVar162._16_4_ = auVar27._16_4_ * 0.0 + auVar28._16_4_ + auVar148._16_4_ * 0.0;
          auVar162._20_4_ = auVar27._20_4_ * 0.0 + auVar28._20_4_ + auVar148._20_4_ * 0.0;
          auVar162._24_4_ = auVar27._24_4_ * 0.0 + auVar28._24_4_ + auVar148._24_4_ * 0.0;
          auVar162._28_4_ = auVar148._28_4_ + auVar28._28_4_ + auVar148._28_4_;
          auVar148 = vmaxps_avx(auVar327,auVar162);
          auVar27 = vcmpps_avx(auVar148,ZEXT432(0) << 0x20,2);
          auVar244 = ZEXT3264(_local_7a0);
          auVar28 = _local_7a0 & auVar27;
          auVar148 = auVar327;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0x7f,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0xbf,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar28[0x1f]) {
LAB_00a40077:
            auVar328 = auVar148._4_12_;
            auVar233 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                          CONCAT816(local_4c0[1]._16_8_,
                                                    CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))
                                         ));
          }
          else {
            auVar148 = vandps_avx(auVar27,_local_7a0);
            auVar328 = auVar148._4_12_;
            auVar108._4_4_ = fVar276 * fVar264;
            auVar108._0_4_ = fVar262 * fVar215;
            auVar108._8_4_ = fVar316 * fVar282;
            auVar108._12_4_ = fVar307 * fVar318;
            auVar108._16_4_ = fVar168 * fVar251;
            auVar108._20_4_ = fVar252 * fVar170;
            auVar108._24_4_ = fVar234 * fVar248;
            auVar108._28_4_ = local_7a0._28_4_;
            auVar109._4_4_ = fVar269 * fVar289;
            auVar109._0_4_ = fVar253 * fVar167;
            auVar109._8_4_ = fVar309 * fVar174;
            auVar109._12_4_ = fVar196 * fVar191;
            auVar109._16_4_ = fVar166 * fVar192;
            auVar109._20_4_ = fVar175 * fVar193;
            auVar109._24_4_ = fVar306 * fVar268;
            auVar109._28_4_ = auVar27._28_4_;
            auVar28 = vsubps_avx(auVar109,auVar108);
            auVar110._4_4_ = fVar279 * fVar289;
            auVar110._0_4_ = fVar263 * fVar167;
            auVar110._8_4_ = fVar317 * fVar174;
            auVar110._12_4_ = fVar308 * fVar191;
            auVar110._16_4_ = fVar169 * fVar192;
            auVar110._20_4_ = fVar288 * fVar193;
            auVar110._24_4_ = fVar245 * fVar268;
            auVar110._28_4_ = auVar33._28_4_;
            auVar111._4_4_ = fVar276 * fVar267;
            auVar111._0_4_ = fVar262 * fVar223;
            auVar111._8_4_ = fVar316 * fVar287;
            auVar111._12_4_ = fVar307 * fVar321;
            auVar111._16_4_ = fVar168 * fVar144;
            auVar111._20_4_ = fVar252 * fVar173;
            auVar111._24_4_ = fVar234 * fVar305;
            auVar111._28_4_ = auVar178._28_4_;
            auVar29 = vsubps_avx(auVar111,auVar110);
            auVar112._4_4_ = fVar269 * fVar267;
            auVar112._0_4_ = fVar253 * fVar223;
            auVar112._8_4_ = fVar309 * fVar287;
            auVar112._12_4_ = fVar196 * fVar321;
            auVar112._16_4_ = fVar166 * fVar144;
            auVar112._20_4_ = fVar175 * fVar173;
            auVar112._24_4_ = fVar306 * fVar305;
            auVar112._28_4_ = auVar31._28_4_;
            auVar113._4_4_ = fVar279 * fVar264;
            auVar113._0_4_ = fVar263 * fVar215;
            auVar113._8_4_ = fVar317 * fVar282;
            auVar113._12_4_ = fVar308 * fVar318;
            auVar113._16_4_ = fVar169 * fVar251;
            auVar113._20_4_ = fVar288 * fVar170;
            auVar113._24_4_ = fVar245 * fVar248;
            auVar113._28_4_ = auVar150._28_4_;
            auVar30 = vsubps_avx(auVar113,auVar112);
            auVar303._0_4_ = auVar28._0_4_ * 0.0 + auVar30._0_4_ + auVar29._0_4_ * 0.0;
            auVar303._4_4_ = auVar28._4_4_ * 0.0 + auVar30._4_4_ + auVar29._4_4_ * 0.0;
            auVar303._8_4_ = auVar28._8_4_ * 0.0 + auVar30._8_4_ + auVar29._8_4_ * 0.0;
            auVar303._12_4_ = auVar28._12_4_ * 0.0 + auVar30._12_4_ + auVar29._12_4_ * 0.0;
            auVar303._16_4_ = auVar28._16_4_ * 0.0 + auVar30._16_4_ + auVar29._16_4_ * 0.0;
            auVar303._20_4_ = auVar28._20_4_ * 0.0 + auVar30._20_4_ + auVar29._20_4_ * 0.0;
            auVar303._24_4_ = auVar28._24_4_ * 0.0 + auVar30._24_4_ + auVar29._24_4_ * 0.0;
            auVar303._28_4_ = auVar151._28_4_ + auVar30._28_4_ + auVar31._28_4_;
            auVar27 = vrcpps_avx(auVar303);
            fVar223 = auVar27._0_4_;
            fVar253 = auVar27._4_4_;
            auVar114._4_4_ = auVar303._4_4_ * fVar253;
            auVar114._0_4_ = auVar303._0_4_ * fVar223;
            fVar262 = auVar27._8_4_;
            auVar114._8_4_ = auVar303._8_4_ * fVar262;
            fVar263 = auVar27._12_4_;
            auVar114._12_4_ = auVar303._12_4_ * fVar263;
            fVar264 = auVar27._16_4_;
            auVar114._16_4_ = auVar303._16_4_ * fVar264;
            fVar267 = auVar27._20_4_;
            auVar114._20_4_ = auVar303._20_4_ * fVar267;
            fVar269 = auVar27._24_4_;
            auVar114._24_4_ = auVar303._24_4_ * fVar269;
            auVar114._28_4_ = auVar178._28_4_;
            auVar342._8_4_ = 0x3f800000;
            auVar342._0_8_ = 0x3f8000003f800000;
            auVar342._12_4_ = 0x3f800000;
            auVar342._16_4_ = 0x3f800000;
            auVar342._20_4_ = 0x3f800000;
            auVar342._24_4_ = 0x3f800000;
            auVar342._28_4_ = 0x3f800000;
            auVar27 = vsubps_avx(auVar342,auVar114);
            fVar223 = auVar27._0_4_ * fVar223 + fVar223;
            fVar253 = auVar27._4_4_ * fVar253 + fVar253;
            fVar262 = auVar27._8_4_ * fVar262 + fVar262;
            fVar263 = auVar27._12_4_ * fVar263 + fVar263;
            fVar264 = auVar27._16_4_ * fVar264 + fVar264;
            fVar267 = auVar27._20_4_ * fVar267 + fVar267;
            fVar269 = auVar27._24_4_ * fVar269 + fVar269;
            auVar115._4_4_ =
                 (fVar266 * auVar28._4_4_ + auVar29._4_4_ * fVar265 + fVar247 * auVar30._4_4_) *
                 fVar253;
            auVar115._0_4_ =
                 (fVar221 * auVar28._0_4_ + auVar29._0_4_ * fVar217 + fVar246 * auVar30._0_4_) *
                 fVar223;
            auVar115._8_4_ =
                 (fVar286 * auVar28._8_4_ + auVar29._8_4_ * fVar285 + fVar142 * auVar30._8_4_) *
                 fVar262;
            auVar115._12_4_ =
                 (fVar320 * auVar28._12_4_ + auVar29._12_4_ * fVar319 + fVar143 * auVar30._12_4_) *
                 fVar263;
            auVar115._16_4_ =
                 (fVar322 * auVar28._16_4_ + auVar29._16_4_ * fVar197 + fVar194 * auVar30._16_4_) *
                 fVar264;
            auVar115._20_4_ =
                 (fVar172 * auVar28._20_4_ + auVar29._20_4_ * fVar171 + fVar165 * auVar30._20_4_) *
                 fVar267;
            auVar115._24_4_ =
                 (fVar250 * auVar28._24_4_ + auVar29._24_4_ * fVar249 + fVar195 * auVar30._24_4_) *
                 fVar269;
            auVar115._28_4_ = auVar26._28_4_ + auVar30._28_4_;
            fVar215 = (ray->super_RayK<1>).tfar;
            auVar232._4_4_ = fVar215;
            auVar232._0_4_ = fVar215;
            auVar232._8_4_ = fVar215;
            auVar232._12_4_ = fVar215;
            auVar232._16_4_ = fVar215;
            auVar232._20_4_ = fVar215;
            auVar232._24_4_ = fVar215;
            auVar232._28_4_ = fVar215;
            auVar27 = vcmpps_avx(local_320,auVar115,2);
            auVar244 = ZEXT3264(auVar27);
            auVar26 = vcmpps_avx(auVar115,auVar232,2);
            auVar26 = vandps_avx(auVar27,auVar26);
            auVar28 = auVar148 & auVar26;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) goto LAB_00a40077;
            auVar148 = vandps_avx(auVar148,auVar26);
            auVar26 = vcmpps_avx(auVar303,ZEXT432(0) << 0x20,4);
            auVar28 = auVar148 & auVar26;
            auVar233 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                          CONCAT816(local_4c0[1]._16_8_,
                                                    CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))
                                         ));
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              auVar148 = vandps_avx(auVar26,auVar148);
              auVar233 = ZEXT3264(auVar148);
              auVar116._4_4_ = auVar327._4_4_ * fVar253;
              auVar116._0_4_ = auVar327._0_4_ * fVar223;
              auVar116._8_4_ = auVar327._8_4_ * fVar262;
              auVar116._12_4_ = auVar327._12_4_ * fVar263;
              auVar116._16_4_ = auVar327._16_4_ * fVar264;
              auVar116._20_4_ = auVar327._20_4_ * fVar267;
              auVar116._24_4_ = auVar327._24_4_ * fVar269;
              auVar116._28_4_ = auVar27._28_4_;
              auVar244 = ZEXT3264(auVar116);
              auVar117._4_4_ = auVar162._4_4_ * fVar253;
              auVar117._0_4_ = auVar162._0_4_ * fVar223;
              auVar117._8_4_ = auVar162._8_4_ * fVar262;
              auVar117._12_4_ = auVar162._12_4_ * fVar263;
              auVar117._16_4_ = auVar162._16_4_ * fVar264;
              auVar117._20_4_ = auVar162._20_4_ * fVar267;
              auVar117._24_4_ = auVar162._24_4_ * fVar269;
              auVar117._28_4_ = auVar162._28_4_;
              auVar275._8_4_ = 0x3f800000;
              auVar275._0_8_ = 0x3f8000003f800000;
              auVar275._12_4_ = 0x3f800000;
              auVar275._16_4_ = 0x3f800000;
              auVar275._20_4_ = 0x3f800000;
              auVar275._24_4_ = 0x3f800000;
              auVar275._28_4_ = 0x3f800000;
              auVar148 = vsubps_avx(auVar275,auVar116);
              local_480 = vblendvps_avx(auVar148,auVar116,auVar25);
              auVar148 = vsubps_avx(auVar275,auVar117);
              _local_380 = vblendvps_avx(auVar148,auVar117,auVar25);
              local_360 = auVar115;
            }
          }
          auVar371 = ZEXT3264(_local_6c0);
          auVar315 = ZEXT3264(local_680);
          auVar304 = ZEXT3264(local_6e0);
          auVar148 = auVar233._0_32_;
          auVar297 = ZEXT3264(_local_580);
          auVar332 = ZEXT3264(_local_6a0);
          if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar148 >> 0x7f,0) != '\0') ||
                (auVar233 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar148 >> 0xbf,0) != '\0') ||
              (auVar233 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar233[0x1f] < '\0') {
            auVar26 = vsubps_avx(auVar296,_local_700);
            auVar244 = ZEXT3264(local_480);
            fVar217 = (float)local_700._0_4_ + auVar26._0_4_ * local_480._0_4_;
            fVar221 = (float)local_700._4_4_ + auVar26._4_4_ * local_480._4_4_;
            fVar223 = (float)uStack_6f8 + auVar26._8_4_ * local_480._8_4_;
            fVar253 = uStack_6f8._4_4_ + auVar26._12_4_ * local_480._12_4_;
            fVar262 = fStack_6f0 + auVar26._16_4_ * local_480._16_4_;
            fVar263 = fStack_6ec + auVar26._20_4_ * local_480._20_4_;
            fVar264 = fStack_6e8 + auVar26._24_4_ * local_480._24_4_;
            fVar265 = fStack_6e4 + auVar26._28_4_;
            fVar215 = pre->depth_scale;
            auVar118._4_4_ = (fVar221 + fVar221) * fVar215;
            auVar118._0_4_ = (fVar217 + fVar217) * fVar215;
            auVar118._8_4_ = (fVar223 + fVar223) * fVar215;
            auVar118._12_4_ = (fVar253 + fVar253) * fVar215;
            auVar118._16_4_ = (fVar262 + fVar262) * fVar215;
            auVar118._20_4_ = (fVar263 + fVar263) * fVar215;
            auVar118._24_4_ = (fVar264 + fVar264) * fVar215;
            auVar118._28_4_ = fVar265 + fVar265;
            auVar26 = vcmpps_avx(local_360,auVar118,6);
            auVar27 = auVar148 & auVar26;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) {
              auVar190 = ZEXT3264(local_480);
              goto LAB_00a3fe0f;
            }
            local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
            local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
            uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
            uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
            uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
            uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
            uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
            uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
            local_260 = local_480;
            auVar132 = _local_380;
            auVar27 = _local_380;
            local_240 = (float)local_380._0_4_;
            fStack_23c = (float)local_380._4_4_;
            fStack_238 = (float)uStack_378;
            fStack_234 = uStack_378._4_4_;
            fStack_230 = (float)uStack_370;
            fStack_22c = uStack_370._4_4_;
            fStack_228 = (float)uStack_368;
            fStack_224 = uStack_368._4_4_;
            local_220 = local_360;
            local_1fc = uVar22;
            local_1f0 = CONCAT44(fStack_77c,local_780);
            uStack_1e8 = CONCAT44(fStack_774,fStack_778);
            local_1e0 = CONCAT44(fStack_74c,local_750);
            uStack_1d8 = CONCAT44(fStack_744,fStack_748);
            local_1d0 = CONCAT44(fStack_75c,local_760);
            uStack_1c8 = CONCAT44(fStack_754,fStack_758);
            local_1c0 = CONCAT44(fStack_76c,local_770);
            uStack_1b8 = CONCAT44(fStack_764,fStack_768);
            pGVar138 = (context->scene->geometries).items[local_7b8].ptr;
            _local_380 = auVar27;
            if ((pGVar138->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar148 = vandps_avx(auVar26,auVar148);
              local_4c0[0] = auVar148;
              auVar204._0_4_ = (float)(int)local_200;
              auVar204._4_12_ = auVar328;
              auVar257 = vshufps_avx(auVar204,auVar204,0);
              local_180[0] = (auVar257._0_4_ + local_480._0_4_ + 0.0) * (float)local_3c0._0_4_;
              local_180[1] = (auVar257._4_4_ + local_480._4_4_ + 1.0) * (float)local_3c0._4_4_;
              local_180[2] = (auVar257._8_4_ + local_480._8_4_ + 2.0) * fStack_3b8;
              local_180[3] = (auVar257._12_4_ + local_480._12_4_ + 3.0) * fStack_3b4;
              fStack_170 = (auVar257._0_4_ + local_480._16_4_ + 4.0) * fStack_3b0;
              fStack_16c = (auVar257._4_4_ + local_480._20_4_ + 5.0) * fStack_3ac;
              fStack_168 = (auVar257._8_4_ + local_480._24_4_ + 6.0) * fStack_3a8;
              fStack_164 = auVar257._12_4_ + local_480._28_4_ + 7.0;
              uStack_370 = auVar132._16_8_;
              uStack_368 = auVar27._24_8_;
              local_160 = local_380;
              uStack_158 = uStack_378;
              uStack_150 = uStack_370;
              uStack_148 = uStack_368;
              local_140 = local_360;
              auVar187._8_4_ = 0x7f800000;
              auVar187._0_8_ = 0x7f8000007f800000;
              auVar187._12_4_ = 0x7f800000;
              auVar187._16_4_ = 0x7f800000;
              auVar187._20_4_ = 0x7f800000;
              auVar187._24_4_ = 0x7f800000;
              auVar187._28_4_ = 0x7f800000;
              auVar26 = vblendvps_avx(auVar187,local_360,auVar148);
              auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
              auVar27 = vminps_avx(auVar26,auVar27);
              auVar28 = vshufpd_avx(auVar27,auVar27,5);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar28 = vperm2f128_avx(auVar27,auVar27,1);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar26 = vcmpps_avx(auVar26,auVar27,0);
              auVar27 = auVar148 & auVar26;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                auVar148 = vandps_avx(auVar26,auVar148);
              }
              uVar135 = vmovmskps_avx(auVar148);
              uVar133 = 0;
              if (uVar135 != 0) {
                for (; (uVar135 >> uVar133 & 1) == 0; uVar133 = uVar133 + 1) {
                }
              }
              auVar139 = (undefined1  [8])(ulong)uVar133;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar138->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                _local_7a0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_660._0_8_ = pGVar138;
                do {
                  local_604 = local_180[(long)auVar139];
                  local_600 = *(undefined4 *)((long)&local_160 + (long)auVar139 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_140 + (long)auVar139 * 4);
                  local_730.context = context->user;
                  fVar215 = 1.0 - local_604;
                  fVar198 = local_604 * fVar215 + local_604 * fVar215;
                  auVar257 = ZEXT416((uint)(local_604 * local_604 * 3.0));
                  auVar257 = vshufps_avx(auVar257,auVar257,0);
                  auVar205 = ZEXT416((uint)((fVar198 - local_604 * local_604) * 3.0));
                  auVar205 = vshufps_avx(auVar205,auVar205,0);
                  auVar222 = ZEXT416((uint)((fVar215 * fVar215 - fVar198) * 3.0));
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar226 = ZEXT416((uint)(fVar215 * fVar215 * -3.0));
                  auVar226 = vshufps_avx(auVar226,auVar226,0);
                  auVar207._0_4_ =
                       auVar226._0_4_ * local_780 +
                       auVar222._0_4_ * local_750 +
                       auVar257._0_4_ * local_770 + auVar205._0_4_ * local_760;
                  auVar207._4_4_ =
                       auVar226._4_4_ * fStack_77c +
                       auVar222._4_4_ * fStack_74c +
                       auVar257._4_4_ * fStack_76c + auVar205._4_4_ * fStack_75c;
                  auVar207._8_4_ =
                       auVar226._8_4_ * fStack_778 +
                       auVar222._8_4_ * fStack_748 +
                       auVar257._8_4_ * fStack_768 + auVar205._8_4_ * fStack_758;
                  auVar207._12_4_ =
                       auVar226._12_4_ * fStack_774 +
                       auVar222._12_4_ * fStack_744 +
                       auVar257._12_4_ * fStack_764 + auVar205._12_4_ * fStack_754;
                  local_610 = vmovlps_avx(auVar207);
                  local_608 = vextractps_avx(auVar207,2);
                  local_5fc = (int)local_7a8;
                  local_5f8 = (int)local_7b8;
                  local_5f4 = (local_730.context)->instID[0];
                  local_5f0 = (local_730.context)->instPrimID[0];
                  local_7bc = -1;
                  local_730.valid = &local_7bc;
                  local_730.geometryUserPtr = pGVar138->userPtr;
                  local_730.ray = (RTCRayN *)ray;
                  local_730.hit = (RTCHitN *)&local_610;
                  local_730.N = 1;
                  local_700 = auVar139;
                  if (pGVar138->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a40249:
                    p_Var23 = context->args->filter;
                    if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar138->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var23)(&local_730);
                      pGVar138 = (Geometry *)local_660._0_8_;
                      auVar139 = local_700;
                      if (*local_730.valid == 0) goto LAB_00a402f3;
                    }
                    (((Vec3f *)((long)local_730.ray + 0x30))->field_0).components[0] =
                         *(float *)local_730.hit;
                    (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_730.hit + 4);
                    (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_730.hit + 8);
                    *(float *)((long)local_730.ray + 0x3c) = *(float *)(local_730.hit + 0xc);
                    *(float *)((long)local_730.ray + 0x40) = *(float *)(local_730.hit + 0x10);
                    *(float *)((long)local_730.ray + 0x44) = *(float *)(local_730.hit + 0x14);
                    *(float *)((long)local_730.ray + 0x48) = *(float *)(local_730.hit + 0x18);
                    *(float *)((long)local_730.ray + 0x4c) = *(float *)(local_730.hit + 0x1c);
                    *(float *)((long)local_730.ray + 0x50) = *(float *)(local_730.hit + 0x20);
                  }
                  else {
                    (*pGVar138->intersectionFilterN)(&local_730);
                    pGVar138 = (Geometry *)local_660._0_8_;
                    auVar139 = local_700;
                    if (*local_730.valid != 0) goto LAB_00a40249;
LAB_00a402f3:
                    (ray->super_RayK<1>).tfar = (float)local_7a0._0_4_;
                    pGVar138 = (Geometry *)local_660._0_8_;
                    auVar139 = local_700;
                  }
                  *(undefined4 *)(local_4c0[0] + (long)auVar139 * 4) = 0;
                  auVar27 = local_4c0[0];
                  _local_7a0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  auVar244 = ZEXT3264(_local_7a0);
                  fVar198 = (ray->super_RayK<1>).tfar;
                  auVar163._4_4_ = fVar198;
                  auVar163._0_4_ = fVar198;
                  auVar163._8_4_ = fVar198;
                  auVar163._12_4_ = fVar198;
                  auVar163._16_4_ = fVar198;
                  auVar163._20_4_ = fVar198;
                  auVar163._24_4_ = fVar198;
                  auVar163._28_4_ = fVar198;
                  auVar233 = ZEXT3264(local_360);
                  auVar26 = vcmpps_avx(local_360,auVar163,2);
                  auVar148 = vandps_avx(auVar26,local_4c0[0]);
                  local_4c0[0] = auVar148;
                  auVar27 = auVar27 & auVar26;
                  if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar27 >> 0x7f,0) == '\0') &&
                        (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar27 >> 0xbf,0) == '\0') &&
                      (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar27[0x1f]) goto LAB_00a4038d;
                  auVar188._8_4_ = 0x7f800000;
                  auVar188._0_8_ = 0x7f8000007f800000;
                  auVar188._12_4_ = 0x7f800000;
                  auVar188._16_4_ = 0x7f800000;
                  auVar188._20_4_ = 0x7f800000;
                  auVar188._24_4_ = 0x7f800000;
                  auVar188._28_4_ = 0x7f800000;
                  auVar26 = vblendvps_avx(auVar188,local_360,auVar148);
                  auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
                  auVar27 = vminps_avx(auVar26,auVar27);
                  auVar28 = vshufpd_avx(auVar27,auVar27,5);
                  auVar27 = vminps_avx(auVar27,auVar28);
                  auVar28 = vperm2f128_avx(auVar27,auVar27,1);
                  auVar27 = vminps_avx(auVar27,auVar28);
                  auVar26 = vcmpps_avx(auVar26,auVar27,0);
                  auVar27 = auVar148 & auVar26;
                  if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar27 >> 0x7f,0) != '\0') ||
                        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0xbf,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar27[0x1f] < '\0') {
                    auVar148 = vandps_avx(auVar26,auVar148);
                  }
                  uVar135 = vmovmskps_avx(auVar148);
                  uVar133 = 0;
                  if (uVar135 != 0) {
                    for (; (uVar135 >> uVar133 & 1) == 0; uVar133 = uVar133 + 1) {
                    }
                  }
                  auVar139 = (undefined1  [8])(ulong)uVar133;
                } while( true );
              }
              fVar198 = local_180[(long)auVar139];
              fVar215 = *(float *)((long)&local_160 + (long)auVar139 * 4);
              fVar219 = 1.0 - fVar198;
              fVar217 = fVar198 * fVar219 + fVar198 * fVar219;
              auVar257 = ZEXT416((uint)(fVar198 * fVar198 * 3.0));
              auVar257 = vshufps_avx(auVar257,auVar257,0);
              auVar205 = ZEXT416((uint)((fVar217 - fVar198 * fVar198) * 3.0));
              auVar205 = vshufps_avx(auVar205,auVar205,0);
              auVar222 = ZEXT416((uint)((fVar219 * fVar219 - fVar217) * 3.0));
              auVar222 = vshufps_avx(auVar222,auVar222,0);
              fVar217 = auVar222._0_4_ * local_750;
              fVar221 = auVar222._4_4_ * fStack_74c;
              fVar223 = auVar222._8_4_ * fStack_748;
              fVar224 = auVar222._12_4_ * fStack_744;
              auVar244 = ZEXT1664(CONCAT412(fVar224,CONCAT48(fVar223,CONCAT44(fVar221,fVar217))));
              auVar222 = ZEXT416((uint)(fVar219 * fVar219 * -3.0));
              auVar222 = vshufps_avx(auVar222,auVar222,0);
              auVar206._0_4_ =
                   auVar222._0_4_ * local_780 +
                   fVar217 + auVar257._0_4_ * local_770 + auVar205._0_4_ * local_760;
              auVar206._4_4_ =
                   auVar222._4_4_ * fStack_77c +
                   fVar221 + auVar257._4_4_ * fStack_76c + auVar205._4_4_ * fStack_75c;
              auVar206._8_4_ =
                   auVar222._8_4_ * fStack_778 +
                   fVar223 + auVar257._8_4_ * fStack_768 + auVar205._8_4_ * fStack_758;
              auVar206._12_4_ =
                   auVar222._12_4_ * fStack_774 +
                   fVar224 + auVar257._12_4_ * fStack_764 + auVar205._12_4_ * fStack_754;
              auVar233 = ZEXT464((uint)*(float *)(local_140 + (long)auVar139 * 4));
              (ray->super_RayK<1>).tfar = *(float *)(local_140 + (long)auVar139 * 4);
              uVar12 = vmovlps_avx(auVar206);
              *(undefined8 *)&(ray->Ng).field_0 = uVar12;
              fVar217 = (float)vextractps_avx(auVar206,2);
              (ray->Ng).field_0.field_0.z = fVar217;
              ray->u = fVar198;
              ray->v = fVar215;
              ray->primID = (uint)local_7a8;
              ray->geomID = (uint)local_7b8;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              prim = local_740;
            }
          }
          goto LAB_00a3fdb6;
        }
        auVar190 = ZEXT3264(auVar190._0_32_);
        auVar304 = ZEXT3264(local_6e0);
        auVar315 = ZEXT3264(local_680);
        auVar297 = ZEXT3264(_local_580);
        auVar332 = ZEXT3264(_local_6a0);
        goto LAB_00a3fe0f;
      }
    }
    fVar198 = (ray->super_RayK<1>).tfar;
    auVar159._4_4_ = fVar198;
    auVar159._0_4_ = fVar198;
    auVar159._8_4_ = fVar198;
    auVar159._12_4_ = fVar198;
    auVar159._16_4_ = fVar198;
    auVar159._20_4_ = fVar198;
    auVar159._24_4_ = fVar198;
    auVar159._28_4_ = fVar198;
    auVar148 = vcmpps_avx(local_80,auVar159,2);
    uVar133 = vmovmskps_avx(auVar148);
    uVar133 = (uint)uVar140 & uVar133;
  } while( true );
LAB_00a4038d:
  auVar304 = ZEXT3264(local_6e0);
  auVar315 = ZEXT3264(local_680);
  auVar371 = ZEXT3264(_local_6c0);
  auVar297 = ZEXT3264(_local_580);
  auVar332 = ZEXT3264(_local_6a0);
  pre = local_738;
  prim = local_740;
LAB_00a3fdb6:
  auVar190 = ZEXT3264(local_480);
  fVar199 = (float)local_640._0_4_;
  fVar216 = (float)local_640._4_4_;
  fVar218 = fStack_638;
  fVar220 = fStack_634;
  fVar198 = fStack_630;
  fVar219 = fStack_62c;
  fVar224 = fStack_628;
LAB_00a3fe0f:
  lVar137 = lVar137 + 8;
  fVar234 = (float)local_520._0_4_;
  fVar245 = (float)local_520._4_4_;
  fVar246 = fStack_518;
  fVar247 = fStack_514;
  fVar215 = fStack_510;
  fVar217 = fStack_50c;
  fVar221 = fStack_508;
  fVar223 = fStack_504;
  goto LAB_00a3f4dc;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }